

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize_x86_avx.cpp
# Opt level: O2

void ncnn::requantize(int *intptr,char *ptr,Mat *scale_in_data,Mat *bias_data,Mat *scale_out_data,
                     int activation_type,Mat *activation_params,int elemcount,int elempack)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  uint uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  char cVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  int iVar35;
  long lVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar70;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  __m128 pos;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar152;
  undefined1 auVar153 [16];
  undefined1 auVar158 [28];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar171;
  float fVar174;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar167 [32];
  float fVar169;
  float fVar170;
  float fVar172;
  float fVar173;
  undefined1 in_ZMM5 [64];
  undefined1 auVar175 [36];
  undefined1 auVar168 [64];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar176 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [28];
  undefined1 auVar181 [28];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar191 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [28];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar211 [36];
  undefined1 auVar210 [64];
  float fVar212;
  float fVar213;
  undefined1 auVar217 [28];
  undefined1 auVar216 [16];
  float fVar232;
  undefined1 auVar214 [16];
  float fVar235;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar215 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar230;
  float fVar231;
  float fVar233;
  float fVar234;
  undefined1 in_ZMM8 [64];
  undefined1 auVar229 [64];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar246 [28];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar252 [32];
  undefined1 auVar238 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar272 [32];
  undefined1 auVar274 [32];
  undefined1 auVar247 [28];
  undefined1 auVar275 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [28];
  undefined1 auVar286 [28];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar292 [32];
  undefined1 auVar287 [28];
  undefined1 auVar294 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  float fVar323;
  float fVar324;
  undefined1 auVar311 [28];
  undefined1 auVar313 [32];
  undefined1 auVar315 [32];
  undefined1 auVar317 [32];
  undefined1 auVar312 [28];
  undefined1 auVar318 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  float fVar325;
  undefined1 auVar322 [32];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar326;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  float fVar343;
  float fVar344;
  undefined1 auVar336 [28];
  undefined1 auVar337 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  float fVar345;
  undefined1 auVar342 [32];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar359 [16];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [64];
  undefined1 auVar360 [16];
  undefined1 auVar365 [64];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar366 [16];
  undefined1 auVar369 [64];
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float fStack_a0;
  undefined1 auVar163 [32];
  undefined1 auVar166 [32];
  undefined1 auVar187 [32];
  undefined1 auVar190 [32];
  undefined1 auVar192 [64];
  undefined1 auVar182 [32];
  undefined1 auVar202 [32];
  undefined1 auVar207 [32];
  undefined1 auVar199 [32];
  undefined1 auVar228 [32];
  undefined1 auVar251 [32];
  undefined1 auVar253 [32];
  undefined1 auVar258 [32];
  undefined1 auVar262 [32];
  undefined1 auVar268 [32];
  undefined1 auVar271 [32];
  undefined1 auVar273 [32];
  undefined1 auVar276 [32];
  undefined1 auVar279 [32];
  undefined1 auVar293 [32];
  undefined1 auVar295 [32];
  undefined1 auVar300 [32];
  undefined1 auVar303 [32];
  undefined1 auVar288 [32];
  undefined1 auVar291 [32];
  undefined1 auVar314 [32];
  undefined1 auVar316 [32];
  undefined1 auVar319 [32];
  undefined1 auVar338 [32];
  
  fVar1 = *(float *)*(undefined1 (*) [32])scale_in_data->data;
  local_f8._4_4_ = fVar1;
  local_f8._0_4_ = fVar1;
  fStack_f0 = fVar1;
  fStack_ec = fVar1;
  fStack_e8 = fVar1;
  fStack_e4 = fVar1;
  fStack_e0 = fVar1;
  if ((elempack == 8) && (1 < scale_in_data->w)) {
    _local_f8 = SUB3228(*(undefined1 (*) [32])scale_in_data->data,0);
  }
  fVar2 = *(float *)*(undefined1 (*) [32])scale_out_data->data;
  if (elempack == 8) {
    local_b8._4_4_ = fVar2;
    local_b8._0_4_ = fVar2;
    fStack_b0 = fVar2;
    fStack_ac = fVar2;
    fStack_a8 = fVar2;
    fStack_a4 = fVar2;
    fStack_a0 = fVar2;
    if (1 < scale_out_data->w) {
      _local_b8 = SUB3228(*(undefined1 (*) [32])scale_out_data->data,0);
    }
  }
  else {
    local_b8._4_4_ = fVar2;
    local_b8._0_4_ = fVar2;
    fStack_b0 = fVar2;
    fStack_ac = fVar2;
    fStack_a8 = fVar2;
    fStack_a4 = fVar2;
    fStack_a0 = fVar2;
  }
  iVar35 = elemcount * elempack;
  if (bias_data->w == 0) {
    uVar37 = 0;
    uVar33 = activation_type - 1;
    auVar369 = ZEXT3264(CONCAT428(0x80000000,
                                  CONCAT424(0x80000000,
                                            CONCAT420(0x80000000,
                                                      CONCAT416(0x80000000,
                                                                CONCAT412(0x80000000,
                                                                          CONCAT48(0x80000000,
                                                                                                                                                                      
                                                  0x8000000080000000)))))));
    auVar191 = ZEXT3264(CONCAT428(0x3f000000,
                                  CONCAT424(0x3f000000,
                                            CONCAT420(0x3f000000,
                                                      CONCAT416(0x3f000000,
                                                                CONCAT412(0x3f000000,
                                                                          CONCAT48(0x3f000000,
                                                                                                                                                                      
                                                  0x3f0000003f000000)))))));
    auVar131 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
    auVar229 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
    auVar365 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar364 = ZEXT3264(CONCAT428(0x3f800000,
                                  CONCAT424(0x3f800000,
                                            CONCAT420(0x3f800000,
                                                      CONCAT416(0x3f800000,
                                                                CONCAT412(0x3f800000,
                                                                          CONCAT48(0x3f800000,
                                                                                                                                                                      
                                                  0x3f8000003f800000)))))));
    while( true ) {
      auVar208 = auVar364._0_32_;
      auVar183 = auVar191._0_32_;
      fVar70 = auVar191._0_4_;
      fVar169 = auVar191._4_4_;
      fVar172 = auVar191._8_4_;
      fVar173 = auVar191._12_4_;
      fVar355 = auVar191._16_4_;
      fVar230 = auVar191._20_4_;
      fVar233 = auVar191._24_4_;
      fVar235 = auVar191._28_4_;
      fVar152 = auVar364._0_4_;
      fVar170 = auVar364._4_4_;
      fVar171 = auVar364._8_4_;
      fVar174 = auVar364._12_4_;
      fVar212 = auVar364._16_4_;
      fVar231 = auVar364._20_4_;
      fVar232 = auVar364._24_4_;
      fVar234 = auVar364._28_4_;
      if (iVar35 <= (int)uVar37 + 0xf) break;
      auVar69 = vcvtdq2ps_avx(*(undefined1 (*) [32])intptr);
      auVar367 = vcvtdq2ps_avx(*(undefined1 (*) [32])((long)intptr + 0x20));
      auVar180._0_4_ = (float)local_f8._0_4_ * auVar69._0_4_;
      auVar180._4_4_ = (float)local_f8._4_4_ * auVar69._4_4_;
      auVar180._8_4_ = fStack_f0 * auVar69._8_4_;
      auVar180._12_4_ = fStack_ec * auVar69._12_4_;
      auVar180._16_4_ = fStack_e8 * auVar69._16_4_;
      auVar180._20_4_ = fStack_e4 * auVar69._20_4_;
      auVar192._28_36_ = in_ZMM6._28_36_;
      auVar180._24_4_ = fStack_e0 * auVar69._24_4_;
      auVar192._0_28_ = auVar180;
      auVar182 = auVar192._0_32_;
      fVar213 = in_ZMM6._28_4_;
      auVar211 = ZEXT436((uint)fVar213);
      auVar158._0_4_ = auVar367._0_4_ * (float)local_f8._0_4_;
      auVar158._4_4_ = auVar367._4_4_ * (float)local_f8._4_4_;
      auVar158._8_4_ = auVar367._8_4_ * fStack_f0;
      auVar158._12_4_ = auVar367._12_4_ * fStack_ec;
      auVar158._16_4_ = auVar367._16_4_ * fStack_e8;
      auVar158._20_4_ = auVar367._20_4_ * fStack_e4;
      uVar20 = auVar69._28_4_;
      auVar158._24_4_ = auVar367._24_4_ * fStack_e0;
      auVar21._28_4_ = uVar20;
      auVar21._0_28_ = auVar158;
      auVar175 = ZEXT436(uVar20);
      auVar246 = auVar180;
      auVar287 = auVar158;
      if (5 < uVar33) goto switchD_0041f165_caseD_0;
      auVar61 = auVar365._0_32_;
      auVar69 = vmaxps_avx(auVar61,auVar182);
      auVar367 = vmaxps_avx(auVar61,auVar21);
      auVar246 = auVar69._0_28_;
      auVar287 = auVar367._0_28_;
      switch(uVar33) {
      case 1:
        auVar183 = vminps_avx(auVar61,auVar182);
        fVar70 = *activation_params->data;
        auVar211 = ZEXT436(auVar183._28_4_);
        auVar246._0_4_ = auVar69._0_4_ + fVar70 * auVar183._0_4_;
        auVar246._4_4_ = auVar69._4_4_ + fVar70 * auVar183._4_4_;
        auVar246._8_4_ = auVar69._8_4_ + fVar70 * auVar183._8_4_;
        auVar246._12_4_ = auVar69._12_4_ + fVar70 * auVar183._12_4_;
        auVar246._16_4_ = auVar69._16_4_ + fVar70 * auVar183._16_4_;
        auVar246._20_4_ = auVar69._20_4_ + fVar70 * auVar183._20_4_;
        auVar246._24_4_ = auVar69._24_4_ + fVar70 * auVar183._24_4_;
        auVar183 = vminps_avx(auVar61,auVar21);
        auVar175 = ZEXT436(auVar183._28_4_);
        auVar287._0_4_ = auVar367._0_4_ + fVar70 * auVar183._0_4_;
        auVar287._4_4_ = auVar367._4_4_ + fVar70 * auVar183._4_4_;
        auVar287._8_4_ = auVar367._8_4_ + fVar70 * auVar183._8_4_;
        auVar287._12_4_ = auVar367._12_4_ + fVar70 * auVar183._12_4_;
        auVar287._16_4_ = auVar367._16_4_ + fVar70 * auVar183._16_4_;
        auVar287._20_4_ = auVar367._20_4_ + fVar70 * auVar183._20_4_;
        auVar287._24_4_ = auVar367._24_4_ + fVar70 * auVar183._24_4_;
        break;
      case 2:
        uVar3 = *activation_params->data;
        auVar304._4_4_ = uVar3;
        auVar304._0_4_ = uVar3;
        auVar304._8_4_ = uVar3;
        auVar304._12_4_ = uVar3;
        auVar304._16_4_ = uVar3;
        auVar304._20_4_ = uVar3;
        auVar304._24_4_ = uVar3;
        auVar304._28_4_ = uVar3;
        uVar3 = *(undefined4 *)((long)activation_params->data + 4);
        auVar322._4_4_ = uVar3;
        auVar322._0_4_ = uVar3;
        auVar322._8_4_ = uVar3;
        auVar322._12_4_ = uVar3;
        auVar322._16_4_ = uVar3;
        auVar322._20_4_ = uVar3;
        auVar322._24_4_ = uVar3;
        auVar322._28_4_ = uVar3;
        auVar183 = vmaxps_avx(auVar304,auVar182);
        auVar211 = ZEXT436(auVar183._28_4_);
        auVar208 = vminps_avx(auVar322,auVar183);
        auVar183 = vmaxps_avx(auVar304,auVar21);
        auVar175 = ZEXT436(auVar183._28_4_);
        auVar183 = vminps_avx(auVar322,auVar183);
        auVar246 = auVar208._0_28_;
        auVar287 = auVar183._0_28_;
        break;
      case 3:
        auVar184._0_4_ = auVar369._0_4_ ^ (uint)auVar180._0_4_;
        auVar184._4_4_ = auVar369._4_4_ ^ (uint)auVar180._4_4_;
        auVar184._8_4_ = auVar369._8_4_ ^ (uint)auVar180._8_4_;
        auVar184._12_4_ = auVar369._12_4_ ^ (uint)auVar180._12_4_;
        auVar184._16_4_ = auVar369._16_4_ ^ (uint)auVar180._16_4_;
        auVar184._20_4_ = auVar369._20_4_ ^ (uint)auVar180._20_4_;
        auVar184._24_4_ = auVar369._24_4_ ^ (uint)auVar180._24_4_;
        auVar184._28_4_ = auVar369._28_4_ ^ (uint)fVar213;
        auVar209._8_4_ = 0x42b0c0a5;
        auVar209._0_8_ = 0x42b0c0a542b0c0a5;
        auVar209._12_4_ = 0x42b0c0a5;
        auVar209._16_4_ = 0x42b0c0a5;
        auVar209._20_4_ = 0x42b0c0a5;
        auVar209._24_4_ = 0x42b0c0a5;
        auVar209._28_4_ = 0x42b0c0a5;
        auVar367 = vminps_avx(auVar184,auVar209);
        auVar342._8_4_ = 0xc2b0c0a5;
        auVar342._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar342._12_4_ = 0xc2b0c0a5;
        auVar342._16_4_ = 0xc2b0c0a5;
        auVar342._20_4_ = 0xc2b0c0a5;
        auVar342._24_4_ = 0xc2b0c0a5;
        auVar342._28_4_ = 0xc2b0c0a5;
        auVar367 = vmaxps_avx(auVar342,auVar367);
        auVar270._0_4_ = auVar367._0_4_ * 1.442695 + fVar70;
        auVar270._4_4_ = auVar367._4_4_ * 1.442695 + fVar169;
        auVar270._8_4_ = auVar367._8_4_ * 1.442695 + fVar172;
        auVar270._12_4_ = auVar367._12_4_ * 1.442695 + fVar173;
        auVar270._16_4_ = auVar367._16_4_ * 1.442695 + fVar355;
        auVar270._20_4_ = auVar367._20_4_ * 1.442695 + fVar230;
        auVar270._24_4_ = auVar367._24_4_ * 1.442695 + fVar233;
        auVar270._28_4_ = auVar69._28_4_ + fVar235;
        auVar182 = vroundps_avx(auVar270,1);
        auVar69 = vcmpps_avx(auVar270,auVar182,1);
        auVar69 = vandps_avx(auVar69,auVar208);
        auVar69 = vsubps_avx(auVar182,auVar69);
        auVar27._4_4_ = auVar69._4_4_ * 0.6931472;
        auVar27._0_4_ = auVar69._0_4_ * 0.6931472;
        auVar27._8_4_ = auVar69._8_4_ * 0.6931472;
        auVar27._12_4_ = auVar69._12_4_ * 0.6931472;
        auVar27._16_4_ = auVar69._16_4_ * 0.6931472;
        auVar27._20_4_ = auVar69._20_4_ * 0.6931472;
        auVar27._24_4_ = auVar69._24_4_ * 0.6931472;
        auVar27._28_4_ = auVar182._28_4_;
        auVar61 = vsubps_avx(auVar367,auVar27);
        fVar213 = auVar61._0_4_;
        fVar326 = auVar61._4_4_;
        fVar343 = auVar61._8_4_;
        fVar344 = auVar61._12_4_;
        fVar345 = auVar61._16_4_;
        fVar323 = auVar61._20_4_;
        fVar324 = auVar61._24_4_;
        auVar242._0_4_ = (int)auVar69._0_4_;
        auVar242._4_4_ = (int)auVar69._4_4_;
        auVar242._8_4_ = (int)auVar69._8_4_;
        auVar242._12_4_ = (int)auVar69._12_4_;
        auVar271._16_4_ = (int)auVar69._16_4_;
        auVar271._0_16_ = auVar242;
        auVar271._20_4_ = (int)auVar69._20_4_;
        auVar271._24_4_ = (int)auVar69._24_4_;
        auVar271._28_4_ = (int)auVar69._28_4_;
        auVar346 = vpslld_avx(auVar242,0x17);
        auVar328 = vpslld_avx(auVar271._16_16_,0x17);
        auVar215._8_4_ = 0x3f800000;
        auVar215._0_8_ = 0x3f8000003f800000;
        auVar215._12_4_ = 0x3f800000;
        auVar328 = vpaddd_avx(auVar328,auVar215);
        auVar346 = vpaddd_avx(auVar346,auVar215);
        uVar34 = CONCAT44(auVar158._4_4_,auVar158._0_4_);
        auVar164._0_8_ = uVar34 ^ 0x8000000080000000;
        auVar164._8_4_ = -auVar158._8_4_;
        auVar164._12_4_ = -auVar158._12_4_;
        auVar164._16_4_ = -auVar158._16_4_;
        auVar164._20_4_ = -auVar158._20_4_;
        auVar164._24_4_ = -auVar158._24_4_;
        auVar164._28_4_ = uVar20 ^ 0x80000000;
        auVar69 = vminps_avx(auVar164,auVar209);
        auVar364 = ZEXT3264(auVar208);
        auVar191 = ZEXT3264(auVar183);
        auVar69 = vmaxps_avx(auVar342,auVar69);
        auVar369 = ZEXT3264(CONCAT428(0x80000000,
                                      CONCAT424(0x80000000,
                                                CONCAT420(0x80000000,
                                                          CONCAT416(0x80000000,
                                                                    CONCAT412(0x80000000,
                                                                              CONCAT48(0x80000000,
                                                                                                                                                                              
                                                  0x8000000080000000)))))));
        auVar365 = ZEXT864(0) << 0x20;
        auVar272._0_4_ = auVar69._0_4_ * 1.442695 + fVar70;
        auVar272._4_4_ = auVar69._4_4_ * 1.442695 + fVar169;
        auVar272._8_4_ = auVar69._8_4_ * 1.442695 + fVar172;
        auVar272._12_4_ = auVar69._12_4_ * 1.442695 + fVar173;
        auVar272._16_4_ = auVar69._16_4_ * 1.442695 + fVar355;
        auVar272._20_4_ = auVar69._20_4_ * 1.442695 + fVar230;
        auVar272._24_4_ = auVar69._24_4_ * 1.442695 + fVar233;
        auVar272._28_4_ = fVar235 + -0.0;
        auVar367 = vroundps_avx(auVar272,1);
        auVar183 = vcmpps_avx(auVar272,auVar367,1);
        auVar183 = vandps_avx(auVar183,auVar208);
        auVar183 = vsubps_avx(auVar367,auVar183);
        auVar28._4_4_ = auVar183._4_4_ * 0.6931472;
        auVar28._0_4_ = auVar183._0_4_ * 0.6931472;
        auVar28._8_4_ = auVar183._8_4_ * 0.6931472;
        auVar28._12_4_ = auVar183._12_4_ * 0.6931472;
        auVar28._16_4_ = auVar183._16_4_ * 0.6931472;
        auVar28._20_4_ = auVar183._20_4_ * 0.6931472;
        auVar28._24_4_ = auVar183._24_4_ * 0.6931472;
        auVar28._28_4_ = auVar367._28_4_;
        auVar69 = vsubps_avx(auVar69,auVar28);
        fVar235 = auVar69._0_4_;
        fVar356 = auVar69._4_4_;
        fVar357 = auVar69._8_4_;
        fVar358 = auVar69._12_4_;
        fVar5 = auVar69._16_4_;
        fVar6 = auVar69._20_4_;
        fVar7 = auVar69._24_4_;
        auVar131 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
        auVar229 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
        auVar243._0_4_ = (int)auVar183._0_4_;
        auVar243._4_4_ = (int)auVar183._4_4_;
        auVar243._8_4_ = (int)auVar183._8_4_;
        auVar243._12_4_ = (int)auVar183._12_4_;
        auVar273._16_4_ = (int)auVar183._16_4_;
        auVar273._0_16_ = auVar243;
        auVar273._20_4_ = (int)auVar183._20_4_;
        auVar273._24_4_ = (int)auVar183._24_4_;
        auVar273._28_4_ = (int)auVar183._28_4_;
        auVar329 = vpslld_avx(auVar243,0x17);
        auVar238 = vpslld_avx(auVar273._16_16_,0x17);
        auVar238 = vpaddd_avx(auVar238,auVar215);
        auVar329 = vpaddd_avx(auVar329,auVar215);
        auVar185._0_4_ =
             auVar346._0_4_ *
             (fVar213 * fVar213 *
              (((((fVar213 * 0.00019875691 + 0.0013981999) * fVar213 + 0.008333452) * fVar213 +
                0.041665796) * fVar213 + 0.16666666) * fVar213 + fVar70) + fVar213 + fVar152) +
             fVar152;
        auVar185._4_4_ =
             auVar346._4_4_ *
             (fVar326 * fVar326 *
              (((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) * fVar326 +
                0.041665796) * fVar326 + 0.16666666) * fVar326 + fVar169) + fVar326 + fVar170) +
             fVar170;
        auVar185._8_4_ =
             auVar346._8_4_ *
             (fVar343 * fVar343 *
              (((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 + 0.008333452) * fVar343 +
                0.041665796) * fVar343 + 0.16666666) * fVar343 + fVar172) + fVar343 + fVar171) +
             fVar171;
        auVar185._12_4_ =
             auVar346._12_4_ *
             (fVar344 * fVar344 *
              (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344 +
                0.041665796) * fVar344 + 0.16666666) * fVar344 + fVar173) + fVar344 + fVar174) +
             fVar174;
        auVar185._16_4_ =
             auVar328._0_4_ *
             (fVar345 * fVar345 *
              (((((fVar345 * 0.00019875691 + 0.0013981999) * fVar345 + 0.008333452) * fVar345 +
                0.041665796) * fVar345 + 0.16666666) * fVar345 + fVar355) + fVar345 + fVar212) +
             fVar212;
        auVar185._20_4_ =
             auVar328._4_4_ *
             (fVar323 * fVar323 *
              (((((fVar323 * 0.00019875691 + 0.0013981999) * fVar323 + 0.008333452) * fVar323 +
                0.041665796) * fVar323 + 0.16666666) * fVar323 + fVar230) + fVar323 + fVar231) +
             fVar231;
        auVar185._24_4_ =
             auVar328._8_4_ *
             (fVar324 * fVar324 *
              (((((fVar324 * 0.00019875691 + 0.0013981999) * fVar324 + 0.008333452) * fVar324 +
                0.041665796) * fVar324 + 0.16666666) * fVar324 + fVar233) + fVar324 + fVar232) +
             fVar232;
        auVar185._28_4_ = auVar182._28_4_ + auVar61._28_4_ + fVar234 + fVar234;
        auVar211 = ZEXT436((uint)auVar185._28_4_);
        auVar183 = vdivps_avx(auVar208,auVar185);
        auVar165._0_4_ =
             auVar329._0_4_ *
             (fVar235 * fVar235 *
              (((((fVar235 * 0.00019875691 + 0.0013981999) * fVar235 + 0.008333452) * fVar235 +
                0.041665796) * fVar235 + 0.16666666) * fVar235 + fVar70) + fVar235 + fVar152) +
             fVar152;
        auVar165._4_4_ =
             auVar329._4_4_ *
             (fVar356 * fVar356 *
              (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) * fVar356 +
                0.041665796) * fVar356 + 0.16666666) * fVar356 + fVar169) + fVar356 + fVar170) +
             fVar170;
        auVar165._8_4_ =
             auVar329._8_4_ *
             (fVar357 * fVar357 *
              (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) * fVar357 +
                0.041665796) * fVar357 + 0.16666666) * fVar357 + fVar172) + fVar357 + fVar171) +
             fVar171;
        auVar165._12_4_ =
             auVar329._12_4_ *
             (fVar358 * fVar358 *
              (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) * fVar358 +
                0.041665796) * fVar358 + 0.16666666) * fVar358 + fVar173) + fVar358 + fVar174) +
             fVar174;
        auVar165._16_4_ =
             auVar238._0_4_ *
             (fVar5 * fVar5 *
              (((((fVar5 * 0.00019875691 + 0.0013981999) * fVar5 + 0.008333452) * fVar5 +
                0.041665796) * fVar5 + 0.16666666) * fVar5 + fVar355) + fVar5 + fVar212) + fVar212;
        auVar165._20_4_ =
             auVar238._4_4_ *
             (fVar6 * fVar6 *
              (((((fVar6 * 0.00019875691 + 0.0013981999) * fVar6 + 0.008333452) * fVar6 +
                0.041665796) * fVar6 + 0.16666666) * fVar6 + fVar230) + fVar6 + fVar231) + fVar231;
        auVar165._24_4_ =
             auVar238._8_4_ *
             (fVar7 * fVar7 *
              (((((fVar7 * 0.00019875691 + 0.0013981999) * fVar7 + 0.008333452) * fVar7 +
                0.041665796) * fVar7 + 0.16666666) * fVar7 + fVar233) + fVar7 + fVar232) + fVar232;
        auVar165._28_4_ = auVar367._28_4_ + auVar69._28_4_ + fVar234 + fVar234;
        auVar175 = ZEXT436((uint)auVar165._28_4_);
        auVar208 = vdivps_avx(auVar208,auVar165);
        auVar246 = auVar183._0_28_;
        auVar287 = auVar208._0_28_;
        break;
      case 4:
        auVar95._8_4_ = 0x42b0c0a5;
        auVar95._0_8_ = 0x42b0c0a542b0c0a5;
        auVar95._12_4_ = 0x42b0c0a5;
        auVar95._16_4_ = 0x42b0c0a5;
        auVar95._20_4_ = 0x42b0c0a5;
        auVar95._24_4_ = 0x42b0c0a5;
        auVar95._28_4_ = 0x42b0c0a5;
        auVar69 = vminps_avx(auVar182,auVar95);
        auVar218._8_4_ = 0xc2b0c0a5;
        auVar218._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar218._12_4_ = 0xc2b0c0a5;
        auVar218._16_4_ = 0xc2b0c0a5;
        auVar218._20_4_ = 0xc2b0c0a5;
        auVar218._24_4_ = 0xc2b0c0a5;
        auVar218._28_4_ = 0xc2b0c0a5;
        auVar182 = vmaxps_avx(auVar69,auVar218);
        auVar294._0_4_ = auVar182._0_4_ * 1.442695 + fVar70;
        auVar294._4_4_ = auVar182._4_4_ * 1.442695 + fVar169;
        auVar294._8_4_ = auVar182._8_4_ * 1.442695 + fVar172;
        auVar294._12_4_ = auVar182._12_4_ * 1.442695 + fVar173;
        auVar294._16_4_ = auVar182._16_4_ * 1.442695 + fVar355;
        auVar294._20_4_ = auVar182._20_4_ * 1.442695 + fVar230;
        auVar294._24_4_ = auVar182._24_4_ * 1.442695 + fVar233;
        auVar294._28_4_ = auVar367._28_4_ + fVar235;
        auVar367 = vroundps_avx(auVar294,1);
        auVar69 = vcmpps_avx(auVar294,auVar367,1);
        auVar69 = vandps_avx(auVar69,auVar208);
        auVar69 = vsubps_avx(auVar367,auVar69);
        auVar22._4_4_ = auVar69._4_4_ * 0.6931472;
        auVar22._0_4_ = auVar69._0_4_ * 0.6931472;
        auVar22._8_4_ = auVar69._8_4_ * 0.6931472;
        auVar22._12_4_ = auVar69._12_4_ * 0.6931472;
        auVar22._16_4_ = auVar69._16_4_ * 0.6931472;
        auVar22._20_4_ = auVar69._20_4_ * 0.6931472;
        auVar22._24_4_ = auVar69._24_4_ * 0.6931472;
        auVar22._28_4_ = auVar367._28_4_;
        auVar182 = vsubps_avx(auVar182,auVar22);
        fVar213 = auVar182._0_4_;
        fVar326 = auVar182._4_4_;
        fVar356 = auVar182._8_4_;
        fVar343 = auVar182._12_4_;
        fVar357 = auVar182._16_4_;
        fVar344 = auVar182._20_4_;
        fVar358 = auVar182._24_4_;
        auVar282._0_4_ = (int)auVar69._0_4_;
        auVar282._4_4_ = (int)auVar69._4_4_;
        auVar282._8_4_ = (int)auVar69._8_4_;
        auVar282._12_4_ = (int)auVar69._12_4_;
        auVar295._16_4_ = (int)auVar69._16_4_;
        auVar295._0_16_ = auVar282;
        auVar295._20_4_ = (int)auVar69._20_4_;
        auVar295._24_4_ = (int)auVar69._24_4_;
        auVar295._28_4_ = (int)auVar69._28_4_;
        auVar346 = vpslld_avx(auVar282,0x17);
        auVar328 = vpslld_avx(auVar295._16_16_,0x17);
        auVar366._8_4_ = 0x3f800000;
        auVar366._0_8_ = 0x3f8000003f800000;
        auVar366._12_4_ = 0x3f800000;
        auVar328 = vpaddd_avx(auVar328,auVar366);
        auVar346 = vpaddd_avx(auVar346,auVar366);
        auVar296._0_4_ =
             (fVar213 + fVar152 +
             fVar213 * fVar213 *
             (((((fVar213 * 0.00019875691 + 0.0013981999) * fVar213 + 0.008333452) * fVar213 +
               0.041665796) * fVar213 + 0.16666666) * fVar213 + fVar70)) * auVar346._0_4_ + fVar152;
        auVar296._4_4_ =
             (fVar326 + fVar170 +
             fVar326 * fVar326 *
             (((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) * fVar326 +
               0.041665796) * fVar326 + 0.16666666) * fVar326 + fVar169)) * auVar346._4_4_ + fVar170
        ;
        auVar296._8_4_ =
             (fVar356 + fVar171 +
             fVar356 * fVar356 *
             (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) * fVar356 +
               0.041665796) * fVar356 + 0.16666666) * fVar356 + fVar172)) * auVar346._8_4_ + fVar171
        ;
        auVar296._12_4_ =
             (fVar343 + fVar174 +
             fVar343 * fVar343 *
             (((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 + 0.008333452) * fVar343 +
               0.041665796) * fVar343 + 0.16666666) * fVar343 + fVar173)) * auVar346._12_4_ +
             fVar174;
        auVar296._16_4_ =
             (fVar357 + fVar212 +
             fVar357 * fVar357 *
             (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) * fVar357 +
               0.041665796) * fVar357 + 0.16666666) * fVar357 + fVar355)) * auVar328._0_4_ + fVar212
        ;
        auVar296._20_4_ =
             (fVar344 + fVar231 +
             fVar344 * fVar344 *
             (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344 +
               0.041665796) * fVar344 + 0.16666666) * fVar344 + fVar230)) * auVar328._4_4_ + fVar231
        ;
        auVar296._24_4_ =
             (fVar358 + fVar232 +
             fVar358 * fVar358 *
             (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) * fVar358 +
               0.041665796) * fVar358 + 0.16666666) * fVar358 + fVar233)) * auVar328._8_4_ + fVar232
        ;
        auVar296._28_4_ = auVar182._28_4_ + fVar234 + auVar367._28_4_ + fVar234;
        auVar367 = vcmpps_avx(auVar296,auVar61,2);
        auVar362._8_4_ = 0x800000;
        auVar362._0_8_ = 0x80000000800000;
        auVar362._12_4_ = 0x800000;
        auVar362._16_4_ = 0x800000;
        auVar362._20_4_ = 0x800000;
        auVar362._24_4_ = 0x800000;
        auVar362._28_4_ = 0x800000;
        auVar69 = vmaxps_avx(auVar296,auVar362);
        auVar346 = vpsrld_avx(auVar69._0_16_,0x17);
        auVar328 = vpsrld_avx(auVar69._16_16_,0x17);
        auVar219._8_4_ = 0x807fffff;
        auVar219._0_8_ = 0x807fffff807fffff;
        auVar219._12_4_ = 0x807fffff;
        auVar219._16_4_ = 0x807fffff;
        auVar219._20_4_ = 0x807fffff;
        auVar219._24_4_ = 0x807fffff;
        auVar219._28_4_ = 0x807fffff;
        auVar69 = vandps_avx(auVar69,auVar219);
        auVar61 = vorps_avx(auVar69,auVar183);
        auVar363._8_4_ = 0x3f3504f3;
        auVar363._0_8_ = 0x3f3504f33f3504f3;
        auVar363._12_4_ = 0x3f3504f3;
        auVar363._16_4_ = 0x3f3504f3;
        auVar363._20_4_ = 0x3f3504f3;
        auVar363._24_4_ = 0x3f3504f3;
        auVar363._28_4_ = 0x3f3504f3;
        auVar182 = vcmpps_avx(auVar363,auVar61,2);
        auVar69 = vandnps_avx(auVar182,auVar61);
        fVar213 = auVar61._0_4_ + -1.0 + auVar69._0_4_;
        fVar326 = auVar61._4_4_ + -1.0 + auVar69._4_4_;
        fVar356 = auVar61._8_4_ + -1.0 + auVar69._8_4_;
        fVar343 = auVar61._12_4_ + -1.0 + auVar69._12_4_;
        fVar357 = auVar61._16_4_ + -1.0 + auVar69._16_4_;
        fVar344 = auVar61._20_4_ + -1.0 + auVar69._20_4_;
        fVar358 = auVar61._24_4_ + -1.0 + auVar69._24_4_;
        auVar328 = vpsubd_avx(auVar328,auVar182._16_16_);
        auVar44._8_4_ = 0xffffff81;
        auVar44._0_8_ = 0xffffff81ffffff81;
        auVar44._12_4_ = 0xffffff81;
        auVar328 = vpaddd_avx(auVar328,auVar44);
        auVar346 = vpsubd_avx(auVar346,auVar182._0_16_);
        auVar346 = vpaddd_avx(auVar346,auVar44);
        auVar297._16_16_ = auVar328;
        auVar297._0_16_ = auVar346;
        auVar182 = vcvtdq2ps_avx(auVar297);
        auVar23._4_4_ =
             (auVar182._4_4_ * 0.6931472 + fVar326 +
             fVar326 * fVar326 *
             (((((((((fVar326 * 0.070376836 + -0.1151461) * fVar326 + 0.116769984) * fVar326 +
                   -0.12420141) * fVar326 + 0.14249323) * fVar326 + -0.16668057) * fVar326 +
                0.20000714) * fVar326 + -0.24999994) * fVar326 + 0.3333333) * fVar326 + -0.5)) *
             -2.0;
        auVar23._0_4_ =
             (auVar182._0_4_ * 0.6931472 + fVar213 +
             fVar213 * fVar213 *
             (((((((((fVar213 * 0.070376836 + -0.1151461) * fVar213 + 0.116769984) * fVar213 +
                   -0.12420141) * fVar213 + 0.14249323) * fVar213 + -0.16668057) * fVar213 +
                0.20000714) * fVar213 + -0.24999994) * fVar213 + 0.3333333) * fVar213 + -0.5)) *
             -2.0;
        auVar23._8_4_ =
             (auVar182._8_4_ * 0.6931472 + fVar356 +
             fVar356 * fVar356 *
             (((((((((fVar356 * 0.070376836 + -0.1151461) * fVar356 + 0.116769984) * fVar356 +
                   -0.12420141) * fVar356 + 0.14249323) * fVar356 + -0.16668057) * fVar356 +
                0.20000714) * fVar356 + -0.24999994) * fVar356 + 0.3333333) * fVar356 + -0.5)) *
             -2.0;
        auVar23._12_4_ =
             (auVar182._12_4_ * 0.6931472 + fVar343 +
             fVar343 * fVar343 *
             (((((((((fVar343 * 0.070376836 + -0.1151461) * fVar343 + 0.116769984) * fVar343 +
                   -0.12420141) * fVar343 + 0.14249323) * fVar343 + -0.16668057) * fVar343 +
                0.20000714) * fVar343 + -0.24999994) * fVar343 + 0.3333333) * fVar343 + -0.5)) *
             -2.0;
        auVar23._16_4_ =
             (auVar182._16_4_ * 0.6931472 + fVar357 +
             fVar357 * fVar357 *
             (((((((((fVar357 * 0.070376836 + -0.1151461) * fVar357 + 0.116769984) * fVar357 +
                   -0.12420141) * fVar357 + 0.14249323) * fVar357 + -0.16668057) * fVar357 +
                0.20000714) * fVar357 + -0.24999994) * fVar357 + 0.3333333) * fVar357 + -0.5)) *
             -2.0;
        auVar23._20_4_ =
             (auVar182._20_4_ * 0.6931472 + fVar344 +
             fVar344 * fVar344 *
             (((((((((fVar344 * 0.070376836 + -0.1151461) * fVar344 + 0.116769984) * fVar344 +
                   -0.12420141) * fVar344 + 0.14249323) * fVar344 + -0.16668057) * fVar344 +
                0.20000714) * fVar344 + -0.24999994) * fVar344 + 0.3333333) * fVar344 + -0.5)) *
             -2.0;
        auVar23._24_4_ =
             (auVar182._24_4_ * 0.6931472 + fVar358 +
             fVar358 * fVar358 *
             (((((((((fVar358 * 0.070376836 + -0.1151461) * fVar358 + 0.116769984) * fVar358 +
                   -0.12420141) * fVar358 + 0.14249323) * fVar358 + -0.16668057) * fVar358 +
                0.20000714) * fVar358 + -0.24999994) * fVar358 + 0.3333333) * fVar358 + -0.5)) *
             -2.0;
        auVar23._28_4_ = auVar182._28_4_ + auVar61._28_4_ + -1.0 + auVar69._28_4_ + 0.0;
        auVar298._8_4_ = 0x7fffffff;
        auVar298._0_8_ = 0x7fffffff7fffffff;
        auVar298._12_4_ = 0x7fffffff;
        auVar298._16_4_ = 0x7fffffff;
        auVar298._20_4_ = 0x7fffffff;
        auVar298._24_4_ = 0x7fffffff;
        auVar298._28_4_ = 0x7fffffff;
        auVar69 = vblendvps_avx(auVar23,auVar298,auVar367);
        auVar266._8_4_ = 0x42b0c0a5;
        auVar266._0_8_ = 0x42b0c0a542b0c0a5;
        auVar266._12_4_ = 0x42b0c0a5;
        auVar266._16_4_ = 0x42b0c0a5;
        auVar266._20_4_ = 0x42b0c0a5;
        auVar266._24_4_ = 0x42b0c0a5;
        auVar266._28_4_ = 0x42b0c0a5;
        auVar69 = vminps_avx(auVar69,auVar266);
        auVar367 = vmaxps_avx(auVar69,auVar218);
        auVar267._0_4_ = auVar367._0_4_ * 1.442695 + fVar70;
        auVar267._4_4_ = auVar367._4_4_ * 1.442695 + fVar169;
        auVar267._8_4_ = auVar367._8_4_ * 1.442695 + fVar172;
        auVar267._12_4_ = auVar367._12_4_ * 1.442695 + fVar173;
        auVar267._16_4_ = auVar367._16_4_ * 1.442695 + fVar355;
        auVar267._20_4_ = auVar367._20_4_ * 1.442695 + fVar230;
        auVar267._24_4_ = auVar367._24_4_ * 1.442695 + fVar233;
        auVar267._28_4_ = fVar235 + 88.37626;
        auVar182 = vroundps_avx(auVar267,1);
        auVar69 = vcmpps_avx(auVar267,auVar182,1);
        auVar69 = vandps_avx(auVar69,auVar208);
        auVar69 = vsubps_avx(auVar182,auVar69);
        auVar24._4_4_ = auVar69._4_4_ * 0.6931472;
        auVar24._0_4_ = auVar69._0_4_ * 0.6931472;
        auVar24._8_4_ = auVar69._8_4_ * 0.6931472;
        auVar24._12_4_ = auVar69._12_4_ * 0.6931472;
        auVar24._16_4_ = auVar69._16_4_ * 0.6931472;
        auVar24._20_4_ = auVar69._20_4_ * 0.6931472;
        auVar24._24_4_ = auVar69._24_4_ * 0.6931472;
        auVar24._28_4_ = auVar182._28_4_;
        auVar367 = vsubps_avx(auVar367,auVar24);
        fVar213 = auVar367._0_4_;
        fVar356 = auVar367._4_4_;
        fVar357 = auVar367._8_4_;
        fVar358 = auVar367._12_4_;
        fVar5 = auVar367._16_4_;
        fVar6 = auVar367._20_4_;
        fVar7 = auVar367._24_4_;
        auVar241._0_4_ = (int)auVar69._0_4_;
        auVar241._4_4_ = (int)auVar69._4_4_;
        auVar241._8_4_ = (int)auVar69._8_4_;
        auVar241._12_4_ = (int)auVar69._12_4_;
        auVar268._16_4_ = (int)auVar69._16_4_;
        auVar268._0_16_ = auVar241;
        auVar268._20_4_ = (int)auVar69._20_4_;
        auVar268._24_4_ = (int)auVar69._24_4_;
        auVar268._28_4_ = (int)auVar69._28_4_;
        auVar346 = vpslld_avx(auVar241,0x17);
        auVar328 = vpslld_avx(auVar268._16_16_,0x17);
        auVar64._8_4_ = 0x3f800000;
        auVar64._0_8_ = 0x3f8000003f800000;
        auVar64._12_4_ = 0x3f800000;
        auVar328 = vpaddd_avx(auVar328,auVar64);
        auVar346 = vpaddd_avx(auVar346,auVar64);
        auVar220._8_4_ = 0x42b0c0a5;
        auVar220._0_8_ = 0x42b0c0a542b0c0a5;
        auVar220._12_4_ = 0x42b0c0a5;
        auVar220._16_4_ = 0x42b0c0a5;
        auVar220._20_4_ = 0x42b0c0a5;
        auVar220._24_4_ = 0x42b0c0a5;
        auVar220._28_4_ = 0x42b0c0a5;
        auVar69 = vminps_avx(auVar220,auVar21);
        auVar367 = vmaxps_avx(auVar69,auVar218);
        auVar299._0_4_ = auVar367._0_4_ * 1.442695 + fVar70;
        auVar299._4_4_ = auVar367._4_4_ * 1.442695 + fVar169;
        auVar299._8_4_ = auVar367._8_4_ * 1.442695 + fVar172;
        auVar299._12_4_ = auVar367._12_4_ * 1.442695 + fVar173;
        auVar299._16_4_ = auVar367._16_4_ * 1.442695 + fVar355;
        auVar299._20_4_ = auVar367._20_4_ * 1.442695 + fVar230;
        auVar299._24_4_ = auVar367._24_4_ * 1.442695 + fVar233;
        auVar299._28_4_ = fVar235 + 0.0;
        auVar182 = vroundps_avx(auVar299,1);
        auVar69 = vcmpps_avx(auVar299,auVar182,1);
        auVar69 = vandps_avx(auVar69,auVar208);
        auVar69 = vsubps_avx(auVar182,auVar69);
        auVar25._4_4_ = auVar69._4_4_ * 0.6931472;
        auVar25._0_4_ = auVar69._0_4_ * 0.6931472;
        auVar25._8_4_ = auVar69._8_4_ * 0.6931472;
        auVar25._12_4_ = auVar69._12_4_ * 0.6931472;
        auVar25._16_4_ = auVar69._16_4_ * 0.6931472;
        auVar25._20_4_ = auVar69._20_4_ * 0.6931472;
        auVar25._24_4_ = auVar69._24_4_ * 0.6931472;
        auVar25._28_4_ = auVar182._28_4_;
        auVar367 = vsubps_avx(auVar367,auVar25);
        fVar326 = auVar367._0_4_;
        fVar343 = auVar367._4_4_;
        fVar344 = auVar367._8_4_;
        fVar345 = auVar367._12_4_;
        fVar323 = auVar367._16_4_;
        fVar324 = auVar367._20_4_;
        fVar325 = auVar367._24_4_;
        auVar283._0_4_ = (int)auVar69._0_4_;
        auVar283._4_4_ = (int)auVar69._4_4_;
        auVar283._8_4_ = (int)auVar69._8_4_;
        auVar283._12_4_ = (int)auVar69._12_4_;
        auVar300._16_4_ = (int)auVar69._16_4_;
        auVar300._0_16_ = auVar283;
        auVar300._20_4_ = (int)auVar69._20_4_;
        auVar300._24_4_ = (int)auVar69._24_4_;
        auVar300._28_4_ = (int)auVar69._28_4_;
        auVar329 = vpslld_avx(auVar283,0x17);
        auVar238 = vpslld_avx(auVar300._16_16_,0x17);
        auVar238 = vpaddd_avx(auVar238,auVar64);
        auVar329 = vpaddd_avx(auVar329,auVar64);
        auVar301._0_4_ =
             (fVar326 + fVar152 +
             fVar326 * fVar326 *
             (((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) * fVar326 +
               0.041665796) * fVar326 + 0.16666666) * fVar326 + fVar70)) * auVar329._0_4_ + fVar152;
        auVar301._4_4_ =
             (fVar343 + fVar170 +
             fVar343 * fVar343 *
             (((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 + 0.008333452) * fVar343 +
               0.041665796) * fVar343 + 0.16666666) * fVar343 + fVar169)) * auVar329._4_4_ + fVar170
        ;
        auVar301._8_4_ =
             (fVar344 + fVar171 +
             fVar344 * fVar344 *
             (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344 +
               0.041665796) * fVar344 + 0.16666666) * fVar344 + fVar172)) * auVar329._8_4_ + fVar171
        ;
        auVar301._12_4_ =
             (fVar345 + fVar174 +
             fVar345 * fVar345 *
             (((((fVar345 * 0.00019875691 + 0.0013981999) * fVar345 + 0.008333452) * fVar345 +
               0.041665796) * fVar345 + 0.16666666) * fVar345 + fVar173)) * auVar329._12_4_ +
             fVar174;
        auVar301._16_4_ =
             (fVar323 + fVar212 +
             fVar323 * fVar323 *
             (((((fVar323 * 0.00019875691 + 0.0013981999) * fVar323 + 0.008333452) * fVar323 +
               0.041665796) * fVar323 + 0.16666666) * fVar323 + fVar355)) * auVar238._0_4_ + fVar212
        ;
        auVar301._20_4_ =
             (fVar324 + fVar231 +
             fVar324 * fVar324 *
             (((((fVar324 * 0.00019875691 + 0.0013981999) * fVar324 + 0.008333452) * fVar324 +
               0.041665796) * fVar324 + 0.16666666) * fVar324 + fVar230)) * auVar238._4_4_ + fVar231
        ;
        auVar301._24_4_ =
             (fVar325 + fVar232 +
             fVar325 * fVar325 *
             (((((fVar325 * 0.00019875691 + 0.0013981999) * fVar325 + 0.008333452) * fVar325 +
               0.041665796) * fVar325 + 0.16666666) * fVar325 + fVar233)) * auVar238._8_4_ + fVar232
        ;
        auVar301._28_4_ = auVar367._28_4_ + fVar234 + auVar182._28_4_ + fVar234;
        auVar96._8_4_ = 0x800000;
        auVar96._0_8_ = 0x80000000800000;
        auVar96._12_4_ = 0x800000;
        auVar96._16_4_ = 0x800000;
        auVar96._20_4_ = 0x800000;
        auVar96._24_4_ = 0x800000;
        auVar96._28_4_ = 0x800000;
        auVar367 = vmaxps_avx(auVar301,auVar96);
        auVar238 = vpsrld_avx(auVar367._16_16_,0x17);
        auVar97._8_4_ = 0x807fffff;
        auVar97._0_8_ = 0x807fffff807fffff;
        auVar97._12_4_ = 0x807fffff;
        auVar97._16_4_ = 0x807fffff;
        auVar97._20_4_ = 0x807fffff;
        auVar97._24_4_ = 0x807fffff;
        auVar97._28_4_ = 0x807fffff;
        auVar69 = vandps_avx(auVar367,auVar97);
        auVar182 = vorps_avx(auVar69,auVar183);
        auVar98._8_4_ = 0x3f3504f3;
        auVar98._0_8_ = 0x3f3504f33f3504f3;
        auVar98._12_4_ = 0x3f3504f3;
        auVar98._16_4_ = 0x3f3504f3;
        auVar98._20_4_ = 0x3f3504f3;
        auVar98._24_4_ = 0x3f3504f3;
        auVar98._28_4_ = 0x3f3504f3;
        auVar69 = vcmpps_avx(auVar98,auVar182,2);
        auVar183 = vandnps_avx(auVar69,auVar182);
        fVar326 = auVar182._0_4_ + -1.0 + auVar183._0_4_;
        fVar343 = auVar182._4_4_ + -1.0 + auVar183._4_4_;
        fVar344 = auVar182._8_4_ + -1.0 + auVar183._8_4_;
        fVar345 = auVar182._12_4_ + -1.0 + auVar183._12_4_;
        fVar323 = auVar182._16_4_ + -1.0 + auVar183._16_4_;
        fVar324 = auVar182._20_4_ + -1.0 + auVar183._20_4_;
        fVar325 = auVar182._24_4_ + -1.0 + auVar183._24_4_;
        auVar238 = vpsubd_avx(auVar238,auVar69._16_16_);
        auVar365 = ZEXT1664((undefined1  [16])0x0);
        auVar329 = vpsrld_avx(auVar367._0_16_,0x17);
        auVar141._8_4_ = 0xffffff81;
        auVar141._0_8_ = 0xffffff81ffffff81;
        auVar141._12_4_ = 0xffffff81;
        auVar238 = vpaddd_avx(auVar238,auVar141);
        auVar329 = vpsubd_avx(auVar329,auVar69._0_16_);
        auVar329 = vpaddd_avx(auVar329,auVar141);
        auVar221._16_16_ = auVar238;
        auVar221._0_16_ = auVar329;
        auVar353._8_4_ = 0x42b0c0a5;
        auVar353._0_8_ = 0x42b0c0a542b0c0a5;
        auVar353._12_4_ = 0x42b0c0a5;
        auVar353._16_4_ = 0x42b0c0a5;
        auVar353._20_4_ = 0x42b0c0a5;
        auVar353._24_4_ = 0x42b0c0a5;
        auVar353._28_4_ = 0x42b0c0a5;
        auVar69 = vcmpps_avx(auVar301,ZEXT1632((undefined1  [16])0x0),2);
        auVar367 = vcvtdq2ps_avx(auVar221);
        auVar26._4_4_ =
             (auVar367._4_4_ * 0.6931472 + fVar343 +
             fVar343 * fVar343 *
             (((((((((fVar343 * 0.070376836 + -0.1151461) * fVar343 + 0.116769984) * fVar343 +
                   -0.12420141) * fVar343 + 0.14249323) * fVar343 + -0.16668057) * fVar343 +
                0.20000714) * fVar343 + -0.24999994) * fVar343 + 0.3333333) * fVar343 + -0.5)) *
             -2.0;
        auVar26._0_4_ =
             (auVar367._0_4_ * 0.6931472 + fVar326 +
             fVar326 * fVar326 *
             (((((((((fVar326 * 0.070376836 + -0.1151461) * fVar326 + 0.116769984) * fVar326 +
                   -0.12420141) * fVar326 + 0.14249323) * fVar326 + -0.16668057) * fVar326 +
                0.20000714) * fVar326 + -0.24999994) * fVar326 + 0.3333333) * fVar326 + -0.5)) *
             -2.0;
        auVar26._8_4_ =
             (auVar367._8_4_ * 0.6931472 + fVar344 +
             fVar344 * fVar344 *
             (((((((((fVar344 * 0.070376836 + -0.1151461) * fVar344 + 0.116769984) * fVar344 +
                   -0.12420141) * fVar344 + 0.14249323) * fVar344 + -0.16668057) * fVar344 +
                0.20000714) * fVar344 + -0.24999994) * fVar344 + 0.3333333) * fVar344 + -0.5)) *
             -2.0;
        auVar26._12_4_ =
             (auVar367._12_4_ * 0.6931472 + fVar345 +
             fVar345 * fVar345 *
             (((((((((fVar345 * 0.070376836 + -0.1151461) * fVar345 + 0.116769984) * fVar345 +
                   -0.12420141) * fVar345 + 0.14249323) * fVar345 + -0.16668057) * fVar345 +
                0.20000714) * fVar345 + -0.24999994) * fVar345 + 0.3333333) * fVar345 + -0.5)) *
             -2.0;
        auVar26._16_4_ =
             (auVar367._16_4_ * 0.6931472 + fVar323 +
             fVar323 * fVar323 *
             (((((((((fVar323 * 0.070376836 + -0.1151461) * fVar323 + 0.116769984) * fVar323 +
                   -0.12420141) * fVar323 + 0.14249323) * fVar323 + -0.16668057) * fVar323 +
                0.20000714) * fVar323 + -0.24999994) * fVar323 + 0.3333333) * fVar323 + -0.5)) *
             -2.0;
        auVar26._20_4_ =
             (auVar367._20_4_ * 0.6931472 + fVar324 +
             fVar324 * fVar324 *
             (((((((((fVar324 * 0.070376836 + -0.1151461) * fVar324 + 0.116769984) * fVar324 +
                   -0.12420141) * fVar324 + 0.14249323) * fVar324 + -0.16668057) * fVar324 +
                0.20000714) * fVar324 + -0.24999994) * fVar324 + 0.3333333) * fVar324 + -0.5)) *
             -2.0;
        auVar26._24_4_ =
             (auVar367._24_4_ * 0.6931472 + fVar325 +
             fVar325 * fVar325 *
             (((((((((fVar325 * 0.070376836 + -0.1151461) * fVar325 + 0.116769984) * fVar325 +
                   -0.12420141) * fVar325 + 0.14249323) * fVar325 + -0.16668057) * fVar325 +
                0.20000714) * fVar325 + -0.24999994) * fVar325 + 0.3333333) * fVar325 + -0.5)) *
             -2.0;
        auVar26._28_4_ = auVar367._28_4_ + auVar182._28_4_ + -1.0 + auVar183._28_4_ + 0.0;
        auVar151._8_4_ = 0x7fffffff;
        auVar151._0_8_ = 0x7fffffff7fffffff;
        auVar151._12_4_ = 0x7fffffff;
        auVar151._16_4_ = 0x7fffffff;
        auVar151._20_4_ = 0x7fffffff;
        auVar151._24_4_ = 0x7fffffff;
        auVar151._28_4_ = 0x7fffffff;
        auVar183 = vblendvps_avx(auVar26,auVar151,auVar69);
        auVar183 = vminps_avx(auVar183,auVar353);
        auVar58._8_4_ = 0xc2b0c0a5;
        auVar58._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar58._12_4_ = 0xc2b0c0a5;
        auVar58._16_4_ = 0xc2b0c0a5;
        auVar58._20_4_ = 0xc2b0c0a5;
        auVar58._24_4_ = 0xc2b0c0a5;
        auVar58._28_4_ = 0xc2b0c0a5;
        auVar367 = vmaxps_avx(auVar183,auVar58);
        auVar302._0_4_ = auVar367._0_4_ * 1.442695 + fVar70;
        auVar302._4_4_ = auVar367._4_4_ * 1.442695 + fVar169;
        auVar302._8_4_ = auVar367._8_4_ * 1.442695 + fVar172;
        auVar302._12_4_ = auVar367._12_4_ * 1.442695 + fVar173;
        auVar302._16_4_ = auVar367._16_4_ * 1.442695 + fVar355;
        auVar302._20_4_ = auVar367._20_4_ * 1.442695 + fVar230;
        auVar302._24_4_ = auVar367._24_4_ * 1.442695 + fVar233;
        auVar302._28_4_ = auVar69._28_4_ + fVar235;
        auVar69 = vroundps_avx(auVar302,1);
        auVar183 = vcmpps_avx(auVar302,auVar69,1);
        auVar183 = vandps_avx(auVar183,auVar208);
        auVar183 = vsubps_avx(auVar69,auVar183);
        auVar208._4_4_ = auVar183._4_4_ * 0.6931472;
        auVar208._0_4_ = auVar183._0_4_ * 0.6931472;
        auVar208._8_4_ = auVar183._8_4_ * 0.6931472;
        auVar208._12_4_ = auVar183._12_4_ * 0.6931472;
        auVar208._16_4_ = auVar183._16_4_ * 0.6931472;
        auVar208._20_4_ = auVar183._20_4_ * 0.6931472;
        auVar208._24_4_ = auVar183._24_4_ * 0.6931472;
        auVar208._28_4_ = auVar69._28_4_;
        auVar208 = vsubps_avx(auVar367,auVar208);
        fVar235 = auVar208._0_4_;
        fVar326 = auVar208._4_4_;
        fVar343 = auVar208._8_4_;
        fVar344 = auVar208._12_4_;
        fVar345 = auVar208._16_4_;
        fVar323 = auVar208._20_4_;
        fVar324 = auVar208._24_4_;
        auVar229 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
        auVar369 = ZEXT3264(CONCAT428(0x80000000,
                                      CONCAT424(0x80000000,
                                                CONCAT420(0x80000000,
                                                          CONCAT416(0x80000000,
                                                                    CONCAT412(0x80000000,
                                                                              CONCAT48(0x80000000,
                                                                                                                                                                              
                                                  0x8000000080000000)))))));
        auVar284._0_4_ = (int)auVar183._0_4_;
        auVar284._4_4_ = (int)auVar183._4_4_;
        auVar284._8_4_ = (int)auVar183._8_4_;
        auVar284._12_4_ = (int)auVar183._12_4_;
        auVar303._16_4_ = (int)auVar183._16_4_;
        auVar303._0_16_ = auVar284;
        auVar303._20_4_ = (int)auVar183._20_4_;
        auVar303._24_4_ = (int)auVar183._24_4_;
        auVar303._28_4_ = (int)auVar183._28_4_;
        auVar329 = vpslld_avx(auVar284,0x17);
        auVar238 = vpslld_avx(auVar303._16_16_,0x17);
        auVar238 = vpaddd_avx(auVar238,auVar64);
        auVar329 = vpaddd_avx(auVar329,auVar64);
        auVar269._0_4_ =
             (fVar213 + fVar152 +
             fVar213 * fVar213 *
             (((((fVar213 * 0.00019875691 + 0.0013981999) * fVar213 + 0.008333452) * fVar213 +
               0.041665796) * fVar213 + 0.16666666) * fVar213 + fVar70)) * auVar346._0_4_ + fVar152;
        auVar269._4_4_ =
             (fVar356 + fVar170 +
             fVar356 * fVar356 *
             (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) * fVar356 +
               0.041665796) * fVar356 + 0.16666666) * fVar356 + fVar169)) * auVar346._4_4_ + fVar170
        ;
        auVar269._8_4_ =
             (fVar357 + fVar171 +
             fVar357 * fVar357 *
             (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) * fVar357 +
               0.041665796) * fVar357 + 0.16666666) * fVar357 + fVar172)) * auVar346._8_4_ + fVar171
        ;
        auVar269._12_4_ =
             (fVar358 + fVar174 +
             fVar358 * fVar358 *
             (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) * fVar358 +
               0.041665796) * fVar358 + 0.16666666) * fVar358 + fVar173)) * auVar346._12_4_ +
             fVar174;
        auVar269._16_4_ =
             (fVar5 + fVar212 +
             fVar5 * fVar5 *
             (((((fVar5 * 0.00019875691 + 0.0013981999) * fVar5 + 0.008333452) * fVar5 + 0.041665796
               ) * fVar5 + 0.16666666) * fVar5 + fVar355)) * auVar328._0_4_ + fVar212;
        auVar269._20_4_ =
             (fVar6 + fVar231 +
             fVar6 * fVar6 *
             (((((fVar6 * 0.00019875691 + 0.0013981999) * fVar6 + 0.008333452) * fVar6 + 0.041665796
               ) * fVar6 + 0.16666666) * fVar6 + fVar230)) * auVar328._4_4_ + fVar231;
        auVar269._24_4_ =
             (fVar7 + fVar232 +
             fVar7 * fVar7 *
             (((((fVar7 * 0.00019875691 + 0.0013981999) * fVar7 + 0.008333452) * fVar7 + 0.041665796
               ) * fVar7 + 0.16666666) * fVar7 + fVar233)) * auVar328._8_4_ + fVar232;
        auVar269._28_4_ = auVar328._12_4_ + fVar234;
        auVar59._8_4_ = 0x40000000;
        auVar59._0_8_ = 0x4000000040000000;
        auVar59._12_4_ = 0x40000000;
        auVar59._16_4_ = 0x40000000;
        auVar59._20_4_ = 0x40000000;
        auVar59._24_4_ = 0x40000000;
        auVar59._28_4_ = 0x40000000;
        auVar183 = vdivps_avx(auVar59,auVar269);
        auVar222._0_4_ =
             (fVar235 + fVar152 +
             fVar235 * fVar235 *
             (((((fVar235 * 0.00019875691 + 0.0013981999) * fVar235 + 0.008333452) * fVar235 +
               0.041665796) * fVar235 + 0.16666666) * fVar235 + fVar70)) * auVar329._0_4_ + fVar152;
        auVar222._4_4_ =
             (fVar326 + fVar170 +
             fVar326 * fVar326 *
             (((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) * fVar326 +
               0.041665796) * fVar326 + 0.16666666) * fVar326 + fVar169)) * auVar329._4_4_ + fVar170
        ;
        auVar222._8_4_ =
             (fVar343 + fVar171 +
             fVar343 * fVar343 *
             (((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 + 0.008333452) * fVar343 +
               0.041665796) * fVar343 + 0.16666666) * fVar343 + fVar172)) * auVar329._8_4_ + fVar171
        ;
        auVar222._12_4_ =
             (fVar344 + fVar174 +
             fVar344 * fVar344 *
             (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344 +
               0.041665796) * fVar344 + 0.16666666) * fVar344 + fVar173)) * auVar329._12_4_ +
             fVar174;
        auVar222._16_4_ =
             (fVar345 + fVar212 +
             fVar345 * fVar345 *
             (((((fVar345 * 0.00019875691 + 0.0013981999) * fVar345 + 0.008333452) * fVar345 +
               0.041665796) * fVar345 + 0.16666666) * fVar345 + fVar355)) * auVar238._0_4_ + fVar212
        ;
        auVar222._20_4_ =
             (fVar323 + fVar231 +
             fVar323 * fVar323 *
             (((((fVar323 * 0.00019875691 + 0.0013981999) * fVar323 + 0.008333452) * fVar323 +
               0.041665796) * fVar323 + 0.16666666) * fVar323 + fVar230)) * auVar238._4_4_ + fVar231
        ;
        auVar222._24_4_ =
             (fVar324 + fVar232 +
             fVar324 * fVar324 *
             (((((fVar324 * 0.00019875691 + 0.0013981999) * fVar324 + 0.008333452) * fVar324 +
               0.041665796) * fVar324 + 0.16666666) * fVar324 + fVar233)) * auVar238._8_4_ + fVar232
        ;
        auVar222._28_4_ = auVar208._28_4_ + fVar234 + auVar69._28_4_ + fVar234;
        auVar208 = vdivps_avx(auVar59,auVar222);
        auVar246._0_4_ = (auVar183._0_4_ + -1.0) * auVar180._0_4_;
        auVar246._4_4_ = (auVar183._4_4_ + -1.0) * auVar180._4_4_;
        auVar246._8_4_ = (auVar183._8_4_ + -1.0) * auVar180._8_4_;
        auVar246._12_4_ = (auVar183._12_4_ + -1.0) * auVar180._12_4_;
        auVar246._16_4_ = (auVar183._16_4_ + -1.0) * auVar180._16_4_;
        auVar246._20_4_ = (auVar183._20_4_ + -1.0) * auVar180._20_4_;
        auVar246._24_4_ = (auVar183._24_4_ + -1.0) * auVar180._24_4_;
        auVar183._0_4_ = auVar208._0_4_ + -1.0;
        auVar183._4_4_ = auVar208._4_4_ + -1.0;
        auVar183._8_4_ = auVar208._8_4_ + -1.0;
        auVar183._12_4_ = auVar208._12_4_ + -1.0;
        auVar183._16_4_ = auVar208._16_4_ + -1.0;
        auVar183._20_4_ = auVar208._20_4_ + -1.0;
        auVar183._24_4_ = auVar208._24_4_ + -1.0;
        auVar183._28_4_ = auVar208._28_4_ + -1.0;
        auVar131 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
        goto LAB_0041fa6b;
      case 5:
        fVar70 = *activation_params->data;
        fVar152 = *(float *)((long)activation_params->data + 4);
        auVar274._0_4_ = fVar70 * auVar180._0_4_ + fVar152;
        auVar274._4_4_ = fVar70 * auVar180._4_4_ + fVar152;
        auVar274._8_4_ = fVar70 * auVar180._8_4_ + fVar152;
        auVar274._12_4_ = fVar70 * auVar180._12_4_ + fVar152;
        auVar274._16_4_ = fVar70 * auVar180._16_4_ + fVar152;
        auVar274._20_4_ = fVar70 * auVar180._20_4_ + fVar152;
        auVar274._24_4_ = fVar70 * auVar180._24_4_ + fVar152;
        auVar274._28_4_ = auVar69._28_4_ + fVar152;
        auVar183 = vmaxps_avx(auVar274,auVar61);
        auVar183 = vminps_avx(auVar183,auVar208);
        auVar246._0_4_ = auVar183._0_4_ * auVar180._0_4_;
        auVar246._4_4_ = auVar183._4_4_ * auVar180._4_4_;
        auVar246._8_4_ = auVar183._8_4_ * auVar180._8_4_;
        auVar246._12_4_ = auVar183._12_4_ * auVar180._12_4_;
        auVar246._16_4_ = auVar183._16_4_ * auVar180._16_4_;
        auVar246._20_4_ = auVar183._20_4_ * auVar180._20_4_;
        auVar246._24_4_ = auVar183._24_4_ * auVar180._24_4_;
        auVar186._0_4_ = fVar152 + fVar70 * auVar158._0_4_;
        auVar186._4_4_ = fVar152 + fVar70 * auVar158._4_4_;
        auVar186._8_4_ = fVar152 + fVar70 * auVar158._8_4_;
        auVar186._12_4_ = fVar152 + fVar70 * auVar158._12_4_;
        auVar186._16_4_ = fVar152 + fVar70 * auVar158._16_4_;
        auVar186._20_4_ = fVar152 + fVar70 * auVar158._20_4_;
        auVar186._24_4_ = fVar152 + fVar70 * auVar158._24_4_;
        auVar186._28_4_ = fVar152 + fVar213;
        auVar183 = vmaxps_avx(auVar61,auVar186);
        auVar183 = vminps_avx(auVar183,auVar208);
LAB_0041fa6b:
        auVar211 = ZEXT436(auVar183._28_4_);
        auVar287._0_4_ = auVar183._0_4_ * auVar158._0_4_;
        auVar287._4_4_ = auVar183._4_4_ * auVar158._4_4_;
        auVar287._8_4_ = auVar183._8_4_ * auVar158._8_4_;
        auVar287._12_4_ = auVar183._12_4_ * auVar158._12_4_;
        auVar287._16_4_ = auVar183._16_4_ * auVar158._16_4_;
        auVar287._20_4_ = auVar183._20_4_ * auVar158._20_4_;
        auVar287._24_4_ = auVar183._24_4_ * auVar158._24_4_;
      }
switchD_0041f165_caseD_0:
      auVar168._0_4_ = auVar246._0_4_ * (float)local_b8._0_4_;
      auVar168._4_4_ = auVar246._4_4_ * (float)local_b8._4_4_;
      auVar168._8_4_ = auVar246._8_4_ * fStack_b0;
      auVar168._12_4_ = auVar246._12_4_ * fStack_ac;
      auVar168._16_4_ = auVar246._16_4_ * fStack_a8;
      auVar168._20_4_ = auVar246._20_4_ * fStack_a4;
      auVar168._24_4_ = auVar246._24_4_ * fStack_a0;
      auVar168._28_36_ = auVar175;
      auVar193._0_4_ = auVar287._0_4_ * (float)local_b8._0_4_;
      auVar193._4_4_ = auVar287._4_4_ * (float)local_b8._4_4_;
      auVar193._8_4_ = auVar287._8_4_ * fStack_b0;
      auVar193._12_4_ = auVar287._12_4_ * fStack_ac;
      auVar193._16_4_ = auVar287._16_4_ * fStack_a8;
      auVar193._20_4_ = auVar287._20_4_ * fStack_a4;
      auVar193._24_4_ = auVar287._24_4_ * fStack_a0;
      auVar193._28_36_ = auVar211;
      auVar183 = vandps_avx(auVar369._0_32_,auVar168._0_32_);
      auVar208 = vandps_avx(auVar369._0_32_,auVar193._0_32_);
      auVar183 = vorps_avx(auVar183,auVar191._0_32_);
      auVar208 = vorps_avx(auVar208,auVar191._0_32_);
      auVar154._0_4_ = (int)(auVar183._0_4_ + auVar168._0_4_);
      auVar154._4_4_ = (int)(auVar183._4_4_ + auVar168._4_4_);
      auVar154._8_4_ = (int)(auVar183._8_4_ + auVar168._8_4_);
      auVar154._12_4_ = (int)(auVar183._12_4_ + auVar168._12_4_);
      auVar166._16_4_ = (int)(auVar183._16_4_ + auVar168._16_4_);
      auVar166._0_16_ = auVar154;
      auVar166._20_4_ = (int)(auVar183._20_4_ + auVar168._20_4_);
      auVar166._24_4_ = (int)(auVar183._24_4_ + auVar168._24_4_);
      auVar166._28_4_ = (int)(auVar183._28_4_ + auVar175._0_4_);
      auVar177._0_4_ = (int)(auVar208._0_4_ + auVar193._0_4_);
      auVar177._4_4_ = (int)(auVar208._4_4_ + auVar193._4_4_);
      auVar177._8_4_ = (int)(auVar208._8_4_ + auVar193._8_4_);
      auVar177._12_4_ = (int)(auVar208._12_4_ + auVar193._12_4_);
      auVar187._16_4_ = (int)(auVar208._16_4_ + auVar193._16_4_);
      auVar187._0_16_ = auVar177;
      auVar187._20_4_ = (int)(auVar208._20_4_ + auVar193._20_4_);
      auVar187._24_4_ = (int)(auVar208._24_4_ + auVar193._24_4_);
      auVar187._28_4_ = (int)(auVar208._28_4_ + auVar211._0_4_);
      in_ZMM8 = ZEXT1664(auVar166._16_16_);
      auVar328 = vpackssdw_avx(auVar154,auVar166._16_16_);
      auVar346 = vpackssdw_avx(auVar177,auVar187._16_16_);
      auVar328 = vpminsw_avx(auVar328,auVar131._0_16_);
      auVar346 = vpminsw_avx(auVar346,auVar131._0_16_);
      auVar328 = vpmaxsw_avx(auVar328,auVar229._0_16_);
      auVar346 = vpmaxsw_avx(auVar346,auVar229._0_16_);
      in_ZMM6 = ZEXT1664(auVar346);
      auVar328 = vpacksswb_avx(auVar328,auVar346);
      *(undefined1 (*) [16])(ptr + uVar37) = auVar328;
      intptr = (int *)((long)intptr + 0x40);
      uVar37 = uVar37 + 0x10;
    }
    pfVar4 = (float *)activation_params->data;
    auVar191 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
    auVar229 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
    auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar69._8_4_ = 0xc2b0c0a5;
    auVar69._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar69._12_4_ = 0xc2b0c0a5;
    auVar69._16_4_ = 0xc2b0c0a5;
    auVar69._20_4_ = 0xc2b0c0a5;
    auVar69._24_4_ = 0xc2b0c0a5;
    auVar69._28_4_ = 0xc2b0c0a5;
    while( true ) {
      if (iVar35 <= (int)uVar37 + 7) break;
      auVar367 = vcvtdq2ps_avx(*(undefined1 (*) [32])intptr);
      auVar181._0_4_ = auVar367._0_4_ * (float)local_f8._0_4_;
      auVar181._4_4_ = auVar367._4_4_ * (float)local_f8._4_4_;
      auVar181._8_4_ = auVar367._8_4_ * fStack_f0;
      auVar181._12_4_ = auVar367._12_4_ * fStack_ec;
      auVar181._16_4_ = auVar367._16_4_ * fStack_e8;
      auVar181._20_4_ = auVar367._20_4_ * fStack_e4;
      uVar20 = auVar367._28_4_;
      auVar181._24_4_ = auVar367._24_4_ * fStack_e0;
      auVar367._28_4_ = uVar20;
      auVar367._0_28_ = auVar181;
      auVar175 = ZEXT436(uVar20);
      auVar247 = auVar181;
      if (5 < uVar33) goto switchD_0041fb39_caseD_0;
      auVar61 = auVar131._0_32_;
      auVar182 = vmaxps_avx(auVar367,auVar61);
      auVar247 = auVar182._0_28_;
      switch(uVar33) {
      case 1:
        auVar367 = vminps_avx(auVar367,auVar61);
        fVar213 = *pfVar4;
        auVar175 = ZEXT436(auVar367._28_4_);
        auVar247._0_4_ = auVar182._0_4_ + fVar213 * auVar367._0_4_;
        auVar247._4_4_ = auVar182._4_4_ + fVar213 * auVar367._4_4_;
        auVar247._8_4_ = auVar182._8_4_ + fVar213 * auVar367._8_4_;
        auVar247._12_4_ = auVar182._12_4_ + fVar213 * auVar367._12_4_;
        auVar247._16_4_ = auVar182._16_4_ + fVar213 * auVar367._16_4_;
        auVar247._20_4_ = auVar182._20_4_ + fVar213 * auVar367._20_4_;
        auVar247._24_4_ = auVar182._24_4_ + fVar213 * auVar367._24_4_;
        break;
      case 2:
        fVar213 = *pfVar4;
        auVar226._4_4_ = fVar213;
        auVar226._0_4_ = fVar213;
        auVar226._8_4_ = fVar213;
        auVar226._12_4_ = fVar213;
        auVar226._16_4_ = fVar213;
        auVar226._20_4_ = fVar213;
        auVar226._24_4_ = fVar213;
        auVar226._28_4_ = fVar213;
        fVar213 = pfVar4[1];
        auVar280._4_4_ = fVar213;
        auVar280._0_4_ = fVar213;
        auVar280._8_4_ = fVar213;
        auVar280._12_4_ = fVar213;
        auVar280._16_4_ = fVar213;
        auVar280._20_4_ = fVar213;
        auVar280._24_4_ = fVar213;
        auVar280._28_4_ = fVar213;
        auVar367 = vmaxps_avx(auVar226,auVar367);
        auVar175 = ZEXT436(auVar367._28_4_);
        auVar367 = vminps_avx(auVar280,auVar367);
        auVar247 = auVar367._0_28_;
        break;
      case 3:
        auVar188._0_4_ = auVar369._0_4_ ^ (uint)auVar181._0_4_;
        auVar188._4_4_ = auVar369._4_4_ ^ (uint)auVar181._4_4_;
        auVar188._8_4_ = auVar369._8_4_ ^ (uint)auVar181._8_4_;
        auVar188._12_4_ = auVar369._12_4_ ^ (uint)auVar181._12_4_;
        auVar188._16_4_ = auVar369._16_4_ ^ (uint)auVar181._16_4_;
        auVar188._20_4_ = auVar369._20_4_ ^ (uint)auVar181._20_4_;
        auVar188._24_4_ = auVar369._24_4_ ^ (uint)auVar181._24_4_;
        auVar188._28_4_ = auVar369._28_4_ ^ uVar20;
        auVar100._8_4_ = 0x42b0c0a5;
        auVar100._0_8_ = 0x42b0c0a542b0c0a5;
        auVar100._12_4_ = 0x42b0c0a5;
        auVar100._16_4_ = 0x42b0c0a5;
        auVar100._20_4_ = 0x42b0c0a5;
        auVar100._24_4_ = 0x42b0c0a5;
        auVar100._28_4_ = 0x42b0c0a5;
        auVar367 = vminps_avx(auVar188,auVar100);
        auVar167._8_4_ = 0xc2b0c0a5;
        auVar167._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar167._12_4_ = 0xc2b0c0a5;
        auVar167._16_4_ = 0xc2b0c0a5;
        auVar167._20_4_ = 0xc2b0c0a5;
        auVar167._24_4_ = 0xc2b0c0a5;
        auVar167._28_4_ = 0xc2b0c0a5;
        auVar182 = vmaxps_avx(auVar367,auVar167);
        auVar227._0_4_ = auVar182._0_4_ * 1.442695 + fVar70;
        auVar227._4_4_ = auVar182._4_4_ * 1.442695 + fVar169;
        auVar227._8_4_ = auVar182._8_4_ * 1.442695 + fVar172;
        auVar227._12_4_ = auVar182._12_4_ * 1.442695 + fVar173;
        auVar227._16_4_ = auVar182._16_4_ * 1.442695 + fVar355;
        auVar227._20_4_ = auVar182._20_4_ * 1.442695 + fVar230;
        auVar227._24_4_ = auVar182._24_4_ * 1.442695 + fVar233;
        auVar227._28_4_ = in_ZMM8._28_4_ + fVar235;
        auVar61 = vroundps_avx(auVar227,1);
        auVar367 = vcmpps_avx(auVar227,auVar61,1);
        auVar367 = vandps_avx(auVar367,auVar208);
        auVar367 = vsubps_avx(auVar61,auVar367);
        fVar213 = auVar367._0_4_ * -0.6931472 + auVar182._0_4_;
        fVar326 = auVar367._4_4_ * -0.6931472 + auVar182._4_4_;
        fVar356 = auVar367._8_4_ * -0.6931472 + auVar182._8_4_;
        fVar343 = auVar367._12_4_ * -0.6931472 + auVar182._12_4_;
        fVar357 = auVar367._16_4_ * -0.6931472 + auVar182._16_4_;
        fVar344 = auVar367._20_4_ * -0.6931472 + auVar182._20_4_;
        fVar358 = auVar367._24_4_ * -0.6931472 + auVar182._24_4_;
        auVar216._0_4_ = (int)auVar367._0_4_;
        auVar216._4_4_ = (int)auVar367._4_4_;
        auVar216._8_4_ = (int)auVar367._8_4_;
        auVar216._12_4_ = (int)auVar367._12_4_;
        auVar228._16_4_ = (int)auVar367._16_4_;
        auVar228._0_16_ = auVar216;
        auVar228._20_4_ = (int)auVar367._20_4_;
        auVar228._24_4_ = (int)auVar367._24_4_;
        auVar228._28_4_ = (int)auVar367._28_4_;
        auVar346 = vpslld_avx(auVar216,0x17);
        auVar328 = vpslld_avx(auVar228._16_16_,0x17);
        auVar156._8_4_ = 0x3f800000;
        auVar156._0_8_ = 0x3f8000003f800000;
        auVar156._12_4_ = 0x3f800000;
        auVar328 = vpaddd_avx(auVar328,auVar156);
        auVar346 = vpaddd_avx(auVar346,auVar156);
        auVar189._0_4_ =
             auVar346._0_4_ *
             (fVar213 * fVar213 *
              (((((fVar213 * 0.00019875691 + 0.0013981999) * fVar213 + 0.008333452) * fVar213 +
                0.041665796) * fVar213 + 0.16666666) * fVar213 + fVar70) + fVar213 + fVar152) +
             fVar152;
        auVar189._4_4_ =
             auVar346._4_4_ *
             (fVar326 * fVar326 *
              (((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) * fVar326 +
                0.041665796) * fVar326 + 0.16666666) * fVar326 + fVar169) + fVar326 + fVar170) +
             fVar170;
        auVar189._8_4_ =
             auVar346._8_4_ *
             (fVar356 * fVar356 *
              (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) * fVar356 +
                0.041665796) * fVar356 + 0.16666666) * fVar356 + fVar172) + fVar356 + fVar171) +
             fVar171;
        auVar189._12_4_ =
             auVar346._12_4_ *
             (fVar343 * fVar343 *
              (((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 + 0.008333452) * fVar343 +
                0.041665796) * fVar343 + 0.16666666) * fVar343 + fVar173) + fVar343 + fVar174) +
             fVar174;
        auVar189._16_4_ =
             auVar328._0_4_ *
             (fVar357 * fVar357 *
              (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) * fVar357 +
                0.041665796) * fVar357 + 0.16666666) * fVar357 + fVar355) + fVar357 + fVar212) +
             fVar212;
        auVar189._20_4_ =
             auVar328._4_4_ *
             (fVar344 * fVar344 *
              (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344 +
                0.041665796) * fVar344 + 0.16666666) * fVar344 + fVar230) + fVar344 + fVar231) +
             fVar231;
        auVar189._24_4_ =
             auVar328._8_4_ *
             (fVar358 * fVar358 *
              (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) * fVar358 +
                0.041665796) * fVar358 + 0.16666666) * fVar358 + fVar233) + fVar358 + fVar232) +
             fVar232;
        auVar189._28_4_ = auVar61._28_4_ + auVar61._28_4_ + auVar182._28_4_ + fVar234 + fVar234;
        auVar175 = ZEXT436((uint)auVar189._28_4_);
        auVar367 = vdivps_avx(auVar208,auVar189);
        auVar247 = auVar367._0_28_;
        break;
      case 4:
        auVar99._8_4_ = 0x42b0c0a5;
        auVar99._0_8_ = 0x42b0c0a542b0c0a5;
        auVar99._12_4_ = 0x42b0c0a5;
        auVar99._16_4_ = 0x42b0c0a5;
        auVar99._20_4_ = 0x42b0c0a5;
        auVar99._24_4_ = 0x42b0c0a5;
        auVar99._28_4_ = 0x42b0c0a5;
        auVar367 = vminps_avx(auVar367,auVar99);
        auVar61 = vmaxps_avx(auVar367,auVar69);
        auVar275._0_4_ = auVar61._0_4_ * 1.442695 + fVar70;
        auVar275._4_4_ = auVar61._4_4_ * 1.442695 + fVar169;
        auVar275._8_4_ = auVar61._8_4_ * 1.442695 + fVar172;
        auVar275._12_4_ = auVar61._12_4_ * 1.442695 + fVar173;
        auVar275._16_4_ = auVar61._16_4_ * 1.442695 + fVar355;
        auVar275._20_4_ = auVar61._20_4_ * 1.442695 + fVar230;
        auVar275._24_4_ = auVar61._24_4_ * 1.442695 + fVar233;
        auVar275._28_4_ = auVar182._28_4_ + fVar235;
        auVar182 = vroundps_avx(auVar275,1);
        auVar367 = vcmpps_avx(auVar275,auVar182,1);
        auVar367 = vandps_avx(auVar367,auVar208);
        auVar367 = vsubps_avx(auVar182,auVar367);
        auVar8._4_4_ = auVar367._4_4_ * 0.6931472;
        auVar8._0_4_ = auVar367._0_4_ * 0.6931472;
        auVar8._8_4_ = auVar367._8_4_ * 0.6931472;
        auVar8._12_4_ = auVar367._12_4_ * 0.6931472;
        auVar8._16_4_ = auVar367._16_4_ * 0.6931472;
        auVar8._20_4_ = auVar367._20_4_ * 0.6931472;
        auVar8._24_4_ = auVar367._24_4_ * 0.6931472;
        auVar8._28_4_ = auVar182._28_4_;
        auVar61 = vsubps_avx(auVar61,auVar8);
        fVar213 = auVar61._0_4_;
        fVar326 = auVar61._4_4_;
        fVar356 = auVar61._8_4_;
        fVar343 = auVar61._12_4_;
        fVar357 = auVar61._16_4_;
        fVar344 = auVar61._20_4_;
        fVar358 = auVar61._24_4_;
        auVar244._0_4_ = (int)auVar367._0_4_;
        auVar244._4_4_ = (int)auVar367._4_4_;
        auVar244._8_4_ = (int)auVar367._8_4_;
        auVar244._12_4_ = (int)auVar367._12_4_;
        auVar276._16_4_ = (int)auVar367._16_4_;
        auVar276._0_16_ = auVar244;
        auVar276._20_4_ = (int)auVar367._20_4_;
        auVar276._24_4_ = (int)auVar367._24_4_;
        auVar276._28_4_ = (int)auVar367._28_4_;
        auVar346 = vpslld_avx(auVar244,0x17);
        auVar328 = vpslld_avx(auVar276._16_16_,0x17);
        auVar155._8_4_ = 0x3f800000;
        auVar155._0_8_ = 0x3f8000003f800000;
        auVar155._12_4_ = 0x3f800000;
        auVar328 = vpaddd_avx(auVar328,auVar155);
        auVar346 = vpaddd_avx(auVar346,auVar155);
        auVar277._0_4_ =
             (fVar213 + fVar152 +
             fVar213 * fVar213 *
             (((((fVar213 * 0.00019875691 + 0.0013981999) * fVar213 + 0.008333452) * fVar213 +
               0.041665796) * fVar213 + 0.16666666) * fVar213 + fVar70)) * auVar346._0_4_ + fVar152;
        auVar277._4_4_ =
             (fVar326 + fVar170 +
             fVar326 * fVar326 *
             (((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) * fVar326 +
               0.041665796) * fVar326 + 0.16666666) * fVar326 + fVar169)) * auVar346._4_4_ + fVar170
        ;
        auVar277._8_4_ =
             (fVar356 + fVar171 +
             fVar356 * fVar356 *
             (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) * fVar356 +
               0.041665796) * fVar356 + 0.16666666) * fVar356 + fVar172)) * auVar346._8_4_ + fVar171
        ;
        auVar277._12_4_ =
             (fVar343 + fVar174 +
             fVar343 * fVar343 *
             (((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 + 0.008333452) * fVar343 +
               0.041665796) * fVar343 + 0.16666666) * fVar343 + fVar173)) * auVar346._12_4_ +
             fVar174;
        auVar277._16_4_ =
             (fVar357 + fVar212 +
             fVar357 * fVar357 *
             (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) * fVar357 +
               0.041665796) * fVar357 + 0.16666666) * fVar357 + fVar355)) * auVar328._0_4_ + fVar212
        ;
        auVar277._20_4_ =
             (fVar344 + fVar231 +
             fVar344 * fVar344 *
             (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344 +
               0.041665796) * fVar344 + 0.16666666) * fVar344 + fVar230)) * auVar328._4_4_ + fVar231
        ;
        auVar277._24_4_ =
             (fVar358 + fVar232 +
             fVar358 * fVar358 *
             (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) * fVar358 +
               0.041665796) * fVar358 + 0.16666666) * fVar358 + fVar233)) * auVar328._8_4_ + fVar232
        ;
        auVar277._28_4_ = auVar61._28_4_ + fVar234 + auVar182._28_4_ + fVar234;
        auVar223._8_4_ = 0x800000;
        auVar223._0_8_ = 0x80000000800000;
        auVar223._12_4_ = 0x800000;
        auVar223._16_4_ = 0x800000;
        auVar223._20_4_ = 0x800000;
        auVar223._24_4_ = 0x800000;
        auVar223._28_4_ = 0x800000;
        auVar61 = vmaxps_avx(auVar277,auVar223);
        auVar328 = vpsrld_avx(auVar61._16_16_,0x17);
        auVar305._8_4_ = 0x807fffff;
        auVar305._0_8_ = 0x807fffff807fffff;
        auVar305._12_4_ = 0x807fffff;
        auVar305._16_4_ = 0x807fffff;
        auVar305._20_4_ = 0x807fffff;
        auVar305._24_4_ = 0x807fffff;
        auVar305._28_4_ = 0x807fffff;
        auVar367 = vandps_avx(auVar61,auVar305);
        auVar8 = vorps_avx(auVar367,auVar183);
        auVar60._8_4_ = 0x3f3504f3;
        auVar60._0_8_ = 0x3f3504f33f3504f3;
        auVar60._12_4_ = 0x3f3504f3;
        auVar60._16_4_ = 0x3f3504f3;
        auVar60._20_4_ = 0x3f3504f3;
        auVar60._24_4_ = 0x3f3504f3;
        auVar60._28_4_ = 0x3f3504f3;
        auVar182 = vcmpps_avx(auVar60,auVar8,2);
        auVar367 = vandnps_avx(auVar182,auVar8);
        fVar213 = auVar8._0_4_ + -1.0 + auVar367._0_4_;
        fVar326 = auVar8._4_4_ + -1.0 + auVar367._4_4_;
        fVar356 = auVar8._8_4_ + -1.0 + auVar367._8_4_;
        fVar343 = auVar8._12_4_ + -1.0 + auVar367._12_4_;
        fVar357 = auVar8._16_4_ + -1.0 + auVar367._16_4_;
        fVar344 = auVar8._20_4_ + -1.0 + auVar367._20_4_;
        fVar358 = auVar8._24_4_ + -1.0 + auVar367._24_4_;
        auVar328 = vpsubd_avx(auVar328,auVar182._16_16_);
        auVar354._8_4_ = 0x42b0c0a5;
        auVar354._0_8_ = 0x42b0c0a542b0c0a5;
        auVar354._12_4_ = 0x42b0c0a5;
        auVar354._16_4_ = 0x42b0c0a5;
        auVar354._20_4_ = 0x42b0c0a5;
        auVar354._24_4_ = 0x42b0c0a5;
        auVar354._28_4_ = 0x42b0c0a5;
        auVar346 = vpsrld_avx(auVar61._0_16_,0x17);
        auVar45._8_4_ = 0xffffff81;
        auVar45._0_8_ = 0xffffff81ffffff81;
        auVar45._12_4_ = 0xffffff81;
        auVar328 = vpaddd_avx(auVar328,auVar45);
        auVar346 = vpsubd_avx(auVar346,auVar182._0_16_);
        auVar346 = vpaddd_avx(auVar346,auVar45);
        auVar224._16_16_ = auVar328;
        auVar224._0_16_ = auVar346;
        auVar369 = ZEXT3264(CONCAT428(0x80000000,
                                      CONCAT424(0x80000000,
                                                CONCAT420(0x80000000,
                                                          CONCAT416(0x80000000,
                                                                    CONCAT412(0x80000000,
                                                                              CONCAT48(0x80000000,
                                                                                                                                                                              
                                                  0x8000000080000000)))))));
        auVar182 = vcmpps_avx(auVar277,_DAT_0053ad40,2);
        auVar61 = vcvtdq2ps_avx(auVar224);
        auVar29._4_4_ =
             (auVar61._4_4_ * 0.6931472 + fVar326 +
             fVar326 * fVar326 *
             (((((((((fVar326 * 0.070376836 + -0.1151461) * fVar326 + 0.116769984) * fVar326 +
                   -0.12420141) * fVar326 + 0.14249323) * fVar326 + -0.16668057) * fVar326 +
                0.20000714) * fVar326 + -0.24999994) * fVar326 + 0.3333333) * fVar326 + -0.5)) *
             -2.0;
        auVar29._0_4_ =
             (auVar61._0_4_ * 0.6931472 + fVar213 +
             fVar213 * fVar213 *
             (((((((((fVar213 * 0.070376836 + -0.1151461) * fVar213 + 0.116769984) * fVar213 +
                   -0.12420141) * fVar213 + 0.14249323) * fVar213 + -0.16668057) * fVar213 +
                0.20000714) * fVar213 + -0.24999994) * fVar213 + 0.3333333) * fVar213 + -0.5)) *
             -2.0;
        auVar29._8_4_ =
             (auVar61._8_4_ * 0.6931472 + fVar356 +
             fVar356 * fVar356 *
             (((((((((fVar356 * 0.070376836 + -0.1151461) * fVar356 + 0.116769984) * fVar356 +
                   -0.12420141) * fVar356 + 0.14249323) * fVar356 + -0.16668057) * fVar356 +
                0.20000714) * fVar356 + -0.24999994) * fVar356 + 0.3333333) * fVar356 + -0.5)) *
             -2.0;
        auVar29._12_4_ =
             (auVar61._12_4_ * 0.6931472 + fVar343 +
             fVar343 * fVar343 *
             (((((((((fVar343 * 0.070376836 + -0.1151461) * fVar343 + 0.116769984) * fVar343 +
                   -0.12420141) * fVar343 + 0.14249323) * fVar343 + -0.16668057) * fVar343 +
                0.20000714) * fVar343 + -0.24999994) * fVar343 + 0.3333333) * fVar343 + -0.5)) *
             -2.0;
        auVar29._16_4_ =
             (auVar61._16_4_ * 0.6931472 + fVar357 +
             fVar357 * fVar357 *
             (((((((((fVar357 * 0.070376836 + -0.1151461) * fVar357 + 0.116769984) * fVar357 +
                   -0.12420141) * fVar357 + 0.14249323) * fVar357 + -0.16668057) * fVar357 +
                0.20000714) * fVar357 + -0.24999994) * fVar357 + 0.3333333) * fVar357 + -0.5)) *
             -2.0;
        auVar29._20_4_ =
             (auVar61._20_4_ * 0.6931472 + fVar344 +
             fVar344 * fVar344 *
             (((((((((fVar344 * 0.070376836 + -0.1151461) * fVar344 + 0.116769984) * fVar344 +
                   -0.12420141) * fVar344 + 0.14249323) * fVar344 + -0.16668057) * fVar344 +
                0.20000714) * fVar344 + -0.24999994) * fVar344 + 0.3333333) * fVar344 + -0.5)) *
             -2.0;
        auVar29._24_4_ =
             (auVar61._24_4_ * 0.6931472 + fVar358 +
             fVar358 * fVar358 *
             (((((((((fVar358 * 0.070376836 + -0.1151461) * fVar358 + 0.116769984) * fVar358 +
                   -0.12420141) * fVar358 + 0.14249323) * fVar358 + -0.16668057) * fVar358 +
                0.20000714) * fVar358 + -0.24999994) * fVar358 + 0.3333333) * fVar358 + -0.5)) *
             -2.0;
        auVar29._28_4_ = auVar61._28_4_ + auVar8._28_4_ + -1.0 + auVar367._28_4_ + 0.0;
        auVar61._8_4_ = 0x7fffffff;
        auVar61._0_8_ = 0x7fffffff7fffffff;
        auVar61._12_4_ = 0x7fffffff;
        auVar61._16_4_ = 0x7fffffff;
        auVar61._20_4_ = 0x7fffffff;
        auVar61._24_4_ = 0x7fffffff;
        auVar61._28_4_ = 0x7fffffff;
        auVar367 = vblendvps_avx(auVar29,auVar61,auVar182);
        auVar367 = vminps_avx(auVar367,auVar354);
        auVar61 = vmaxps_avx(auVar367,auVar69);
        auVar278._0_4_ = auVar61._0_4_ * 1.442695 + fVar70;
        auVar278._4_4_ = auVar61._4_4_ * 1.442695 + fVar169;
        auVar278._8_4_ = auVar61._8_4_ * 1.442695 + fVar172;
        auVar278._12_4_ = auVar61._12_4_ * 1.442695 + fVar173;
        auVar278._16_4_ = auVar61._16_4_ * 1.442695 + fVar355;
        auVar278._20_4_ = auVar61._20_4_ * 1.442695 + fVar230;
        auVar278._24_4_ = auVar61._24_4_ * 1.442695 + fVar233;
        auVar278._28_4_ = auVar182._28_4_ + fVar235;
        auVar182 = vroundps_avx(auVar278,1);
        auVar367 = vcmpps_avx(auVar278,auVar182,1);
        auVar367 = vandps_avx(auVar367,auVar208);
        auVar367 = vsubps_avx(auVar182,auVar367);
        auVar30._4_4_ = auVar367._4_4_ * 0.6931472;
        auVar30._0_4_ = auVar367._0_4_ * 0.6931472;
        auVar30._8_4_ = auVar367._8_4_ * 0.6931472;
        auVar30._12_4_ = auVar367._12_4_ * 0.6931472;
        auVar30._16_4_ = auVar367._16_4_ * 0.6931472;
        auVar30._20_4_ = auVar367._20_4_ * 0.6931472;
        auVar30._24_4_ = auVar367._24_4_ * 0.6931472;
        auVar30._28_4_ = auVar182._28_4_;
        auVar191 = ZEXT1664(auVar191._0_16_);
        auVar229 = ZEXT1664(auVar229._0_16_);
        auVar131 = ZEXT1664((undefined1  [16])0x0);
        auVar61 = vsubps_avx(auVar61,auVar30);
        fVar213 = auVar61._0_4_;
        fVar326 = auVar61._4_4_;
        fVar356 = auVar61._8_4_;
        fVar343 = auVar61._12_4_;
        fVar357 = auVar61._16_4_;
        fVar344 = auVar61._20_4_;
        fVar358 = auVar61._24_4_;
        auVar245._0_4_ = (int)auVar367._0_4_;
        auVar245._4_4_ = (int)auVar367._4_4_;
        auVar245._8_4_ = (int)auVar367._8_4_;
        auVar245._12_4_ = (int)auVar367._12_4_;
        auVar279._16_4_ = (int)auVar367._16_4_;
        auVar279._0_16_ = auVar245;
        auVar279._20_4_ = (int)auVar367._20_4_;
        auVar279._24_4_ = (int)auVar367._24_4_;
        auVar279._28_4_ = (int)auVar367._28_4_;
        auVar346 = vpslld_avx(auVar245,0x17);
        auVar328 = vpslld_avx(auVar279._16_16_,0x17);
        auVar328 = vpaddd_avx(auVar328,auVar155);
        auVar346 = vpaddd_avx(auVar346,auVar155);
        auVar225._0_4_ =
             (fVar213 + fVar152 +
             fVar213 * fVar213 *
             (((((fVar213 * 0.00019875691 + 0.0013981999) * fVar213 + 0.008333452) * fVar213 +
               0.041665796) * fVar213 + 0.16666666) * fVar213 + fVar70)) * auVar346._0_4_ + fVar152;
        auVar225._4_4_ =
             (fVar326 + fVar170 +
             fVar326 * fVar326 *
             (((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) * fVar326 +
               0.041665796) * fVar326 + 0.16666666) * fVar326 + fVar169)) * auVar346._4_4_ + fVar170
        ;
        auVar225._8_4_ =
             (fVar356 + fVar171 +
             fVar356 * fVar356 *
             (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) * fVar356 +
               0.041665796) * fVar356 + 0.16666666) * fVar356 + fVar172)) * auVar346._8_4_ + fVar171
        ;
        auVar225._12_4_ =
             (fVar343 + fVar174 +
             fVar343 * fVar343 *
             (((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 + 0.008333452) * fVar343 +
               0.041665796) * fVar343 + 0.16666666) * fVar343 + fVar173)) * auVar346._12_4_ +
             fVar174;
        auVar225._16_4_ =
             (fVar357 + fVar212 +
             fVar357 * fVar357 *
             (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) * fVar357 +
               0.041665796) * fVar357 + 0.16666666) * fVar357 + fVar355)) * auVar328._0_4_ + fVar212
        ;
        auVar225._20_4_ =
             (fVar344 + fVar231 +
             fVar344 * fVar344 *
             (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344 +
               0.041665796) * fVar344 + 0.16666666) * fVar344 + fVar230)) * auVar328._4_4_ + fVar231
        ;
        auVar225._24_4_ =
             (fVar358 + fVar232 +
             fVar358 * fVar358 *
             (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) * fVar358 +
               0.041665796) * fVar358 + 0.16666666) * fVar358 + fVar233)) * auVar328._8_4_ + fVar232
        ;
        auVar225._28_4_ = auVar61._28_4_ + fVar234 + auVar182._28_4_ + fVar234;
        auVar62._8_4_ = 0x40000000;
        auVar62._0_8_ = 0x4000000040000000;
        auVar62._12_4_ = 0x40000000;
        auVar62._16_4_ = 0x40000000;
        auVar62._20_4_ = 0x40000000;
        auVar62._24_4_ = 0x40000000;
        auVar62._28_4_ = 0x40000000;
        auVar367 = vdivps_avx(auVar62,auVar225);
        auVar217._0_4_ = auVar367._0_4_ + -1.0;
        auVar217._4_4_ = auVar367._4_4_ + -1.0;
        auVar217._8_4_ = auVar367._8_4_ + -1.0;
        auVar217._12_4_ = auVar367._12_4_ + -1.0;
        auVar217._16_4_ = auVar367._16_4_ + -1.0;
        auVar217._20_4_ = auVar367._20_4_ + -1.0;
        auVar217._24_4_ = auVar367._24_4_ + -1.0;
        goto LAB_0041ffe7;
      case 5:
        fVar213 = *pfVar4;
        fVar326 = pfVar4[1];
        auVar182._0_4_ = fVar213 * auVar181._0_4_ + fVar326;
        auVar182._4_4_ = fVar213 * auVar181._4_4_ + fVar326;
        auVar182._8_4_ = fVar213 * auVar181._8_4_ + fVar326;
        auVar182._12_4_ = fVar213 * auVar181._12_4_ + fVar326;
        auVar182._16_4_ = fVar213 * auVar181._16_4_ + fVar326;
        auVar182._20_4_ = fVar213 * auVar181._20_4_ + fVar326;
        auVar182._24_4_ = fVar213 * auVar181._24_4_ + fVar326;
        auVar182._28_4_ = fVar213 + fVar326;
        auVar367 = vmaxps_avx(auVar182,auVar61);
        auVar367 = vminps_avx(auVar367,auVar208);
        auVar217 = auVar367._0_28_;
LAB_0041ffe7:
        auVar247._0_4_ = auVar217._0_4_ * auVar181._0_4_;
        auVar247._4_4_ = auVar217._4_4_ * auVar181._4_4_;
        auVar247._8_4_ = auVar217._8_4_ * auVar181._8_4_;
        auVar247._12_4_ = auVar217._12_4_ * auVar181._12_4_;
        auVar247._16_4_ = auVar217._16_4_ * auVar181._16_4_;
        auVar247._20_4_ = auVar217._20_4_ * auVar181._20_4_;
        auVar247._24_4_ = auVar217._24_4_ * auVar181._24_4_;
      }
switchD_0041fb39_caseD_0:
      auVar364._0_4_ = auVar247._0_4_ * (float)local_b8._0_4_;
      auVar364._4_4_ = auVar247._4_4_ * (float)local_b8._4_4_;
      auVar364._8_4_ = auVar247._8_4_ * fStack_b0;
      auVar364._12_4_ = auVar247._12_4_ * fStack_ac;
      auVar364._16_4_ = auVar247._16_4_ * fStack_a8;
      auVar364._20_4_ = auVar247._20_4_ * fStack_a4;
      auVar364._24_4_ = auVar247._24_4_ * fStack_a0;
      auVar364._28_36_ = auVar175;
      auVar367 = vandps_avx(auVar369._0_32_,auVar364._0_32_);
      auVar367 = vorps_avx(auVar367,auVar183);
      auVar178._0_4_ = (int)(auVar367._0_4_ + auVar364._0_4_);
      auVar178._4_4_ = (int)(auVar367._4_4_ + auVar364._4_4_);
      auVar178._8_4_ = (int)(auVar367._8_4_ + auVar364._8_4_);
      auVar178._12_4_ = (int)(auVar367._12_4_ + auVar364._12_4_);
      auVar190._16_4_ = (int)(auVar367._16_4_ + auVar364._16_4_);
      auVar190._0_16_ = auVar178;
      auVar190._20_4_ = (int)(auVar367._20_4_ + auVar364._20_4_);
      auVar190._24_4_ = (int)(auVar367._24_4_ + auVar364._24_4_);
      auVar190._28_4_ = (int)(auVar367._28_4_ + auVar175._0_4_);
      in_ZMM8 = ZEXT1664(auVar190._16_16_);
      auVar328 = vpackssdw_avx(auVar178,auVar190._16_16_);
      auVar328 = vpminsw_avx(auVar191._0_16_,auVar328);
      auVar328 = vpmaxsw_avx(auVar229._0_16_,auVar328);
      auVar328 = vpacksswb_avx(auVar328,auVar328);
      *(long *)(ptr + uVar37) = auVar328._0_8_;
      intptr = (int *)((long)intptr + 0x20);
      uVar37 = uVar37 + 8;
    }
    auVar364 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
    auVar328._8_4_ = 0x3f000000;
    auVar328._0_8_ = 0x3f0000003f000000;
    auVar328._12_4_ = 0x3f000000;
    auVar131 = ZEXT864(0) << 0x20;
    for (; (int)uVar37 + 3 < iVar35; uVar37 = uVar37 + 4) {
      auVar346 = vcvtdq2ps_avx(*(undefined1 (*) [16])*(undefined1 (*) [32])intptr);
      auVar238._0_4_ = auVar346._0_4_ * fVar1;
      auVar238._4_4_ = auVar346._4_4_ * fVar1;
      auVar238._8_4_ = auVar346._8_4_ * fVar1;
      auVar238._12_4_ = auVar346._12_4_ * fVar1;
      auVar346 = auVar238;
      if (5 < uVar33) goto switchD_0042009b_caseD_0;
      auVar329 = auVar131._0_16_;
      auVar346 = vmaxps_avx(auVar238,auVar329);
      switch(uVar33) {
      case 1:
        auVar238 = vminps_avx(auVar238,auVar329);
        fVar70 = *activation_params->data;
        auVar142._0_4_ = fVar70 * auVar238._0_4_ + auVar346._0_4_;
        auVar142._4_4_ = fVar70 * auVar238._4_4_ + auVar346._4_4_;
        auVar142._8_4_ = fVar70 * auVar238._8_4_ + auVar346._8_4_;
        auVar142._12_4_ = fVar70 * auVar238._12_4_ + auVar346._12_4_;
        auVar346 = auVar142;
        break;
      case 2:
        uVar3 = *activation_params->data;
        auVar147._4_4_ = uVar3;
        auVar147._0_4_ = uVar3;
        auVar147._8_4_ = uVar3;
        auVar147._12_4_ = uVar3;
        uVar3 = *(undefined4 *)((long)activation_params->data + 4);
        auVar334._4_4_ = uVar3;
        auVar334._0_4_ = uVar3;
        auVar334._8_4_ = uVar3;
        auVar334._12_4_ = uVar3;
        auVar346 = vmaxps_avx(auVar238,auVar147);
        auVar346 = vminps_avx(auVar334,auVar346);
        break;
      case 3:
        auVar148._0_4_ = (uint)auVar238._0_4_ ^ auVar364._0_4_;
        auVar148._4_4_ = (uint)auVar238._4_4_ ^ auVar364._4_4_;
        auVar148._8_4_ = (uint)auVar238._8_4_ ^ auVar364._8_4_;
        auVar148._12_4_ = (uint)auVar238._12_4_ ^ auVar364._12_4_;
        auVar86._8_4_ = 0x42b0c0a5;
        auVar86._0_8_ = 0x42b0c0a542b0c0a5;
        auVar86._12_4_ = 0x42b0c0a5;
        auVar346 = vminps_avx(auVar148,auVar86);
        auVar87._8_4_ = 0xc2b0c0a5;
        auVar87._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar87._12_4_ = 0xc2b0c0a5;
        auVar329 = vmaxps_avx(auVar346,auVar87);
        auVar335._0_4_ = auVar329._0_4_ * 1.442695 + 0.5;
        auVar335._4_4_ = auVar329._4_4_ * 1.442695 + 0.5;
        auVar335._8_4_ = auVar329._8_4_ * 1.442695 + 0.5;
        auVar335._12_4_ = auVar329._12_4_ * 1.442695 + 0.5;
        auVar351._0_4_ = (int)auVar335._0_4_;
        auVar351._4_4_ = (int)auVar335._4_4_;
        auVar351._8_4_ = (int)auVar335._8_4_;
        auVar351._12_4_ = (int)auVar335._12_4_;
        auVar238 = vcvtdq2ps_avx(auVar351);
        auVar346 = vcmpps_avx(auVar335,auVar238,1);
        auVar88._8_4_ = 0x3f800000;
        auVar88._0_8_ = 0x3f8000003f800000;
        auVar88._12_4_ = 0x3f800000;
        auVar346 = vandps_avx(auVar346,auVar88);
        auVar346 = vsubps_avx(auVar238,auVar346);
        fVar70 = auVar346._0_4_ * -0.6931472 + auVar329._0_4_;
        fVar152 = auVar346._4_4_ * -0.6931472 + auVar329._4_4_;
        fVar169 = auVar346._8_4_ * -0.6931472 + auVar329._8_4_;
        fVar170 = auVar346._12_4_ * -0.6931472 + auVar329._12_4_;
        auVar310._0_4_ = (int)auVar346._0_4_;
        auVar310._4_4_ = (int)auVar346._4_4_;
        auVar310._8_4_ = (int)auVar346._8_4_;
        auVar310._12_4_ = (int)auVar346._12_4_;
        auVar346 = vpslld_avx(auVar310,0x17);
        auVar346 = vpaddd_avx(auVar346,auVar88);
        auVar149._0_4_ =
             auVar346._0_4_ *
             (fVar70 * fVar70 *
              (((((fVar70 * 0.00019875691 + 0.0013981999) * fVar70 + 0.008333452) * fVar70 +
                0.041665796) * fVar70 + 0.16666666) * fVar70 + 0.5) + fVar70 + 1.0) + 1.0;
        auVar149._4_4_ =
             auVar346._4_4_ *
             (fVar152 * fVar152 *
              (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
                0.041665796) * fVar152 + 0.16666666) * fVar152 + 0.5) + fVar152 + 1.0) + 1.0;
        auVar149._8_4_ =
             auVar346._8_4_ *
             (fVar169 * fVar169 *
              (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) * fVar169 +
                0.041665796) * fVar169 + 0.16666666) * fVar169 + 0.5) + fVar169 + 1.0) + 1.0;
        auVar149._12_4_ =
             auVar346._12_4_ *
             (fVar170 * fVar170 *
              (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170 +
                0.041665796) * fVar170 + 0.16666666) * fVar170 + 0.5) + fVar170 + 1.0) + 1.0;
        auVar346 = vdivps_avx(auVar88,auVar149);
        break;
      case 4:
        auVar179._8_4_ = 0x42b0c0a5;
        auVar179._0_8_ = 0x42b0c0a542b0c0a5;
        auVar179._12_4_ = 0x42b0c0a5;
        auVar346 = vminps_avx(auVar238,auVar179);
        auVar197._8_4_ = 0xc2b0c0a5;
        auVar197._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar197._12_4_ = 0xc2b0c0a5;
        auVar89 = vmaxps_avx(auVar346,auVar197);
        auVar309._0_4_ = auVar89._0_4_ * 1.442695 + 0.5;
        auVar309._4_4_ = auVar89._4_4_ * 1.442695 + 0.5;
        auVar309._8_4_ = auVar89._8_4_ * 1.442695 + 0.5;
        auVar309._12_4_ = auVar89._12_4_ * 1.442695 + 0.5;
        auVar332._0_4_ = (int)auVar309._0_4_;
        auVar332._4_4_ = (int)auVar309._4_4_;
        auVar332._8_4_ = (int)auVar309._8_4_;
        auVar332._12_4_ = (int)auVar309._12_4_;
        auVar329 = vcvtdq2ps_avx(auVar332);
        auVar346 = vcmpps_avx(auVar309,auVar329,1);
        auVar157._8_4_ = 0x3f800000;
        auVar157._0_8_ = 0x3f8000003f800000;
        auVar157._12_4_ = 0x3f800000;
        auVar346 = vandps_avx(auVar346,auVar157);
        auVar346 = vsubps_avx(auVar329,auVar346);
        auVar333._0_4_ = auVar346._0_4_ * 0.6931472;
        auVar333._4_4_ = auVar346._4_4_ * 0.6931472;
        auVar333._8_4_ = auVar346._8_4_ * 0.6931472;
        auVar333._12_4_ = auVar346._12_4_ * 0.6931472;
        auVar329 = vsubps_avx(auVar89,auVar333);
        fVar70 = auVar329._0_4_;
        fVar152 = auVar329._4_4_;
        fVar169 = auVar329._8_4_;
        fVar170 = auVar329._12_4_;
        auVar143._0_4_ = (int)auVar346._0_4_;
        auVar143._4_4_ = (int)auVar346._4_4_;
        auVar143._8_4_ = (int)auVar346._8_4_;
        auVar143._12_4_ = (int)auVar346._12_4_;
        auVar346 = vpslld_avx(auVar143,0x17);
        auVar346 = vpaddd_avx(auVar346,auVar157);
        auVar144._0_4_ =
             (fVar70 + 1.0 +
             fVar70 * fVar70 *
             (((((fVar70 * 0.00019875691 + 0.0013981999) * fVar70 + 0.008333452) * fVar70 +
               0.041665796) * fVar70 + 0.16666666) * fVar70 + 0.5)) * auVar346._0_4_ + 1.0;
        auVar144._4_4_ =
             (fVar152 + 1.0 +
             fVar152 * fVar152 *
             (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
               0.041665796) * fVar152 + 0.16666666) * fVar152 + 0.5)) * auVar346._4_4_ + 1.0;
        auVar144._8_4_ =
             (fVar169 + 1.0 +
             fVar169 * fVar169 *
             (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) * fVar169 +
               0.041665796) * fVar169 + 0.16666666) * fVar169 + 0.5)) * auVar346._8_4_ + 1.0;
        auVar144._12_4_ =
             (fVar170 + 1.0 +
             fVar170 * fVar170 *
             (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170 +
               0.041665796) * fVar170 + 0.16666666) * fVar170 + 0.5)) * auVar346._12_4_ + 1.0;
        auVar83._8_4_ = 0x800000;
        auVar83._0_8_ = 0x80000000800000;
        auVar83._12_4_ = 0x800000;
        auVar346 = vmaxps_avx(auVar144,auVar83);
        auVar329 = vpsrld_avx(auVar346,0x17);
        auVar116._8_4_ = 0xffffff82;
        auVar116._0_8_ = 0xffffff82ffffff82;
        auVar116._12_4_ = 0xffffff82;
        auVar329 = vpaddd_avx(auVar329,auVar116);
        auVar117._8_4_ = 0x807fffff;
        auVar117._0_8_ = 0x807fffff807fffff;
        auVar117._12_4_ = 0x807fffff;
        auVar346 = vandps_avx(auVar346,auVar117);
        auVar125 = vorps_avx(auVar346,auVar328);
        auVar89 = vcvtdq2ps_avx(auVar329);
        auVar118._8_4_ = 0x3f3504f3;
        auVar118._0_8_ = 0x3f3504f33f3504f3;
        auVar118._12_4_ = 0x3f3504f3;
        auVar329 = vcmpps_avx(auVar125,auVar118,1);
        auVar346 = vandps_avx(auVar329,auVar125);
        fVar70 = auVar125._0_4_ + -1.0 + auVar346._0_4_;
        fVar152 = auVar125._4_4_ + -1.0 + auVar346._4_4_;
        fVar169 = auVar125._8_4_ + -1.0 + auVar346._8_4_;
        fVar170 = auVar125._12_4_ + -1.0 + auVar346._12_4_;
        auVar346 = vandps_avx(auVar329,auVar157);
        auVar329 = vsubps_avx(auVar89,auVar346);
        auVar346 = vcmpps_avx(auVar144,_DAT_005370d0,2);
        auVar84._0_4_ =
             (fVar70 * fVar70 *
              (((((((((fVar70 * 0.070376836 + -0.1151461) * fVar70 + 0.116769984) * fVar70 +
                    -0.12420141) * fVar70 + 0.14249323) * fVar70 + -0.16668057) * fVar70 +
                 0.20000714) * fVar70 + -0.24999994) * fVar70 + 0.3333333) * fVar70 + -0.5) +
             auVar329._0_4_ * 0.6931472 + fVar70) * -2.0;
        auVar84._4_4_ =
             (fVar152 * fVar152 *
              (((((((((fVar152 * 0.070376836 + -0.1151461) * fVar152 + 0.116769984) * fVar152 +
                    -0.12420141) * fVar152 + 0.14249323) * fVar152 + -0.16668057) * fVar152 +
                 0.20000714) * fVar152 + -0.24999994) * fVar152 + 0.3333333) * fVar152 + -0.5) +
             auVar329._4_4_ * 0.6931472 + fVar152) * -2.0;
        auVar84._8_4_ =
             (fVar169 * fVar169 *
              (((((((((fVar169 * 0.070376836 + -0.1151461) * fVar169 + 0.116769984) * fVar169 +
                    -0.12420141) * fVar169 + 0.14249323) * fVar169 + -0.16668057) * fVar169 +
                 0.20000714) * fVar169 + -0.24999994) * fVar169 + 0.3333333) * fVar169 + -0.5) +
             auVar329._8_4_ * 0.6931472 + fVar169) * -2.0;
        auVar84._12_4_ =
             (fVar170 * fVar170 *
              (((((((((fVar170 * 0.070376836 + -0.1151461) * fVar170 + 0.116769984) * fVar170 +
                    -0.12420141) * fVar170 + 0.14249323) * fVar170 + -0.16668057) * fVar170 +
                 0.20000714) * fVar170 + -0.24999994) * fVar170 + 0.3333333) * fVar170 + -0.5) +
             auVar329._12_4_ * 0.6931472 + fVar170) * -2.0;
        auVar119._8_4_ = 0x7fffffff;
        auVar119._0_8_ = 0x7fffffff7fffffff;
        auVar119._12_4_ = 0x7fffffff;
        auVar346 = vblendvps_avx(auVar84,auVar119,auVar346);
        auVar120._8_4_ = 0x42b0c0a5;
        auVar120._0_8_ = 0x42b0c0a542b0c0a5;
        auVar120._12_4_ = 0x42b0c0a5;
        auVar346 = vminps_avx(auVar346,auVar120);
        auVar121._8_4_ = 0xc2b0c0a5;
        auVar121._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar121._12_4_ = 0xc2b0c0a5;
        auVar89 = vmaxps_avx(auVar346,auVar121);
        auVar122._0_4_ = auVar89._0_4_ * 1.442695 + 0.5;
        auVar122._4_4_ = auVar89._4_4_ * 1.442695 + 0.5;
        auVar122._8_4_ = auVar89._8_4_ * 1.442695 + 0.5;
        auVar122._12_4_ = auVar89._12_4_ * 1.442695 + 0.5;
        auVar145._0_4_ = (int)auVar122._0_4_;
        auVar145._4_4_ = (int)auVar122._4_4_;
        auVar145._8_4_ = (int)auVar122._8_4_;
        auVar145._12_4_ = (int)auVar122._12_4_;
        auVar329 = vcvtdq2ps_avx(auVar145);
        auVar346 = vcmpps_avx(auVar122,auVar329,1);
        auVar346 = vandps_avx(auVar346,auVar157);
        auVar346 = vsubps_avx(auVar329,auVar346);
        auVar146._0_4_ = auVar346._0_4_ * 0.6931472;
        auVar146._4_4_ = auVar346._4_4_ * 0.6931472;
        auVar146._8_4_ = auVar346._8_4_ * 0.6931472;
        auVar146._12_4_ = auVar346._12_4_ * 0.6931472;
        auVar131 = ZEXT864(0);
        auVar329 = vsubps_avx(auVar89,auVar146);
        fVar70 = auVar329._0_4_;
        fVar152 = auVar329._4_4_;
        fVar169 = auVar329._8_4_;
        fVar170 = auVar329._12_4_;
        auVar123._0_4_ = (int)auVar346._0_4_;
        auVar123._4_4_ = (int)auVar346._4_4_;
        auVar123._8_4_ = (int)auVar346._8_4_;
        auVar123._12_4_ = (int)auVar346._12_4_;
        auVar346 = vpslld_avx(auVar123,0x17);
        auVar346 = vpaddd_avx(auVar346,auVar157);
        auVar85._0_4_ =
             (fVar70 + 1.0 +
             (((((fVar70 * 0.00019875691 + 0.0013981999) * fVar70 + 0.008333452) * fVar70 +
               0.041665796) * fVar70 + 0.16666666) * fVar70 + 0.5) * fVar70 * fVar70) *
             auVar346._0_4_ + 1.0;
        auVar85._4_4_ =
             (fVar152 + 1.0 +
             (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
               0.041665796) * fVar152 + 0.16666666) * fVar152 + 0.5) * fVar152 * fVar152) *
             auVar346._4_4_ + 1.0;
        auVar85._8_4_ =
             (fVar169 + 1.0 +
             (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) * fVar169 +
               0.041665796) * fVar169 + 0.16666666) * fVar169 + 0.5) * fVar169 * fVar169) *
             auVar346._8_4_ + 1.0;
        auVar85._12_4_ =
             (fVar170 + 1.0 +
             (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170 +
               0.041665796) * fVar170 + 0.16666666) * fVar170 + 0.5) * fVar170 * fVar170) *
             auVar346._12_4_ + 1.0;
        auVar364 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
        auVar124._8_4_ = 0x40000000;
        auVar124._0_8_ = 0x4000000040000000;
        auVar124._12_4_ = 0x40000000;
        auVar346 = vdivps_avx(auVar124,auVar85);
        auVar329._0_4_ = auVar346._0_4_ + -1.0;
        auVar329._4_4_ = auVar346._4_4_ + -1.0;
        auVar329._8_4_ = auVar346._8_4_ + -1.0;
        auVar329._12_4_ = auVar346._12_4_ + -1.0;
        goto LAB_004204a4;
      case 5:
        fVar70 = *activation_params->data;
        fVar152 = *(float *)((long)activation_params->data + 4);
        auVar89._0_4_ = auVar238._0_4_ * fVar70 + fVar152;
        auVar89._4_4_ = auVar238._4_4_ * fVar70 + fVar152;
        auVar89._8_4_ = auVar238._8_4_ * fVar70 + fVar152;
        auVar89._12_4_ = auVar238._12_4_ * fVar70 + fVar152;
        auVar346 = vmaxps_avx(auVar89,auVar329);
        auVar125._8_4_ = 0x3f800000;
        auVar125._0_8_ = 0x3f8000003f800000;
        auVar125._12_4_ = 0x3f800000;
        auVar329 = vminps_avx(auVar346,auVar125);
LAB_004204a4:
        auVar346._0_4_ = auVar238._0_4_ * auVar329._0_4_;
        auVar346._4_4_ = auVar238._4_4_ * auVar329._4_4_;
        auVar346._8_4_ = auVar238._8_4_ * auVar329._8_4_;
        auVar346._12_4_ = auVar238._12_4_ * auVar329._12_4_;
      }
switchD_0042009b_caseD_0:
      auVar90._0_4_ = auVar346._0_4_ * fVar2;
      auVar90._4_4_ = auVar346._4_4_ * fVar2;
      auVar90._8_4_ = auVar346._8_4_ * fVar2;
      auVar90._12_4_ = auVar346._12_4_ * fVar2;
      auVar346 = vandps_avx(auVar90,auVar364._0_16_);
      auVar346 = vorps_avx(auVar346,auVar328);
      auVar91._0_4_ = (int)(auVar90._0_4_ + auVar346._0_4_);
      auVar91._4_4_ = (int)(auVar90._4_4_ + auVar346._4_4_);
      auVar91._8_4_ = (int)(auVar90._8_4_ + auVar346._8_4_);
      auVar91._12_4_ = (int)(auVar90._12_4_ + auVar346._12_4_);
      auVar346 = vpackssdw_avx(auVar91,auVar91);
      auVar346 = vpminsw_avx(auVar191._0_16_,auVar346);
      auVar346 = vpmaxsw_avx(auVar229._0_16_,auVar346);
      auVar346 = vpacksswb_avx(auVar346,auVar346);
      *(int *)(ptr + uVar37) = auVar346._0_4_;
      intptr = (int *)(*(undefined1 (*) [32])intptr + 0x10);
    }
    lVar36 = 0;
    auVar131 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
    for (uVar34 = uVar37 & 0xffffffff; (int)uVar34 < iVar35; uVar34 = (ulong)((int)uVar34 + 1)) {
      fVar70 = (float)*(int *)(*(undefined1 (*) [32])intptr + lVar36 * 4) * fVar1;
      auVar328 = ZEXT416((uint)fVar70);
      fVar152 = fVar70;
      switch(uVar33) {
      case 0:
        auVar328 = vmaxss_avx(auVar328,ZEXT416(0));
        fVar152 = auVar328._0_4_;
        break;
      case 1:
        auVar328 = vcmpss_avx(ZEXT816(0),auVar328,1);
        auVar93._8_4_ = 0x3f800000;
        auVar93._0_8_ = 0x3f8000003f800000;
        auVar93._12_4_ = 0x3f800000;
        auVar328 = vblendvps_avx(ZEXT416(*activation_params->data),auVar93,auVar328);
        fVar170 = auVar328._0_4_;
LAB_0042064b:
        fVar152 = fVar170 * fVar70;
        break;
      case 2:
        fVar70 = *(float *)((long)activation_params->data + 4);
        auVar328 = vmaxss_avx(auVar328,ZEXT416(*activation_params->data));
        fVar152 = auVar328._0_4_;
        if (fVar70 < auVar328._0_4_) {
          fVar152 = fVar70;
        }
        break;
      case 3:
        auVar328 = vminss_avx(auVar328,ZEXT416(0x42b0c0a5));
        auVar65._0_4_ = auVar328._0_4_ ^ auVar364._0_4_;
        auVar65._4_4_ = auVar328._4_4_ ^ auVar364._4_4_;
        auVar65._8_4_ = auVar328._8_4_ ^ auVar364._8_4_;
        auVar65._12_4_ = auVar328._12_4_ ^ auVar364._12_4_;
        auVar328 = vcmpss_avx(auVar328,ZEXT416(0xc2b0c0a5),1);
        auVar92._8_4_ = 0x42b0c0a5;
        auVar92._0_8_ = 0x42b0c0a542b0c0a5;
        auVar92._12_4_ = 0x42b0c0a5;
        auVar328 = vblendvps_avx(auVar65,auVar92,auVar328);
        fVar70 = expf(auVar328._0_4_);
        auVar131 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
        auVar364 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
        fVar152 = 1.0 / (fVar70 + 1.0);
        break;
      case 4:
        fVar152 = expf(fVar70);
        fVar152 = logf(fVar152 + 1.0);
        fVar152 = tanhf(fVar152);
        auVar131 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
        auVar364 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
        fVar152 = fVar152 * fVar70;
        break;
      case 5:
        fVar169 = *activation_params->data;
        fVar170 = *(float *)((long)activation_params->data + 4);
        fVar171 = (float)((uint)fVar170 ^ auVar364._0_4_) / fVar169;
        fVar152 = 0.0;
        if ((fVar171 <= fVar70) && (fVar152 = fVar70, fVar70 <= fVar171 + 1.0 / fVar169)) {
          fVar170 = fVar169 * fVar70 + fVar170;
          goto LAB_0042064b;
        }
      }
      auVar328 = vandps_avx(ZEXT416((uint)(fVar152 * fVar2)),auVar364._0_16_);
      auVar328 = vorps_avx(auVar328,auVar131._0_16_);
      auVar328 = ZEXT416((uint)(fVar152 * fVar2 + auVar328._0_4_));
      auVar328 = vroundss_avx(auVar328,auVar328,0xb);
      iVar32 = (int)auVar328._0_4_;
      if (iVar32 < -0x7e) {
        iVar32 = -0x7f;
      }
      cVar31 = (char)iVar32;
      if (0x7e < iVar32) {
        cVar31 = '\x7f';
      }
      ptr[uVar37 + lVar36] = cVar31;
      lVar36 = lVar36 + 1;
    }
  }
  else {
    fVar70 = *(float *)*(undefined1 (*) [32])bias_data->data;
    auVar94._4_4_ = fVar70;
    auVar94._0_4_ = fVar70;
    auVar94._8_4_ = fVar70;
    auVar94._12_4_ = fVar70;
    auVar94._16_4_ = fVar70;
    auVar94._20_4_ = fVar70;
    auVar94._24_4_ = fVar70;
    auVar94._28_4_ = fVar70;
    if (1 < bias_data->w && elempack == 8) {
      auVar94 = *(undefined1 (*) [32])bias_data->data;
    }
    uVar37 = 0;
    uVar33 = activation_type - 1;
    auVar364 = ZEXT3264(CONCAT428(0x80000000,
                                  CONCAT424(0x80000000,
                                            CONCAT420(0x80000000,
                                                      CONCAT416(0x80000000,
                                                                CONCAT412(0x80000000,
                                                                          CONCAT48(0x80000000,
                                                                                                                                                                      
                                                  0x8000000080000000)))))));
    auVar150._8_4_ = 0x3f000000;
    auVar150._0_8_ = 0x3f0000003f000000;
    auVar150._12_4_ = 0x3f000000;
    auVar150._16_4_ = 0x3f000000;
    auVar150._20_4_ = 0x3f000000;
    auVar150._24_4_ = 0x3f000000;
    auVar150._28_4_ = 0x3f000000;
    auVar131 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
    auVar191 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
    auVar369 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar229 = ZEXT3264(CONCAT428(0x3f800000,
                                  CONCAT424(0x3f800000,
                                            CONCAT420(0x3f800000,
                                                      CONCAT416(0x3f800000,
                                                                CONCAT412(0x3f800000,
                                                                          CONCAT48(0x3f800000,
                                                                                                                                                                      
                                                  0x3f8000003f800000)))))));
    while( true ) {
      auVar175 = in_ZMM5._28_36_;
      auVar183 = auVar229._0_32_;
      fVar212 = auVar229._0_4_;
      fVar230 = auVar229._4_4_;
      fVar231 = auVar229._8_4_;
      fVar232 = auVar229._12_4_;
      fVar233 = auVar229._16_4_;
      fVar234 = auVar229._20_4_;
      fVar235 = auVar229._24_4_;
      fVar213 = auVar229._28_4_;
      fVar169 = auVar94._4_4_;
      fVar170 = auVar94._8_4_;
      fVar171 = auVar94._12_4_;
      fVar172 = auVar94._16_4_;
      fVar173 = auVar94._20_4_;
      fVar174 = auVar94._24_4_;
      fVar355 = auVar94._28_4_;
      fVar152 = auVar94._0_4_;
      if (iVar35 <= (int)uVar37 + 0xf) break;
      auVar208 = vcvtdq2ps_avx(*(undefined1 (*) [32])intptr);
      auVar69 = vcvtdq2ps_avx(*(undefined1 (*) [32])((long)intptr + 0x20));
      auVar285._0_4_ = (float)local_f8._0_4_ * auVar208._0_4_ + fVar152;
      auVar285._4_4_ = (float)local_f8._4_4_ * auVar208._4_4_ + fVar169;
      auVar285._8_4_ = fStack_f0 * auVar208._8_4_ + fVar170;
      auVar285._12_4_ = fStack_ec * auVar208._12_4_ + fVar171;
      auVar285._16_4_ = fStack_e8 * auVar208._16_4_ + fVar172;
      auVar285._20_4_ = fStack_e4 * auVar208._20_4_ + fVar173;
      auVar285._24_4_ = fStack_e0 * auVar208._24_4_ + fVar174;
      auVar288._28_4_ = auVar208._28_4_ + fVar355;
      auVar288._0_28_ = auVar285;
      auVar198._0_4_ = auVar69._0_4_ * (float)local_f8._0_4_ + fVar152;
      auVar198._4_4_ = auVar69._4_4_ * (float)local_f8._4_4_ + fVar169;
      auVar198._8_4_ = auVar69._8_4_ * fStack_f0 + fVar170;
      auVar198._12_4_ = auVar69._12_4_ * fStack_ec + fVar171;
      auVar198._16_4_ = auVar69._16_4_ * fStack_e8 + fVar172;
      auVar198._20_4_ = auVar69._20_4_ * fStack_e4 + fVar173;
      auVar198._24_4_ = auVar69._24_4_ * fStack_e0 + fVar174;
      auVar199._28_4_ = auVar208._28_4_ + fVar355;
      auVar199._0_28_ = auVar198;
      auVar211 = ZEXT436((uint)auVar199._28_4_);
      auVar311 = auVar285;
      auVar336 = auVar198;
      if (5 < uVar33) goto switchD_0041db63_caseD_0;
      auVar367 = auVar369._0_32_;
      auVar208 = vmaxps_avx(auVar288,auVar367);
      auVar69 = vmaxps_avx(auVar367,auVar199);
      auVar311 = auVar208._0_28_;
      auVar336 = auVar69._0_28_;
      switch(uVar33) {
      case 1:
        auVar183 = vminps_avx(auVar288,auVar367);
        fVar152 = *activation_params->data;
        auVar311._0_4_ = fVar152 * auVar183._0_4_ + auVar208._0_4_;
        auVar311._4_4_ = fVar152 * auVar183._4_4_ + auVar208._4_4_;
        auVar311._8_4_ = fVar152 * auVar183._8_4_ + auVar208._8_4_;
        auVar311._12_4_ = fVar152 * auVar183._12_4_ + auVar208._12_4_;
        auVar311._16_4_ = fVar152 * auVar183._16_4_ + auVar208._16_4_;
        auVar311._20_4_ = fVar152 * auVar183._20_4_ + auVar208._20_4_;
        auVar311._24_4_ = fVar152 * auVar183._24_4_ + auVar208._24_4_;
        auVar183 = vminps_avx(auVar367,auVar199);
        auVar211 = ZEXT436(auVar183._28_4_);
        auVar336._0_4_ = auVar69._0_4_ + fVar152 * auVar183._0_4_;
        auVar336._4_4_ = auVar69._4_4_ + fVar152 * auVar183._4_4_;
        auVar336._8_4_ = auVar69._8_4_ + fVar152 * auVar183._8_4_;
        auVar336._12_4_ = auVar69._12_4_ + fVar152 * auVar183._12_4_;
        auVar336._16_4_ = auVar69._16_4_ + fVar152 * auVar183._16_4_;
        auVar336._20_4_ = auVar69._20_4_ + fVar152 * auVar183._20_4_;
        auVar336._24_4_ = auVar69._24_4_ + fVar152 * auVar183._24_4_;
        break;
      case 2:
        uVar3 = *activation_params->data;
        auVar341._4_4_ = uVar3;
        auVar341._0_4_ = uVar3;
        auVar341._8_4_ = uVar3;
        auVar341._12_4_ = uVar3;
        auVar341._16_4_ = uVar3;
        auVar341._20_4_ = uVar3;
        auVar341._24_4_ = uVar3;
        auVar341._28_4_ = uVar3;
        uVar3 = *(undefined4 *)((long)activation_params->data + 4);
        auVar352._4_4_ = uVar3;
        auVar352._0_4_ = uVar3;
        auVar352._8_4_ = uVar3;
        auVar352._12_4_ = uVar3;
        auVar352._16_4_ = uVar3;
        auVar352._20_4_ = uVar3;
        auVar352._24_4_ = uVar3;
        auVar352._28_4_ = uVar3;
        auVar183 = vmaxps_avx(auVar288,auVar341);
        auVar208 = vminps_avx(auVar183,auVar352);
        auVar183 = vmaxps_avx(auVar341,auVar199);
        auVar211 = ZEXT436(auVar183._28_4_);
        auVar183 = vminps_avx(auVar352,auVar183);
        auVar311 = auVar208._0_28_;
        auVar336 = auVar183._0_28_;
        break;
      case 3:
        auVar289._0_4_ = (uint)auVar285._0_4_ ^ auVar364._0_4_;
        auVar289._4_4_ = (uint)auVar285._4_4_ ^ auVar364._4_4_;
        auVar289._8_4_ = (uint)auVar285._8_4_ ^ auVar364._8_4_;
        auVar289._12_4_ = (uint)auVar285._12_4_ ^ auVar364._12_4_;
        auVar289._16_4_ = (uint)auVar285._16_4_ ^ auVar364._16_4_;
        auVar289._20_4_ = (uint)auVar285._20_4_ ^ auVar364._20_4_;
        auVar289._24_4_ = (uint)auVar285._24_4_ ^ auVar364._24_4_;
        auVar289._28_4_ = (uint)auVar288._28_4_ ^ auVar364._28_4_;
        auVar66._8_4_ = 0x42b0c0a5;
        auVar66._0_8_ = 0x42b0c0a542b0c0a5;
        auVar66._12_4_ = 0x42b0c0a5;
        auVar66._16_4_ = 0x42b0c0a5;
        auVar66._20_4_ = 0x42b0c0a5;
        auVar66._24_4_ = 0x42b0c0a5;
        auVar66._28_4_ = 0x42b0c0a5;
        auVar69 = vminps_avx(auVar289,auVar66);
        auVar260._8_4_ = 0xc2b0c0a5;
        auVar260._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar260._12_4_ = 0xc2b0c0a5;
        auVar260._16_4_ = 0xc2b0c0a5;
        auVar260._20_4_ = 0xc2b0c0a5;
        auVar260._24_4_ = 0xc2b0c0a5;
        auVar260._28_4_ = 0xc2b0c0a5;
        auVar69 = vmaxps_avx(auVar69,auVar260);
        auVar313._0_4_ = auVar69._0_4_ * 1.442695 + 0.5;
        auVar313._4_4_ = auVar69._4_4_ * 1.442695 + 0.5;
        auVar313._8_4_ = auVar69._8_4_ * 1.442695 + 0.5;
        auVar313._12_4_ = auVar69._12_4_ * 1.442695 + 0.5;
        auVar313._16_4_ = auVar69._16_4_ * 1.442695 + 0.5;
        auVar313._20_4_ = auVar69._20_4_ * 1.442695 + 0.5;
        auVar313._24_4_ = auVar69._24_4_ * 1.442695 + 0.5;
        auVar313._28_4_ = auVar208._28_4_ + 0.5;
        auVar367 = vroundps_avx(auVar313,1);
        auVar208 = vcmpps_avx(auVar313,auVar367,1);
        auVar208 = vandps_avx(auVar208,auVar183);
        auVar208 = vsubps_avx(auVar367,auVar208);
        auVar15._4_4_ = auVar208._4_4_ * 0.6931472;
        auVar15._0_4_ = auVar208._0_4_ * 0.6931472;
        auVar15._8_4_ = auVar208._8_4_ * 0.6931472;
        auVar15._12_4_ = auVar208._12_4_ * 0.6931472;
        auVar15._16_4_ = auVar208._16_4_ * 0.6931472;
        auVar15._20_4_ = auVar208._20_4_ * 0.6931472;
        auVar15._24_4_ = auVar208._24_4_ * 0.6931472;
        auVar15._28_4_ = auVar367._28_4_;
        auVar61 = vsubps_avx(auVar69,auVar15);
        fVar152 = auVar61._0_4_;
        fVar170 = auVar61._4_4_;
        fVar172 = auVar61._8_4_;
        fVar174 = auVar61._12_4_;
        fVar326 = auVar61._16_4_;
        fVar343 = auVar61._20_4_;
        fVar344 = auVar61._24_4_;
        auVar306._0_4_ = (int)auVar208._0_4_;
        auVar306._4_4_ = (int)auVar208._4_4_;
        auVar306._8_4_ = (int)auVar208._8_4_;
        auVar306._12_4_ = (int)auVar208._12_4_;
        auVar314._16_4_ = (int)auVar208._16_4_;
        auVar314._0_16_ = auVar306;
        auVar314._20_4_ = (int)auVar208._20_4_;
        auVar314._24_4_ = (int)auVar208._24_4_;
        auVar314._28_4_ = (int)auVar208._28_4_;
        auVar346 = vpslld_avx(auVar306,0x17);
        auVar328 = vpslld_avx(auVar314._16_16_,0x17);
        auVar103._8_4_ = 0x3f800000;
        auVar103._0_8_ = 0x3f8000003f800000;
        auVar103._12_4_ = 0x3f800000;
        auVar328 = vpaddd_avx(auVar328,auVar103);
        auVar346 = vpaddd_avx(auVar346,auVar103);
        auVar200._0_4_ = auVar364._0_4_ ^ (uint)auVar198._0_4_;
        auVar200._4_4_ = auVar364._4_4_ ^ (uint)auVar198._4_4_;
        auVar200._8_4_ = auVar364._8_4_ ^ (uint)auVar198._8_4_;
        auVar200._12_4_ = auVar364._12_4_ ^ (uint)auVar198._12_4_;
        auVar200._16_4_ = auVar364._16_4_ ^ (uint)auVar198._16_4_;
        auVar200._20_4_ = auVar364._20_4_ ^ (uint)auVar198._20_4_;
        auVar200._24_4_ = auVar364._24_4_ ^ (uint)auVar198._24_4_;
        auVar200._28_4_ = auVar364._28_4_ ^ (uint)auVar199._28_4_;
        auVar208 = vminps_avx(auVar200,auVar66);
        auVar67._8_4_ = 0xc2b0c0a5;
        auVar67._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar67._12_4_ = 0xc2b0c0a5;
        auVar67._16_4_ = 0xc2b0c0a5;
        auVar67._20_4_ = 0xc2b0c0a5;
        auVar67._24_4_ = 0xc2b0c0a5;
        auVar67._28_4_ = 0xc2b0c0a5;
        auVar69 = vmaxps_avx(auVar208,auVar67);
        auVar315._0_4_ = auVar69._0_4_ * 1.442695 + 0.5;
        auVar315._4_4_ = auVar69._4_4_ * 1.442695 + 0.5;
        auVar315._8_4_ = auVar69._8_4_ * 1.442695 + 0.5;
        auVar315._12_4_ = auVar69._12_4_ * 1.442695 + 0.5;
        auVar315._16_4_ = auVar69._16_4_ * 1.442695 + 0.5;
        auVar315._20_4_ = auVar69._20_4_ * 1.442695 + 0.5;
        auVar315._24_4_ = auVar69._24_4_ * 1.442695 + 0.5;
        auVar315._28_4_ = auVar328._12_4_ + 0.5;
        auVar182 = vroundps_avx(auVar315,1);
        auVar208 = vcmpps_avx(auVar315,auVar182,1);
        auVar208 = vandps_avx(auVar208,auVar183);
        auVar208 = vsubps_avx(auVar182,auVar208);
        auVar16._4_4_ = auVar208._4_4_ * 0.6931472;
        auVar16._0_4_ = auVar208._0_4_ * 0.6931472;
        auVar16._8_4_ = auVar208._8_4_ * 0.6931472;
        auVar16._12_4_ = auVar208._12_4_ * 0.6931472;
        auVar16._16_4_ = auVar208._16_4_ * 0.6931472;
        auVar16._20_4_ = auVar208._20_4_ * 0.6931472;
        auVar16._24_4_ = auVar208._24_4_ * 0.6931472;
        auVar16._28_4_ = auVar182._28_4_;
        auVar69 = vsubps_avx(auVar69,auVar16);
        fVar169 = auVar69._0_4_;
        fVar171 = auVar69._4_4_;
        fVar173 = auVar69._8_4_;
        fVar355 = auVar69._12_4_;
        fVar356 = auVar69._16_4_;
        fVar357 = auVar69._20_4_;
        fVar358 = auVar69._24_4_;
        auVar229 = ZEXT3264(auVar183);
        auVar369 = ZEXT864(0) << 0x20;
        auVar191 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
        auVar307._0_4_ = (int)auVar208._0_4_;
        auVar307._4_4_ = (int)auVar208._4_4_;
        auVar307._8_4_ = (int)auVar208._8_4_;
        auVar307._12_4_ = (int)auVar208._12_4_;
        auVar316._16_4_ = (int)auVar208._16_4_;
        auVar316._0_16_ = auVar307;
        auVar316._20_4_ = (int)auVar208._20_4_;
        auVar316._24_4_ = (int)auVar208._24_4_;
        auVar316._28_4_ = (int)auVar208._28_4_;
        auVar329 = vpslld_avx(auVar307,0x17);
        auVar238 = vpslld_avx(auVar316._16_16_,0x17);
        auVar238 = vpaddd_avx(auVar238,auVar103);
        auVar329 = vpaddd_avx(auVar329,auVar103);
        auVar131 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
        auVar290._0_4_ =
             (fVar152 + fVar212 +
             fVar152 * fVar152 *
             (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
               0.041665796) * fVar152 + 0.16666666) * fVar152 + 0.5)) * auVar346._0_4_ + fVar212;
        auVar290._4_4_ =
             (fVar170 + fVar230 +
             fVar170 * fVar170 *
             (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170 +
               0.041665796) * fVar170 + 0.16666666) * fVar170 + 0.5)) * auVar346._4_4_ + fVar230;
        auVar290._8_4_ =
             (fVar172 + fVar231 +
             fVar172 * fVar172 *
             (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
               0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5)) * auVar346._8_4_ + fVar231;
        auVar290._12_4_ =
             (fVar174 + fVar232 +
             fVar174 * fVar174 *
             (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) * fVar174 +
               0.041665796) * fVar174 + 0.16666666) * fVar174 + 0.5)) * auVar346._12_4_ + fVar232;
        auVar290._16_4_ =
             (fVar326 + fVar233 +
             fVar326 * fVar326 *
             (((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) * fVar326 +
               0.041665796) * fVar326 + 0.16666666) * fVar326 + 0.5)) * auVar328._0_4_ + fVar233;
        auVar290._20_4_ =
             (fVar343 + fVar234 +
             fVar343 * fVar343 *
             (((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 + 0.008333452) * fVar343 +
               0.041665796) * fVar343 + 0.16666666) * fVar343 + 0.5)) * auVar328._4_4_ + fVar234;
        auVar290._24_4_ =
             (fVar344 + fVar235 +
             fVar344 * fVar344 *
             (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344 +
               0.041665796) * fVar344 + 0.16666666) * fVar344 + 0.5)) * auVar328._8_4_ + fVar235;
        auVar290._28_4_ = auVar61._28_4_ + fVar213 + auVar367._28_4_ + fVar213;
        auVar208 = vdivps_avx(auVar183,auVar290);
        auVar201._0_4_ =
             fVar212 + auVar329._0_4_ *
                       (fVar169 * fVar169 *
                        (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) *
                           fVar169 + 0.041665796) * fVar169 + 0.16666666) * fVar169 + 0.5) +
                       fVar212 + fVar169);
        auVar201._4_4_ =
             fVar230 + auVar329._4_4_ *
                       (fVar171 * fVar171 *
                        (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) *
                           fVar171 + 0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5) +
                       fVar230 + fVar171);
        auVar201._8_4_ =
             fVar231 + auVar329._8_4_ *
                       (fVar173 * fVar173 *
                        (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) *
                           fVar173 + 0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5) +
                       fVar231 + fVar173);
        auVar201._12_4_ =
             fVar232 + auVar329._12_4_ *
                       (fVar355 * fVar355 *
                        (((((fVar355 * 0.00019875691 + 0.0013981999) * fVar355 + 0.008333452) *
                           fVar355 + 0.041665796) * fVar355 + 0.16666666) * fVar355 + 0.5) +
                       fVar232 + fVar355);
        auVar201._16_4_ =
             fVar233 + auVar238._0_4_ *
                       (fVar356 * fVar356 *
                        (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) *
                           fVar356 + 0.041665796) * fVar356 + 0.16666666) * fVar356 + 0.5) +
                       fVar233 + fVar356);
        auVar201._20_4_ =
             fVar234 + auVar238._4_4_ *
                       (fVar357 * fVar357 *
                        (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) *
                           fVar357 + 0.041665796) * fVar357 + 0.16666666) * fVar357 + 0.5) +
                       fVar234 + fVar357);
        auVar201._24_4_ =
             fVar235 + auVar238._8_4_ *
                       (fVar358 * fVar358 *
                        (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) *
                           fVar358 + 0.041665796) * fVar358 + 0.16666666) * fVar358 + 0.5) +
                       fVar235 + fVar358);
        auVar201._28_4_ = fVar213 + auVar182._28_4_ + fVar213 + auVar69._28_4_;
        auVar211 = ZEXT436((uint)auVar201._28_4_);
        auVar183 = vdivps_avx(auVar183,auVar201);
        auVar311 = auVar208._0_28_;
        auVar336 = auVar183._0_28_;
        break;
      case 4:
        auVar126._8_4_ = 0x42b0c0a5;
        auVar126._0_8_ = 0x42b0c0a542b0c0a5;
        auVar126._12_4_ = 0x42b0c0a5;
        auVar126._16_4_ = 0x42b0c0a5;
        auVar126._20_4_ = 0x42b0c0a5;
        auVar126._24_4_ = 0x42b0c0a5;
        auVar126._28_4_ = 0x42b0c0a5;
        auVar208 = vminps_avx(auVar288,auVar126);
        auVar127._8_4_ = 0xc2b0c0a5;
        auVar127._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar127._12_4_ = 0xc2b0c0a5;
        auVar127._16_4_ = 0xc2b0c0a5;
        auVar127._20_4_ = 0xc2b0c0a5;
        auVar127._24_4_ = 0xc2b0c0a5;
        auVar127._28_4_ = 0xc2b0c0a5;
        auVar182 = vmaxps_avx(auVar208,auVar127);
        auVar337._0_4_ = auVar182._0_4_ * 1.442695 + 0.5;
        auVar337._4_4_ = auVar182._4_4_ * 1.442695 + 0.5;
        auVar337._8_4_ = auVar182._8_4_ * 1.442695 + 0.5;
        auVar337._12_4_ = auVar182._12_4_ * 1.442695 + 0.5;
        auVar337._16_4_ = auVar182._16_4_ * 1.442695 + 0.5;
        auVar337._20_4_ = auVar182._20_4_ * 1.442695 + 0.5;
        auVar337._24_4_ = auVar182._24_4_ * 1.442695 + 0.5;
        auVar337._28_4_ = auVar69._28_4_ + 0.5;
        auVar69 = vroundps_avx(auVar337,1);
        auVar208 = vcmpps_avx(auVar337,auVar69,1);
        auVar208 = vandps_avx(auVar208,auVar183);
        auVar208 = vsubps_avx(auVar69,auVar208);
        auVar9._4_4_ = auVar208._4_4_ * 0.6931472;
        auVar9._0_4_ = auVar208._0_4_ * 0.6931472;
        auVar9._8_4_ = auVar208._8_4_ * 0.6931472;
        auVar9._12_4_ = auVar208._12_4_ * 0.6931472;
        auVar9._16_4_ = auVar208._16_4_ * 0.6931472;
        auVar9._20_4_ = auVar208._20_4_ * 0.6931472;
        auVar9._24_4_ = auVar208._24_4_ * 0.6931472;
        auVar9._28_4_ = auVar69._28_4_;
        auVar182 = vsubps_avx(auVar182,auVar9);
        fVar152 = auVar182._0_4_;
        fVar169 = auVar182._4_4_;
        fVar170 = auVar182._8_4_;
        fVar171 = auVar182._12_4_;
        fVar172 = auVar182._16_4_;
        fVar173 = auVar182._20_4_;
        fVar174 = auVar182._24_4_;
        auVar327._0_4_ = (int)auVar208._0_4_;
        auVar327._4_4_ = (int)auVar208._4_4_;
        auVar327._8_4_ = (int)auVar208._8_4_;
        auVar327._12_4_ = (int)auVar208._12_4_;
        auVar338._16_4_ = (int)auVar208._16_4_;
        auVar338._0_16_ = auVar327;
        auVar338._20_4_ = (int)auVar208._20_4_;
        auVar338._24_4_ = (int)auVar208._24_4_;
        auVar338._28_4_ = (int)auVar208._28_4_;
        auVar346 = vpslld_avx(auVar327,0x17);
        auVar328 = vpslld_avx(auVar338._16_16_,0x17);
        auVar101._8_4_ = 0x3f800000;
        auVar101._0_8_ = 0x3f8000003f800000;
        auVar101._12_4_ = 0x3f800000;
        auVar328 = vpaddd_avx(auVar328,auVar101);
        auVar346 = vpaddd_avx(auVar346,auVar101);
        auVar339._0_4_ =
             (fVar152 + fVar212 +
             fVar152 * fVar152 *
             (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
               0.041665796) * fVar152 + 0.16666666) * fVar152 + 0.5)) * auVar346._0_4_ + fVar212;
        auVar339._4_4_ =
             (fVar169 + fVar230 +
             fVar169 * fVar169 *
             (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) * fVar169 +
               0.041665796) * fVar169 + 0.16666666) * fVar169 + 0.5)) * auVar346._4_4_ + fVar230;
        auVar339._8_4_ =
             (fVar170 + fVar231 +
             fVar170 * fVar170 *
             (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170 +
               0.041665796) * fVar170 + 0.16666666) * fVar170 + 0.5)) * auVar346._8_4_ + fVar231;
        auVar339._12_4_ =
             (fVar171 + fVar232 +
             fVar171 * fVar171 *
             (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171 +
               0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5)) * auVar346._12_4_ + fVar232;
        auVar339._16_4_ =
             (fVar172 + fVar233 +
             fVar172 * fVar172 *
             (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172 +
               0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5)) * auVar328._0_4_ + fVar233;
        auVar339._20_4_ =
             (fVar173 + fVar234 +
             fVar173 * fVar173 *
             (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) * fVar173 +
               0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5)) * auVar328._4_4_ + fVar234;
        auVar339._24_4_ =
             (fVar174 + fVar235 +
             fVar174 * fVar174 *
             (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) * fVar174 +
               0.041665796) * fVar174 + 0.16666666) * fVar174 + 0.5)) * auVar328._8_4_ + fVar235;
        auVar339._28_4_ = auVar182._28_4_ + fVar213 + auVar69._28_4_ + fVar213;
        auVar69 = vcmpps_avx(auVar339,auVar367,2);
        auVar46._8_4_ = 0x800000;
        auVar46._0_8_ = 0x80000000800000;
        auVar46._12_4_ = 0x800000;
        auVar46._16_4_ = 0x800000;
        auVar46._20_4_ = 0x800000;
        auVar46._24_4_ = 0x800000;
        auVar46._28_4_ = 0x800000;
        auVar208 = vmaxps_avx(auVar339,auVar46);
        auVar346 = vpsrld_avx(auVar208._0_16_,0x17);
        auVar328 = vpsrld_avx(auVar208._16_16_,0x17);
        auVar368._8_4_ = 0x807fffff;
        auVar368._0_8_ = 0x807fffff807fffff;
        auVar368._12_4_ = 0x807fffff;
        auVar368._16_4_ = 0x807fffff;
        auVar368._20_4_ = 0x807fffff;
        auVar368._24_4_ = 0x807fffff;
        auVar368._28_4_ = 0x807fffff;
        auVar208 = vandps_avx(auVar208,auVar368);
        auVar182 = vorps_avx(auVar208,auVar150);
        auVar47._8_4_ = 0x3f3504f3;
        auVar47._0_8_ = 0x3f3504f33f3504f3;
        auVar47._12_4_ = 0x3f3504f3;
        auVar47._16_4_ = 0x3f3504f3;
        auVar47._20_4_ = 0x3f3504f3;
        auVar47._24_4_ = 0x3f3504f3;
        auVar47._28_4_ = 0x3f3504f3;
        auVar367 = vcmpps_avx(auVar47,auVar182,2);
        auVar208 = vandnps_avx(auVar367,auVar182);
        fVar152 = auVar182._0_4_ + -1.0 + auVar208._0_4_;
        fVar169 = auVar182._4_4_ + -1.0 + auVar208._4_4_;
        fVar170 = auVar182._8_4_ + -1.0 + auVar208._8_4_;
        fVar171 = auVar182._12_4_ + -1.0 + auVar208._12_4_;
        fVar172 = auVar182._16_4_ + -1.0 + auVar208._16_4_;
        fVar173 = auVar182._20_4_ + -1.0 + auVar208._20_4_;
        fVar174 = auVar182._24_4_ + -1.0 + auVar208._24_4_;
        auVar328 = vpsubd_avx(auVar328,auVar367._16_16_);
        auVar38._8_4_ = 0xffffff81;
        auVar38._0_8_ = 0xffffff81ffffff81;
        auVar38._12_4_ = 0xffffff81;
        auVar328 = vpaddd_avx(auVar328,auVar38);
        auVar346 = vpsubd_avx(auVar346,auVar367._0_16_);
        auVar346 = vpaddd_avx(auVar346,auVar38);
        auVar248._16_16_ = auVar328;
        auVar248._0_16_ = auVar346;
        auVar367 = vcvtdq2ps_avx(auVar248);
        auVar10._4_4_ =
             (fVar169 * fVar169 *
              (((((((((fVar169 * 0.070376836 + -0.1151461) * fVar169 + 0.116769984) * fVar169 +
                    -0.12420141) * fVar169 + 0.14249323) * fVar169 + -0.16668057) * fVar169 +
                 0.20000714) * fVar169 + -0.24999994) * fVar169 + 0.3333333) * fVar169 + -0.5) +
             auVar367._4_4_ * 0.6931472 + fVar169) * -2.0;
        auVar10._0_4_ =
             (fVar152 * fVar152 *
              (((((((((fVar152 * 0.070376836 + -0.1151461) * fVar152 + 0.116769984) * fVar152 +
                    -0.12420141) * fVar152 + 0.14249323) * fVar152 + -0.16668057) * fVar152 +
                 0.20000714) * fVar152 + -0.24999994) * fVar152 + 0.3333333) * fVar152 + -0.5) +
             auVar367._0_4_ * 0.6931472 + fVar152) * -2.0;
        auVar10._8_4_ =
             (fVar170 * fVar170 *
              (((((((((fVar170 * 0.070376836 + -0.1151461) * fVar170 + 0.116769984) * fVar170 +
                    -0.12420141) * fVar170 + 0.14249323) * fVar170 + -0.16668057) * fVar170 +
                 0.20000714) * fVar170 + -0.24999994) * fVar170 + 0.3333333) * fVar170 + -0.5) +
             auVar367._8_4_ * 0.6931472 + fVar170) * -2.0;
        auVar10._12_4_ =
             (fVar171 * fVar171 *
              (((((((((fVar171 * 0.070376836 + -0.1151461) * fVar171 + 0.116769984) * fVar171 +
                    -0.12420141) * fVar171 + 0.14249323) * fVar171 + -0.16668057) * fVar171 +
                 0.20000714) * fVar171 + -0.24999994) * fVar171 + 0.3333333) * fVar171 + -0.5) +
             auVar367._12_4_ * 0.6931472 + fVar171) * -2.0;
        auVar10._16_4_ =
             (fVar172 * fVar172 *
              (((((((((fVar172 * 0.070376836 + -0.1151461) * fVar172 + 0.116769984) * fVar172 +
                    -0.12420141) * fVar172 + 0.14249323) * fVar172 + -0.16668057) * fVar172 +
                 0.20000714) * fVar172 + -0.24999994) * fVar172 + 0.3333333) * fVar172 + -0.5) +
             auVar367._16_4_ * 0.6931472 + fVar172) * -2.0;
        auVar10._20_4_ =
             (fVar173 * fVar173 *
              (((((((((fVar173 * 0.070376836 + -0.1151461) * fVar173 + 0.116769984) * fVar173 +
                    -0.12420141) * fVar173 + 0.14249323) * fVar173 + -0.16668057) * fVar173 +
                 0.20000714) * fVar173 + -0.24999994) * fVar173 + 0.3333333) * fVar173 + -0.5) +
             auVar367._20_4_ * 0.6931472 + fVar173) * -2.0;
        auVar10._24_4_ =
             (fVar174 * fVar174 *
              (((((((((fVar174 * 0.070376836 + -0.1151461) * fVar174 + 0.116769984) * fVar174 +
                    -0.12420141) * fVar174 + 0.14249323) * fVar174 + -0.16668057) * fVar174 +
                 0.20000714) * fVar174 + -0.24999994) * fVar174 + 0.3333333) * fVar174 + -0.5) +
             auVar367._24_4_ * 0.6931472 + fVar174) * -2.0;
        auVar10._28_4_ = auVar367._28_4_ + auVar182._28_4_ + -1.0 + auVar208._28_4_ + 0.0;
        auVar249._8_4_ = 0x7fffffff;
        auVar249._0_8_ = 0x7fffffff7fffffff;
        auVar249._12_4_ = 0x7fffffff;
        auVar249._16_4_ = 0x7fffffff;
        auVar249._20_4_ = 0x7fffffff;
        auVar249._24_4_ = 0x7fffffff;
        auVar249._28_4_ = 0x7fffffff;
        auVar208 = vblendvps_avx(auVar10,auVar249,auVar69);
        auVar208 = vminps_avx(auVar208,auVar126);
        auVar361._8_4_ = 0xc2b0c0a5;
        auVar361._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar361._12_4_ = 0xc2b0c0a5;
        auVar361._16_4_ = 0xc2b0c0a5;
        auVar361._20_4_ = 0xc2b0c0a5;
        auVar361._24_4_ = 0xc2b0c0a5;
        auVar361._28_4_ = 0xc2b0c0a5;
        auVar69 = vmaxps_avx(auVar361,auVar208);
        auVar250._0_4_ = auVar69._0_4_ * 1.442695 + 0.5;
        auVar250._4_4_ = auVar69._4_4_ * 1.442695 + 0.5;
        auVar250._8_4_ = auVar69._8_4_ * 1.442695 + 0.5;
        auVar250._12_4_ = auVar69._12_4_ * 1.442695 + 0.5;
        auVar250._16_4_ = auVar69._16_4_ * 1.442695 + 0.5;
        auVar250._20_4_ = auVar69._20_4_ * 1.442695 + 0.5;
        auVar250._24_4_ = auVar69._24_4_ * 1.442695 + 0.5;
        auVar250._28_4_ = 0x7fc00000;
        auVar61 = vroundps_avx(auVar250,1);
        auVar208 = vcmpps_avx(auVar250,auVar61,1);
        auVar208 = vandps_avx(auVar208,auVar183);
        auVar208 = vsubps_avx(auVar61,auVar208);
        auVar11._4_4_ = auVar208._4_4_ * 0.6931472;
        auVar11._0_4_ = auVar208._0_4_ * 0.6931472;
        auVar11._8_4_ = auVar208._8_4_ * 0.6931472;
        auVar11._12_4_ = auVar208._12_4_ * 0.6931472;
        auVar11._16_4_ = auVar208._16_4_ * 0.6931472;
        auVar11._20_4_ = auVar208._20_4_ * 0.6931472;
        auVar11._24_4_ = auVar208._24_4_ * 0.6931472;
        auVar11._28_4_ = auVar61._28_4_;
        auVar8 = vsubps_avx(auVar69,auVar11);
        fVar152 = auVar8._0_4_;
        fVar170 = auVar8._4_4_;
        fVar172 = auVar8._8_4_;
        fVar174 = auVar8._12_4_;
        fVar326 = auVar8._16_4_;
        fVar343 = auVar8._20_4_;
        fVar344 = auVar8._24_4_;
        auVar236._0_4_ = (int)auVar208._0_4_;
        auVar236._4_4_ = (int)auVar208._4_4_;
        auVar236._8_4_ = (int)auVar208._8_4_;
        auVar236._12_4_ = (int)auVar208._12_4_;
        auVar251._16_4_ = (int)auVar208._16_4_;
        auVar251._0_16_ = auVar236;
        auVar251._20_4_ = (int)auVar208._20_4_;
        auVar251._24_4_ = (int)auVar208._24_4_;
        auVar251._28_4_ = (int)auVar208._28_4_;
        auVar346 = vpslld_avx(auVar236,0x17);
        auVar328 = vpslld_avx(auVar251._16_16_,0x17);
        auVar39._8_4_ = 0x3f800000;
        auVar39._0_8_ = 0x3f8000003f800000;
        auVar39._12_4_ = 0x3f800000;
        auVar328 = vpaddd_avx(auVar328,auVar39);
        auVar346 = vpaddd_avx(auVar346,auVar39);
        auVar208 = vminps_avx(auVar126,auVar199);
        auVar69 = vmaxps_avx(auVar361,auVar208);
        auVar252._0_4_ = auVar69._0_4_ * 1.442695 + 0.5;
        auVar252._4_4_ = auVar69._4_4_ * 1.442695 + 0.5;
        auVar252._8_4_ = auVar69._8_4_ * 1.442695 + 0.5;
        auVar252._12_4_ = auVar69._12_4_ * 1.442695 + 0.5;
        auVar252._16_4_ = auVar69._16_4_ * 1.442695 + 0.5;
        auVar252._20_4_ = auVar69._20_4_ * 1.442695 + 0.5;
        auVar252._24_4_ = auVar69._24_4_ * 1.442695 + 0.5;
        auVar252._28_4_ = auVar328._12_4_ + 0.5;
        auVar367 = vroundps_avx(auVar252,1);
        auVar208 = vcmpps_avx(auVar252,auVar367,1);
        auVar208 = vandps_avx(auVar208,auVar183);
        auVar208 = vsubps_avx(auVar367,auVar208);
        auVar12._4_4_ = auVar208._4_4_ * 0.6931472;
        auVar12._0_4_ = auVar208._0_4_ * 0.6931472;
        auVar12._8_4_ = auVar208._8_4_ * 0.6931472;
        auVar12._12_4_ = auVar208._12_4_ * 0.6931472;
        auVar12._16_4_ = auVar208._16_4_ * 0.6931472;
        auVar12._20_4_ = auVar208._20_4_ * 0.6931472;
        auVar12._24_4_ = auVar208._24_4_ * 0.6931472;
        auVar12._28_4_ = auVar367._28_4_;
        auVar69 = vsubps_avx(auVar69,auVar12);
        fVar169 = auVar69._0_4_;
        fVar171 = auVar69._4_4_;
        fVar173 = auVar69._8_4_;
        fVar355 = auVar69._12_4_;
        fVar356 = auVar69._16_4_;
        fVar357 = auVar69._20_4_;
        fVar358 = auVar69._24_4_;
        auVar237._0_4_ = (int)auVar208._0_4_;
        auVar237._4_4_ = (int)auVar208._4_4_;
        auVar237._8_4_ = (int)auVar208._8_4_;
        auVar237._12_4_ = (int)auVar208._12_4_;
        auVar253._16_4_ = (int)auVar208._16_4_;
        auVar253._0_16_ = auVar237;
        auVar253._20_4_ = (int)auVar208._20_4_;
        auVar253._24_4_ = (int)auVar208._24_4_;
        auVar253._28_4_ = (int)auVar208._28_4_;
        auVar329 = vpslld_avx(auVar237,0x17);
        auVar238 = vpslld_avx(auVar253._16_16_,0x17);
        auVar102._8_4_ = 0x3f800000;
        auVar102._0_8_ = 0x3f8000003f800000;
        auVar102._12_4_ = 0x3f800000;
        auVar238 = vpaddd_avx(auVar238,auVar102);
        auVar329 = vpaddd_avx(auVar329,auVar102);
        auVar340._0_4_ =
             fVar212 + auVar329._0_4_ *
                       (fVar169 * fVar169 *
                        (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) *
                           fVar169 + 0.041665796) * fVar169 + 0.16666666) * fVar169 + 0.5) +
                       fVar212 + fVar169);
        auVar340._4_4_ =
             fVar230 + auVar329._4_4_ *
                       (fVar171 * fVar171 *
                        (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) *
                           fVar171 + 0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5) +
                       fVar230 + fVar171);
        auVar340._8_4_ =
             fVar231 + auVar329._8_4_ *
                       (fVar173 * fVar173 *
                        (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) *
                           fVar173 + 0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5) +
                       fVar231 + fVar173);
        auVar340._12_4_ =
             fVar232 + auVar329._12_4_ *
                       (fVar355 * fVar355 *
                        (((((fVar355 * 0.00019875691 + 0.0013981999) * fVar355 + 0.008333452) *
                           fVar355 + 0.041665796) * fVar355 + 0.16666666) * fVar355 + 0.5) +
                       fVar232 + fVar355);
        auVar340._16_4_ =
             fVar233 + auVar238._0_4_ *
                       (fVar356 * fVar356 *
                        (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) *
                           fVar356 + 0.041665796) * fVar356 + 0.16666666) * fVar356 + 0.5) +
                       fVar233 + fVar356);
        auVar340._20_4_ =
             fVar234 + auVar238._4_4_ *
                       (fVar357 * fVar357 *
                        (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) *
                           fVar357 + 0.041665796) * fVar357 + 0.16666666) * fVar357 + 0.5) +
                       fVar234 + fVar357);
        auVar340._24_4_ =
             fVar235 + auVar238._8_4_ *
                       (fVar358 * fVar358 *
                        (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) *
                           fVar358 + 0.041665796) * fVar358 + 0.16666666) * fVar358 + 0.5) +
                       fVar235 + fVar358);
        auVar340._28_4_ = fVar213 + auVar367._28_4_ + fVar213 + auVar69._28_4_;
        auVar48._8_4_ = 0x800000;
        auVar48._0_8_ = 0x80000000800000;
        auVar48._12_4_ = 0x800000;
        auVar48._16_4_ = 0x800000;
        auVar48._20_4_ = 0x800000;
        auVar48._24_4_ = 0x800000;
        auVar48._28_4_ = 0x800000;
        auVar367 = vmaxps_avx(auVar340,auVar48);
        auVar238 = vpsrld_avx(auVar367._16_16_,0x17);
        auVar49._8_4_ = 0x807fffff;
        auVar49._0_8_ = 0x807fffff807fffff;
        auVar49._12_4_ = 0x807fffff;
        auVar49._16_4_ = 0x807fffff;
        auVar49._20_4_ = 0x807fffff;
        auVar49._24_4_ = 0x807fffff;
        auVar49._28_4_ = 0x807fffff;
        auVar208 = vandps_avx(auVar367,auVar49);
        auVar182 = vorps_avx(auVar208,auVar150);
        auVar50._8_4_ = 0x3f3504f3;
        auVar50._0_8_ = 0x3f3504f33f3504f3;
        auVar50._12_4_ = 0x3f3504f3;
        auVar50._16_4_ = 0x3f3504f3;
        auVar50._20_4_ = 0x3f3504f3;
        auVar50._24_4_ = 0x3f3504f3;
        auVar50._28_4_ = 0x3f3504f3;
        auVar69 = vcmpps_avx(auVar50,auVar182,2);
        auVar208 = vandnps_avx(auVar69,auVar182);
        fVar169 = auVar182._0_4_ + -1.0 + auVar208._0_4_;
        fVar171 = auVar182._4_4_ + -1.0 + auVar208._4_4_;
        fVar173 = auVar182._8_4_ + -1.0 + auVar208._8_4_;
        fVar355 = auVar182._12_4_ + -1.0 + auVar208._12_4_;
        fVar356 = auVar182._16_4_ + -1.0 + auVar208._16_4_;
        fVar357 = auVar182._20_4_ + -1.0 + auVar208._20_4_;
        fVar358 = auVar182._24_4_ + -1.0 + auVar208._24_4_;
        auVar238 = vpsubd_avx(auVar238,auVar69._16_16_);
        auVar369 = ZEXT1664((undefined1  [16])0x0);
        auVar329 = vpsrld_avx(auVar367._0_16_,0x17);
        auVar40._8_4_ = 0xffffff81;
        auVar40._0_8_ = 0xffffff81ffffff81;
        auVar40._12_4_ = 0xffffff81;
        auVar238 = vpaddd_avx(auVar238,auVar40);
        auVar329 = vpsubd_avx(auVar329,auVar69._0_16_);
        auVar329 = vpaddd_avx(auVar329,auVar40);
        auVar159._16_16_ = auVar238;
        auVar159._0_16_ = auVar329;
        auVar364 = ZEXT3264(CONCAT428(0x80000000,
                                      CONCAT424(0x80000000,
                                                CONCAT420(0x80000000,
                                                          CONCAT416(0x80000000,
                                                                    CONCAT412(0x80000000,
                                                                              CONCAT48(0x80000000,
                                                                                                                                                                              
                                                  0x8000000080000000)))))));
        auVar69 = vcmpps_avx(auVar340,ZEXT1632((undefined1  [16])0x0),2);
        auVar367 = vcvtdq2ps_avx(auVar159);
        auVar13._4_4_ =
             (fVar171 * fVar171 *
              (((((((((fVar171 * 0.070376836 + -0.1151461) * fVar171 + 0.116769984) * fVar171 +
                    -0.12420141) * fVar171 + 0.14249323) * fVar171 + -0.16668057) * fVar171 +
                 0.20000714) * fVar171 + -0.24999994) * fVar171 + 0.3333333) * fVar171 + -0.5) +
             fVar171 + auVar367._4_4_ * 0.6931472) * -2.0;
        auVar13._0_4_ =
             (fVar169 * fVar169 *
              (((((((((fVar169 * 0.070376836 + -0.1151461) * fVar169 + 0.116769984) * fVar169 +
                    -0.12420141) * fVar169 + 0.14249323) * fVar169 + -0.16668057) * fVar169 +
                 0.20000714) * fVar169 + -0.24999994) * fVar169 + 0.3333333) * fVar169 + -0.5) +
             fVar169 + auVar367._0_4_ * 0.6931472) * -2.0;
        auVar13._8_4_ =
             (fVar173 * fVar173 *
              (((((((((fVar173 * 0.070376836 + -0.1151461) * fVar173 + 0.116769984) * fVar173 +
                    -0.12420141) * fVar173 + 0.14249323) * fVar173 + -0.16668057) * fVar173 +
                 0.20000714) * fVar173 + -0.24999994) * fVar173 + 0.3333333) * fVar173 + -0.5) +
             fVar173 + auVar367._8_4_ * 0.6931472) * -2.0;
        auVar13._12_4_ =
             (fVar355 * fVar355 *
              (((((((((fVar355 * 0.070376836 + -0.1151461) * fVar355 + 0.116769984) * fVar355 +
                    -0.12420141) * fVar355 + 0.14249323) * fVar355 + -0.16668057) * fVar355 +
                 0.20000714) * fVar355 + -0.24999994) * fVar355 + 0.3333333) * fVar355 + -0.5) +
             fVar355 + auVar367._12_4_ * 0.6931472) * -2.0;
        auVar13._16_4_ =
             (fVar356 * fVar356 *
              (((((((((fVar356 * 0.070376836 + -0.1151461) * fVar356 + 0.116769984) * fVar356 +
                    -0.12420141) * fVar356 + 0.14249323) * fVar356 + -0.16668057) * fVar356 +
                 0.20000714) * fVar356 + -0.24999994) * fVar356 + 0.3333333) * fVar356 + -0.5) +
             fVar356 + auVar367._16_4_ * 0.6931472) * -2.0;
        auVar13._20_4_ =
             (fVar357 * fVar357 *
              (((((((((fVar357 * 0.070376836 + -0.1151461) * fVar357 + 0.116769984) * fVar357 +
                    -0.12420141) * fVar357 + 0.14249323) * fVar357 + -0.16668057) * fVar357 +
                 0.20000714) * fVar357 + -0.24999994) * fVar357 + 0.3333333) * fVar357 + -0.5) +
             fVar357 + auVar367._20_4_ * 0.6931472) * -2.0;
        auVar13._24_4_ =
             (fVar358 * fVar358 *
              (((((((((fVar358 * 0.070376836 + -0.1151461) * fVar358 + 0.116769984) * fVar358 +
                    -0.12420141) * fVar358 + 0.14249323) * fVar358 + -0.16668057) * fVar358 +
                 0.20000714) * fVar358 + -0.24999994) * fVar358 + 0.3333333) * fVar358 + -0.5) +
             fVar358 + auVar367._24_4_ * 0.6931472) * -2.0;
        auVar13._28_4_ = auVar182._28_4_ + -1.0 + auVar208._28_4_ + auVar367._28_4_ + 0.0;
        auVar254._8_4_ = 0x7fffffff;
        auVar254._0_8_ = 0x7fffffff7fffffff;
        auVar254._12_4_ = 0x7fffffff;
        auVar254._16_4_ = 0x7fffffff;
        auVar254._20_4_ = 0x7fffffff;
        auVar254._24_4_ = 0x7fffffff;
        auVar254._28_4_ = 0x7fffffff;
        auVar208 = vblendvps_avx(auVar13,auVar254,auVar69);
        auVar255._8_4_ = 0x42b0c0a5;
        auVar255._0_8_ = 0x42b0c0a542b0c0a5;
        auVar255._12_4_ = 0x42b0c0a5;
        auVar255._16_4_ = 0x42b0c0a5;
        auVar255._20_4_ = 0x42b0c0a5;
        auVar255._24_4_ = 0x42b0c0a5;
        auVar255._28_4_ = 0x42b0c0a5;
        auVar208 = vminps_avx(auVar255,auVar208);
        auVar256._8_4_ = 0xc2b0c0a5;
        auVar256._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar256._12_4_ = 0xc2b0c0a5;
        auVar256._16_4_ = 0xc2b0c0a5;
        auVar256._20_4_ = 0xc2b0c0a5;
        auVar256._24_4_ = 0xc2b0c0a5;
        auVar256._28_4_ = 0xc2b0c0a5;
        auVar69 = vmaxps_avx(auVar256,auVar208);
        auVar257._0_4_ = auVar69._0_4_ * 1.442695 + 0.5;
        auVar257._4_4_ = auVar69._4_4_ * 1.442695 + 0.5;
        auVar257._8_4_ = auVar69._8_4_ * 1.442695 + 0.5;
        auVar257._12_4_ = auVar69._12_4_ * 1.442695 + 0.5;
        auVar257._16_4_ = auVar69._16_4_ * 1.442695 + 0.5;
        auVar257._20_4_ = auVar69._20_4_ * 1.442695 + 0.5;
        auVar257._24_4_ = auVar69._24_4_ * 1.442695 + 0.5;
        auVar257._28_4_ = 0x3ff8aa3b;
        auVar367 = vroundps_avx(auVar257,1);
        auVar208 = vcmpps_avx(auVar257,auVar367,1);
        auVar183 = vandps_avx(auVar208,auVar183);
        auVar183 = vsubps_avx(auVar367,auVar183);
        auVar14._4_4_ = auVar183._4_4_ * 0.6931472;
        auVar14._0_4_ = auVar183._0_4_ * 0.6931472;
        auVar14._8_4_ = auVar183._8_4_ * 0.6931472;
        auVar14._12_4_ = auVar183._12_4_ * 0.6931472;
        auVar14._16_4_ = auVar183._16_4_ * 0.6931472;
        auVar14._20_4_ = auVar183._20_4_ * 0.6931472;
        auVar14._24_4_ = auVar183._24_4_ * 0.6931472;
        auVar14._28_4_ = auVar367._28_4_;
        auVar208 = vsubps_avx(auVar69,auVar14);
        fVar169 = auVar208._0_4_;
        fVar171 = auVar208._4_4_;
        fVar173 = auVar208._8_4_;
        fVar355 = auVar208._12_4_;
        fVar356 = auVar208._16_4_;
        fVar357 = auVar208._20_4_;
        fVar358 = auVar208._24_4_;
        auVar239._0_4_ = (int)auVar183._0_4_;
        auVar239._4_4_ = (int)auVar183._4_4_;
        auVar239._8_4_ = (int)auVar183._8_4_;
        auVar239._12_4_ = (int)auVar183._12_4_;
        auVar258._16_4_ = (int)auVar183._16_4_;
        auVar258._0_16_ = auVar239;
        auVar258._20_4_ = (int)auVar183._20_4_;
        auVar258._24_4_ = (int)auVar183._24_4_;
        auVar258._28_4_ = (int)auVar183._28_4_;
        auVar329 = vpslld_avx(auVar239,0x17);
        auVar238 = vpslld_avx(auVar258._16_16_,0x17);
        auVar238 = vpaddd_avx(auVar238,auVar102);
        auVar329 = vpaddd_avx(auVar329,auVar102);
        auVar131 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
        auVar259._0_4_ =
             fVar212 + auVar346._0_4_ *
                       (fVar152 * fVar152 *
                        (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) *
                           fVar152 + 0.041665796) * fVar152 + 0.16666666) * fVar152 + 0.5) +
                       fVar212 + fVar152);
        auVar259._4_4_ =
             fVar230 + auVar346._4_4_ *
                       (fVar170 * fVar170 *
                        (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) *
                           fVar170 + 0.041665796) * fVar170 + 0.16666666) * fVar170 + 0.5) +
                       fVar230 + fVar170);
        auVar259._8_4_ =
             fVar231 + auVar346._8_4_ *
                       (fVar172 * fVar172 *
                        (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) *
                           fVar172 + 0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) +
                       fVar231 + fVar172);
        auVar259._12_4_ =
             fVar232 + auVar346._12_4_ *
                       (fVar174 * fVar174 *
                        (((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452) *
                           fVar174 + 0.041665796) * fVar174 + 0.16666666) * fVar174 + 0.5) +
                       fVar232 + fVar174);
        auVar259._16_4_ =
             fVar233 + auVar328._0_4_ *
                       (fVar326 * fVar326 *
                        (((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) *
                           fVar326 + 0.041665796) * fVar326 + 0.16666666) * fVar326 + 0.5) +
                       fVar233 + fVar326);
        auVar259._20_4_ =
             fVar234 + auVar328._4_4_ *
                       (fVar343 * fVar343 *
                        (((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 + 0.008333452) *
                           fVar343 + 0.041665796) * fVar343 + 0.16666666) * fVar343 + 0.5) +
                       fVar234 + fVar343);
        auVar259._24_4_ =
             fVar235 + auVar328._8_4_ *
                       (fVar344 * fVar344 *
                        (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) *
                           fVar344 + 0.041665796) * fVar344 + 0.16666666) * fVar344 + 0.5) +
                       fVar235 + fVar344);
        auVar259._28_4_ = fVar213 + auVar61._28_4_ + fVar213 + auVar8._28_4_;
        auVar51._8_4_ = 0x40000000;
        auVar51._0_8_ = 0x4000000040000000;
        auVar51._12_4_ = 0x40000000;
        auVar51._16_4_ = 0x40000000;
        auVar51._20_4_ = 0x40000000;
        auVar51._24_4_ = 0x40000000;
        auVar51._28_4_ = 0x40000000;
        auVar183 = vdivps_avx(auVar51,auVar259);
        auVar160._0_4_ =
             fVar212 + auVar329._0_4_ *
                       (fVar169 * fVar169 *
                        (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) *
                           fVar169 + 0.041665796) * fVar169 + 0.16666666) * fVar169 + 0.5) +
                       fVar212 + fVar169);
        auVar160._4_4_ =
             fVar230 + auVar329._4_4_ *
                       (fVar171 * fVar171 *
                        (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) *
                           fVar171 + 0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5) +
                       fVar230 + fVar171);
        auVar160._8_4_ =
             fVar231 + auVar329._8_4_ *
                       (fVar173 * fVar173 *
                        (((((fVar173 * 0.00019875691 + 0.0013981999) * fVar173 + 0.008333452) *
                           fVar173 + 0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5) +
                       fVar231 + fVar173);
        auVar160._12_4_ =
             fVar232 + auVar329._12_4_ *
                       (fVar355 * fVar355 *
                        (((((fVar355 * 0.00019875691 + 0.0013981999) * fVar355 + 0.008333452) *
                           fVar355 + 0.041665796) * fVar355 + 0.16666666) * fVar355 + 0.5) +
                       fVar232 + fVar355);
        auVar160._16_4_ =
             fVar233 + auVar238._0_4_ *
                       (fVar356 * fVar356 *
                        (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) *
                           fVar356 + 0.041665796) * fVar356 + 0.16666666) * fVar356 + 0.5) +
                       fVar233 + fVar356);
        auVar160._20_4_ =
             fVar234 + auVar238._4_4_ *
                       (fVar357 * fVar357 *
                        (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) *
                           fVar357 + 0.041665796) * fVar357 + 0.16666666) * fVar357 + 0.5) +
                       fVar234 + fVar357);
        auVar160._24_4_ =
             fVar235 + auVar238._8_4_ *
                       (fVar358 * fVar358 *
                        (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) *
                           fVar358 + 0.041665796) * fVar358 + 0.16666666) * fVar358 + 0.5) +
                       fVar235 + fVar358);
        auVar160._28_4_ = fVar213 + auVar367._28_4_ + fVar213 + auVar208._28_4_;
        auVar208 = vdivps_avx(auVar51,auVar160);
        auVar311._0_4_ = (auVar183._0_4_ + -1.0) * auVar285._0_4_;
        auVar311._4_4_ = (auVar183._4_4_ + -1.0) * auVar285._4_4_;
        auVar311._8_4_ = (auVar183._8_4_ + -1.0) * auVar285._8_4_;
        auVar311._12_4_ = (auVar183._12_4_ + -1.0) * auVar285._12_4_;
        auVar311._16_4_ = (auVar183._16_4_ + -1.0) * auVar285._16_4_;
        auVar311._20_4_ = (auVar183._20_4_ + -1.0) * auVar285._20_4_;
        auVar311._24_4_ = (auVar183._24_4_ + -1.0) * auVar285._24_4_;
        auVar161._0_4_ = auVar208._0_4_ + -1.0;
        auVar161._4_4_ = auVar208._4_4_ + -1.0;
        auVar161._8_4_ = auVar208._8_4_ + -1.0;
        auVar161._12_4_ = auVar208._12_4_ + -1.0;
        auVar161._16_4_ = auVar208._16_4_ + -1.0;
        auVar161._20_4_ = auVar208._20_4_ + -1.0;
        auVar161._24_4_ = auVar208._24_4_ + -1.0;
        auVar161._28_4_ = auVar208._28_4_ + -1.0;
        auVar191 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
        goto LAB_0041e464;
      case 5:
        fVar152 = *activation_params->data;
        fVar169 = *(float *)((long)activation_params->data + 4);
        auVar317._0_4_ = auVar285._0_4_ * fVar152 + fVar169;
        auVar317._4_4_ = auVar285._4_4_ * fVar152 + fVar169;
        auVar317._8_4_ = auVar285._8_4_ * fVar152 + fVar169;
        auVar317._12_4_ = auVar285._12_4_ * fVar152 + fVar169;
        auVar317._16_4_ = auVar285._16_4_ * fVar152 + fVar169;
        auVar317._20_4_ = auVar285._20_4_ * fVar152 + fVar169;
        auVar317._24_4_ = auVar285._24_4_ * fVar152 + fVar169;
        auVar317._28_4_ = auVar208._28_4_ + fVar169;
        auVar208 = vmaxps_avx(auVar317,auVar367);
        auVar208 = vminps_avx(auVar208,auVar183);
        auVar311._0_4_ = auVar208._0_4_ * auVar285._0_4_;
        auVar311._4_4_ = auVar208._4_4_ * auVar285._4_4_;
        auVar311._8_4_ = auVar208._8_4_ * auVar285._8_4_;
        auVar311._12_4_ = auVar208._12_4_ * auVar285._12_4_;
        auVar311._16_4_ = auVar208._16_4_ * auVar285._16_4_;
        auVar311._20_4_ = auVar208._20_4_ * auVar285._20_4_;
        auVar311._24_4_ = auVar208._24_4_ * auVar285._24_4_;
        auVar162._0_4_ = fVar169 + fVar152 * auVar198._0_4_;
        auVar162._4_4_ = fVar169 + fVar152 * auVar198._4_4_;
        auVar162._8_4_ = fVar169 + fVar152 * auVar198._8_4_;
        auVar162._12_4_ = fVar169 + fVar152 * auVar198._12_4_;
        auVar162._16_4_ = fVar169 + fVar152 * auVar198._16_4_;
        auVar162._20_4_ = fVar169 + fVar152 * auVar198._20_4_;
        auVar162._24_4_ = fVar169 + fVar152 * auVar198._24_4_;
        auVar162._28_4_ = fVar169 + fVar152;
        auVar208 = vmaxps_avx(auVar367,auVar162);
        auVar161 = vminps_avx(auVar183,auVar208);
LAB_0041e464:
        auVar175 = ZEXT436(auVar161._28_4_);
        auVar336._0_4_ = auVar161._0_4_ * auVar198._0_4_;
        auVar336._4_4_ = auVar161._4_4_ * auVar198._4_4_;
        auVar336._8_4_ = auVar161._8_4_ * auVar198._8_4_;
        auVar336._12_4_ = auVar161._12_4_ * auVar198._12_4_;
        auVar336._16_4_ = auVar161._16_4_ * auVar198._16_4_;
        auVar336._20_4_ = auVar161._20_4_ * auVar198._20_4_;
        auVar336._24_4_ = auVar161._24_4_ * auVar198._24_4_;
      }
switchD_0041db63_caseD_0:
      auVar365._0_4_ = auVar311._0_4_ * (float)local_b8._0_4_;
      auVar365._4_4_ = auVar311._4_4_ * (float)local_b8._4_4_;
      auVar365._8_4_ = auVar311._8_4_ * fStack_b0;
      auVar365._12_4_ = auVar311._12_4_ * fStack_ac;
      auVar365._16_4_ = auVar311._16_4_ * fStack_a8;
      auVar365._20_4_ = auVar311._20_4_ * fStack_a4;
      auVar365._24_4_ = auVar311._24_4_ * fStack_a0;
      auVar365._28_36_ = auVar175;
      auVar210._0_4_ = auVar336._0_4_ * (float)local_b8._0_4_;
      auVar210._4_4_ = auVar336._4_4_ * (float)local_b8._4_4_;
      auVar210._8_4_ = auVar336._8_4_ * fStack_b0;
      auVar210._12_4_ = auVar336._12_4_ * fStack_ac;
      auVar210._16_4_ = auVar336._16_4_ * fStack_a8;
      auVar210._20_4_ = auVar336._20_4_ * fStack_a4;
      auVar210._24_4_ = auVar336._24_4_ * fStack_a0;
      auVar210._28_36_ = auVar211;
      auVar183 = vandps_avx(auVar364._0_32_,auVar365._0_32_);
      auVar208 = vandps_avx(auVar364._0_32_,auVar210._0_32_);
      auVar183 = vorps_avx(auVar183,auVar150);
      auVar208 = vorps_avx(auVar208,auVar150);
      auVar153._0_4_ = (int)(auVar183._0_4_ + auVar365._0_4_);
      auVar153._4_4_ = (int)(auVar183._4_4_ + auVar365._4_4_);
      auVar153._8_4_ = (int)(auVar183._8_4_ + auVar365._8_4_);
      auVar153._12_4_ = (int)(auVar183._12_4_ + auVar365._12_4_);
      auVar163._16_4_ = (int)(auVar183._16_4_ + auVar365._16_4_);
      auVar163._0_16_ = auVar153;
      auVar163._20_4_ = (int)(auVar183._20_4_ + auVar365._20_4_);
      auVar163._24_4_ = (int)(auVar183._24_4_ + auVar365._24_4_);
      auVar163._28_4_ = (int)(auVar183._28_4_ + auVar175._0_4_);
      auVar194._0_4_ = (int)(auVar208._0_4_ + auVar210._0_4_);
      auVar194._4_4_ = (int)(auVar208._4_4_ + auVar210._4_4_);
      auVar194._8_4_ = (int)(auVar208._8_4_ + auVar210._8_4_);
      auVar194._12_4_ = (int)(auVar208._12_4_ + auVar210._12_4_);
      auVar202._16_4_ = (int)(auVar208._16_4_ + auVar210._16_4_);
      auVar202._0_16_ = auVar194;
      auVar202._20_4_ = (int)(auVar208._20_4_ + auVar210._20_4_);
      auVar202._24_4_ = (int)(auVar208._24_4_ + auVar210._24_4_);
      auVar202._28_4_ = (int)(auVar208._28_4_ + auVar211._0_4_);
      auVar328 = vpackssdw_avx(auVar153,auVar163._16_16_);
      auVar346 = vpackssdw_avx(auVar194,auVar202._16_16_);
      auVar328 = vpminsw_avx(auVar328,auVar131._0_16_);
      auVar346 = vpminsw_avx(auVar346,auVar131._0_16_);
      auVar328 = vpmaxsw_avx(auVar328,auVar191._0_16_);
      auVar346 = vpmaxsw_avx(auVar346,auVar191._0_16_);
      in_ZMM7 = ZEXT1664(auVar346);
      auVar328 = vpacksswb_avx(auVar328,auVar346);
      in_ZMM5 = ZEXT1664(auVar328);
      *(undefined1 (*) [16])(ptr + uVar37) = auVar328;
      intptr = (int *)((long)intptr + 0x40);
      uVar37 = uVar37 + 0x10;
    }
    pfVar4 = (float *)activation_params->data;
    auVar131 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
    auVar229 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
    auVar191 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar68._8_4_ = 0x42b0c0a5;
    auVar68._0_8_ = 0x42b0c0a542b0c0a5;
    auVar68._12_4_ = 0x42b0c0a5;
    auVar68._16_4_ = 0x42b0c0a5;
    auVar68._20_4_ = 0x42b0c0a5;
    auVar68._24_4_ = 0x42b0c0a5;
    auVar68._28_4_ = 0x42b0c0a5;
    while( true ) {
      auVar175 = in_ZMM7._28_36_;
      if (iVar35 <= (int)uVar37 + 7) break;
      auVar208 = vcvtdq2ps_avx(*(undefined1 (*) [32])intptr);
      auVar286._0_4_ = auVar208._0_4_ * (float)local_f8._0_4_ + fVar152;
      auVar286._4_4_ = auVar208._4_4_ * (float)local_f8._4_4_ + fVar169;
      auVar286._8_4_ = auVar208._8_4_ * fStack_f0 + fVar170;
      auVar286._12_4_ = auVar208._12_4_ * fStack_ec + fVar171;
      auVar286._16_4_ = auVar208._16_4_ * fStack_e8 + fVar172;
      auVar286._20_4_ = auVar208._20_4_ * fStack_e4 + fVar173;
      auVar286._24_4_ = auVar208._24_4_ * fStack_e0 + fVar174;
      auVar291._28_4_ = auVar208._28_4_ + fVar355;
      auVar291._0_28_ = auVar286;
      auVar312 = auVar286;
      if (5 < uVar33) goto switchD_0041e539_caseD_0;
      auVar69 = auVar191._0_32_;
      auVar208 = vmaxps_avx(auVar291,auVar69);
      auVar312 = auVar208._0_28_;
      switch(uVar33) {
      case 1:
        auVar69 = vminps_avx(auVar291,auVar69);
        fVar326 = *pfVar4;
        auVar312._0_4_ = fVar326 * auVar69._0_4_ + auVar208._0_4_;
        auVar312._4_4_ = fVar326 * auVar69._4_4_ + auVar208._4_4_;
        auVar312._8_4_ = fVar326 * auVar69._8_4_ + auVar208._8_4_;
        auVar312._12_4_ = fVar326 * auVar69._12_4_ + auVar208._12_4_;
        auVar312._16_4_ = fVar326 * auVar69._16_4_ + auVar208._16_4_;
        auVar312._20_4_ = fVar326 * auVar69._20_4_ + auVar208._20_4_;
        auVar312._24_4_ = fVar326 * auVar69._24_4_ + auVar208._24_4_;
        break;
      case 2:
        fVar326 = *pfVar4;
        auVar263._4_4_ = fVar326;
        auVar263._0_4_ = fVar326;
        auVar263._8_4_ = fVar326;
        auVar263._12_4_ = fVar326;
        auVar263._16_4_ = fVar326;
        auVar263._20_4_ = fVar326;
        auVar263._24_4_ = fVar326;
        auVar263._28_4_ = fVar326;
        fVar326 = pfVar4[1];
        auVar321._4_4_ = fVar326;
        auVar321._0_4_ = fVar326;
        auVar321._8_4_ = fVar326;
        auVar321._12_4_ = fVar326;
        auVar321._16_4_ = fVar326;
        auVar321._20_4_ = fVar326;
        auVar321._24_4_ = fVar326;
        auVar321._28_4_ = fVar326;
        auVar208 = vmaxps_avx(auVar291,auVar263);
        auVar208 = vminps_avx(auVar208,auVar321);
        auVar312 = auVar208._0_28_;
        break;
      case 3:
        auVar264._0_4_ = (uint)auVar286._0_4_ ^ auVar364._0_4_;
        auVar264._4_4_ = (uint)auVar286._4_4_ ^ auVar364._4_4_;
        auVar264._8_4_ = (uint)auVar286._8_4_ ^ auVar364._8_4_;
        auVar264._12_4_ = (uint)auVar286._12_4_ ^ auVar364._12_4_;
        auVar264._16_4_ = (uint)auVar286._16_4_ ^ auVar364._16_4_;
        auVar264._20_4_ = (uint)auVar286._20_4_ ^ auVar364._20_4_;
        auVar264._24_4_ = (uint)auVar286._24_4_ ^ auVar364._24_4_;
        auVar264._28_4_ = (uint)auVar291._28_4_ ^ auVar364._28_4_;
        auVar129._8_4_ = 0x42b0c0a5;
        auVar129._0_8_ = 0x42b0c0a542b0c0a5;
        auVar129._12_4_ = 0x42b0c0a5;
        auVar129._16_4_ = 0x42b0c0a5;
        auVar129._20_4_ = 0x42b0c0a5;
        auVar129._24_4_ = 0x42b0c0a5;
        auVar129._28_4_ = 0x42b0c0a5;
        auVar208 = vminps_avx(auVar264,auVar129);
        auVar130._8_4_ = 0xc2b0c0a5;
        auVar130._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar130._12_4_ = 0xc2b0c0a5;
        auVar130._16_4_ = 0xc2b0c0a5;
        auVar130._20_4_ = 0xc2b0c0a5;
        auVar130._24_4_ = 0xc2b0c0a5;
        auVar130._28_4_ = 0xc2b0c0a5;
        auVar69 = vmaxps_avx(auVar208,auVar130);
        auVar292._0_4_ = auVar69._0_4_ * 1.442695 + 0.5;
        auVar292._4_4_ = auVar69._4_4_ * 1.442695 + 0.5;
        auVar292._8_4_ = auVar69._8_4_ * 1.442695 + 0.5;
        auVar292._12_4_ = auVar69._12_4_ * 1.442695 + 0.5;
        auVar292._16_4_ = auVar69._16_4_ * 1.442695 + 0.5;
        auVar292._20_4_ = auVar69._20_4_ * 1.442695 + 0.5;
        auVar292._24_4_ = auVar69._24_4_ * 1.442695 + 0.5;
        auVar292._28_4_ = auVar291._28_4_ + 0.5;
        auVar367 = vroundps_avx(auVar292,1);
        auVar208 = vcmpps_avx(auVar292,auVar367,1);
        auVar208 = vandps_avx(auVar208,auVar183);
        auVar208 = vsubps_avx(auVar367,auVar208);
        fVar326 = auVar69._0_4_ + auVar208._0_4_ * -0.6931472;
        fVar356 = auVar69._4_4_ + auVar208._4_4_ * -0.6931472;
        fVar343 = auVar69._8_4_ + auVar208._8_4_ * -0.6931472;
        fVar357 = auVar69._12_4_ + auVar208._12_4_ * -0.6931472;
        fVar344 = auVar69._16_4_ + auVar208._16_4_ * -0.6931472;
        fVar358 = auVar69._20_4_ + auVar208._20_4_ * -0.6931472;
        fVar345 = auVar69._24_4_ + auVar208._24_4_ * -0.6931472;
        auVar281._0_4_ = (int)auVar208._0_4_;
        auVar281._4_4_ = (int)auVar208._4_4_;
        auVar281._8_4_ = (int)auVar208._8_4_;
        auVar281._12_4_ = (int)auVar208._12_4_;
        auVar293._16_4_ = (int)auVar208._16_4_;
        auVar293._0_16_ = auVar281;
        auVar293._20_4_ = (int)auVar208._20_4_;
        auVar293._24_4_ = (int)auVar208._24_4_;
        auVar293._28_4_ = (int)auVar208._28_4_;
        auVar346 = vpslld_avx(auVar281,0x17);
        auVar328 = vpslld_avx(auVar293._16_16_,0x17);
        auVar105._8_4_ = 0x3f800000;
        auVar105._0_8_ = 0x3f8000003f800000;
        auVar105._12_4_ = 0x3f800000;
        auVar328 = vpaddd_avx(auVar328,auVar105);
        auVar346 = vpaddd_avx(auVar346,auVar105);
        auVar265._0_4_ =
             (fVar326 + fVar212 +
             fVar326 * fVar326 *
             (((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) * fVar326 +
               0.041665796) * fVar326 + 0.16666666) * fVar326 + 0.5)) * auVar346._0_4_ + fVar212;
        auVar265._4_4_ =
             (fVar356 + fVar230 +
             fVar356 * fVar356 *
             (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) * fVar356 +
               0.041665796) * fVar356 + 0.16666666) * fVar356 + 0.5)) * auVar346._4_4_ + fVar230;
        auVar265._8_4_ =
             (fVar343 + fVar231 +
             fVar343 * fVar343 *
             (((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 + 0.008333452) * fVar343 +
               0.041665796) * fVar343 + 0.16666666) * fVar343 + 0.5)) * auVar346._8_4_ + fVar231;
        auVar265._12_4_ =
             (fVar357 + fVar232 +
             fVar357 * fVar357 *
             (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) * fVar357 +
               0.041665796) * fVar357 + 0.16666666) * fVar357 + 0.5)) * auVar346._12_4_ + fVar232;
        auVar265._16_4_ =
             (fVar344 + fVar233 +
             fVar344 * fVar344 *
             (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344 +
               0.041665796) * fVar344 + 0.16666666) * fVar344 + 0.5)) * auVar328._0_4_ + fVar233;
        auVar265._20_4_ =
             (fVar358 + fVar234 +
             fVar358 * fVar358 *
             (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) * fVar358 +
               0.041665796) * fVar358 + 0.16666666) * fVar358 + 0.5)) * auVar328._4_4_ + fVar234;
        auVar265._24_4_ =
             (fVar345 + fVar235 +
             fVar345 * fVar345 *
             (((((fVar345 * 0.00019875691 + 0.0013981999) * fVar345 + 0.008333452) * fVar345 +
               0.041665796) * fVar345 + 0.16666666) * fVar345 + 0.5)) * auVar328._8_4_ + fVar235;
        auVar265._28_4_ = auVar69._28_4_ + auVar367._28_4_ + fVar213 + auVar367._28_4_ + fVar213;
        auVar208 = vdivps_avx(auVar183,auVar265);
        auVar312 = auVar208._0_28_;
        break;
      case 4:
        auVar69 = vminps_avx(auVar291,auVar68);
        auVar128._8_4_ = 0xc2b0c0a5;
        auVar128._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar128._12_4_ = 0xc2b0c0a5;
        auVar128._16_4_ = 0xc2b0c0a5;
        auVar128._20_4_ = 0xc2b0c0a5;
        auVar128._24_4_ = 0xc2b0c0a5;
        auVar128._28_4_ = 0xc2b0c0a5;
        auVar69 = vmaxps_avx(auVar69,auVar128);
        auVar318._0_4_ = auVar69._0_4_ * 1.442695 + 0.5;
        auVar318._4_4_ = auVar69._4_4_ * 1.442695 + 0.5;
        auVar318._8_4_ = auVar69._8_4_ * 1.442695 + 0.5;
        auVar318._12_4_ = auVar69._12_4_ * 1.442695 + 0.5;
        auVar318._16_4_ = auVar69._16_4_ * 1.442695 + 0.5;
        auVar318._20_4_ = auVar69._20_4_ * 1.442695 + 0.5;
        auVar318._24_4_ = auVar69._24_4_ * 1.442695 + 0.5;
        auVar318._28_4_ = auVar208._28_4_ + 0.5;
        auVar367 = vroundps_avx(auVar318,1);
        auVar208 = vcmpps_avx(auVar318,auVar367,1);
        auVar208 = vandps_avx(auVar208,auVar183);
        auVar208 = vsubps_avx(auVar367,auVar208);
        auVar17._4_4_ = auVar208._4_4_ * 0.6931472;
        auVar17._0_4_ = auVar208._0_4_ * 0.6931472;
        auVar17._8_4_ = auVar208._8_4_ * 0.6931472;
        auVar17._12_4_ = auVar208._12_4_ * 0.6931472;
        auVar17._16_4_ = auVar208._16_4_ * 0.6931472;
        auVar17._20_4_ = auVar208._20_4_ * 0.6931472;
        auVar17._24_4_ = auVar208._24_4_ * 0.6931472;
        auVar17._28_4_ = auVar367._28_4_;
        auVar69 = vsubps_avx(auVar69,auVar17);
        fVar326 = auVar69._0_4_;
        fVar356 = auVar69._4_4_;
        fVar343 = auVar69._8_4_;
        fVar357 = auVar69._12_4_;
        fVar344 = auVar69._16_4_;
        fVar358 = auVar69._20_4_;
        fVar345 = auVar69._24_4_;
        auVar308._0_4_ = (int)auVar208._0_4_;
        auVar308._4_4_ = (int)auVar208._4_4_;
        auVar308._8_4_ = (int)auVar208._8_4_;
        auVar308._12_4_ = (int)auVar208._12_4_;
        auVar319._16_4_ = (int)auVar208._16_4_;
        auVar319._0_16_ = auVar308;
        auVar319._20_4_ = (int)auVar208._20_4_;
        auVar319._24_4_ = (int)auVar208._24_4_;
        auVar319._28_4_ = (int)auVar208._28_4_;
        auVar346 = vpslld_avx(auVar308,0x17);
        auVar328 = vpslld_avx(auVar319._16_16_,0x17);
        auVar104._8_4_ = 0x3f800000;
        auVar104._0_8_ = 0x3f8000003f800000;
        auVar104._12_4_ = 0x3f800000;
        auVar328 = vpaddd_avx(auVar328,auVar104);
        auVar346 = vpaddd_avx(auVar346,auVar104);
        auVar320._0_4_ =
             (fVar326 + fVar212 +
             fVar326 * fVar326 *
             (((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) * fVar326 +
               0.041665796) * fVar326 + 0.16666666) * fVar326 + 0.5)) * auVar346._0_4_ + fVar212;
        auVar320._4_4_ =
             (fVar356 + fVar230 +
             fVar356 * fVar356 *
             (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) * fVar356 +
               0.041665796) * fVar356 + 0.16666666) * fVar356 + 0.5)) * auVar346._4_4_ + fVar230;
        auVar320._8_4_ =
             (fVar343 + fVar231 +
             fVar343 * fVar343 *
             (((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 + 0.008333452) * fVar343 +
               0.041665796) * fVar343 + 0.16666666) * fVar343 + 0.5)) * auVar346._8_4_ + fVar231;
        auVar320._12_4_ =
             (fVar357 + fVar232 +
             fVar357 * fVar357 *
             (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) * fVar357 +
               0.041665796) * fVar357 + 0.16666666) * fVar357 + 0.5)) * auVar346._12_4_ + fVar232;
        auVar320._16_4_ =
             (fVar344 + fVar233 +
             fVar344 * fVar344 *
             (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344 +
               0.041665796) * fVar344 + 0.16666666) * fVar344 + 0.5)) * auVar328._0_4_ + fVar233;
        auVar320._20_4_ =
             (fVar358 + fVar234 +
             fVar358 * fVar358 *
             (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) * fVar358 +
               0.041665796) * fVar358 + 0.16666666) * fVar358 + 0.5)) * auVar328._4_4_ + fVar234;
        auVar320._24_4_ =
             (fVar345 + fVar235 +
             fVar345 * fVar345 *
             (((((fVar345 * 0.00019875691 + 0.0013981999) * fVar345 + 0.008333452) * fVar345 +
               0.041665796) * fVar345 + 0.16666666) * fVar345 + 0.5)) * auVar328._8_4_ + fVar235;
        auVar320._28_4_ = auVar69._28_4_ + fVar213 + auVar367._28_4_ + fVar213;
        auVar52._8_4_ = 0x800000;
        auVar52._0_8_ = 0x80000000800000;
        auVar52._12_4_ = 0x800000;
        auVar52._16_4_ = 0x800000;
        auVar52._20_4_ = 0x800000;
        auVar52._24_4_ = 0x800000;
        auVar52._28_4_ = 0x800000;
        auVar367 = vmaxps_avx(auVar320,auVar52);
        auVar328 = vpsrld_avx(auVar367._16_16_,0x17);
        auVar53._8_4_ = 0x807fffff;
        auVar53._0_8_ = 0x807fffff807fffff;
        auVar53._12_4_ = 0x807fffff;
        auVar53._16_4_ = 0x807fffff;
        auVar53._20_4_ = 0x807fffff;
        auVar53._24_4_ = 0x807fffff;
        auVar53._28_4_ = 0x807fffff;
        auVar208 = vandps_avx(auVar367,auVar53);
        auVar182 = vorps_avx(auVar208,auVar150);
        auVar54._8_4_ = 0x3f3504f3;
        auVar54._0_8_ = 0x3f3504f33f3504f3;
        auVar54._12_4_ = 0x3f3504f3;
        auVar54._16_4_ = 0x3f3504f3;
        auVar54._20_4_ = 0x3f3504f3;
        auVar54._24_4_ = 0x3f3504f3;
        auVar54._28_4_ = 0x3f3504f3;
        auVar69 = vcmpps_avx(auVar54,auVar182,2);
        auVar208 = vandnps_avx(auVar69,auVar182);
        fVar326 = auVar182._0_4_ + -1.0 + auVar208._0_4_;
        fVar356 = auVar182._4_4_ + -1.0 + auVar208._4_4_;
        fVar343 = auVar182._8_4_ + -1.0 + auVar208._8_4_;
        fVar357 = auVar182._12_4_ + -1.0 + auVar208._12_4_;
        fVar344 = auVar182._16_4_ + -1.0 + auVar208._16_4_;
        fVar358 = auVar182._20_4_ + -1.0 + auVar208._20_4_;
        fVar345 = auVar182._24_4_ + -1.0 + auVar208._24_4_;
        auVar328 = vpsubd_avx(auVar328,auVar69._16_16_);
        auVar346 = vpsrld_avx(auVar367._0_16_,0x17);
        auVar41._8_4_ = 0xffffff81;
        auVar41._0_8_ = 0xffffff81ffffff81;
        auVar41._12_4_ = 0xffffff81;
        auVar328 = vpaddd_avx(auVar328,auVar41);
        auVar346 = vpsubd_avx(auVar346,auVar69._0_16_);
        auVar364 = ZEXT3264(CONCAT428(0x80000000,
                                      CONCAT424(0x80000000,
                                                CONCAT420(0x80000000,
                                                          CONCAT416(0x80000000,
                                                                    CONCAT412(0x80000000,
                                                                              CONCAT48(0x80000000,
                                                                                                                                                                              
                                                  0x8000000080000000)))))));
        auVar346 = vpaddd_avx(auVar346,auVar41);
        auVar203._16_16_ = auVar328;
        auVar203._0_16_ = auVar346;
        auVar191 = ZEXT1264(ZEXT412(0)) << 0x20;
        auVar69 = vcmpps_avx(auVar320,ZEXT1232(ZEXT412(0)) << 0x20,2);
        auVar367 = vcvtdq2ps_avx(auVar203);
        auVar18._4_4_ =
             (fVar356 * fVar356 *
              (((((((((fVar356 * 0.070376836 + -0.1151461) * fVar356 + 0.116769984) * fVar356 +
                    -0.12420141) * fVar356 + 0.14249323) * fVar356 + -0.16668057) * fVar356 +
                 0.20000714) * fVar356 + -0.24999994) * fVar356 + 0.3333333) * fVar356 + -0.5) +
             fVar356 + auVar367._4_4_ * 0.6931472) * -2.0;
        auVar18._0_4_ =
             (fVar326 * fVar326 *
              (((((((((fVar326 * 0.070376836 + -0.1151461) * fVar326 + 0.116769984) * fVar326 +
                    -0.12420141) * fVar326 + 0.14249323) * fVar326 + -0.16668057) * fVar326 +
                 0.20000714) * fVar326 + -0.24999994) * fVar326 + 0.3333333) * fVar326 + -0.5) +
             fVar326 + auVar367._0_4_ * 0.6931472) * -2.0;
        auVar18._8_4_ =
             (fVar343 * fVar343 *
              (((((((((fVar343 * 0.070376836 + -0.1151461) * fVar343 + 0.116769984) * fVar343 +
                    -0.12420141) * fVar343 + 0.14249323) * fVar343 + -0.16668057) * fVar343 +
                 0.20000714) * fVar343 + -0.24999994) * fVar343 + 0.3333333) * fVar343 + -0.5) +
             fVar343 + auVar367._8_4_ * 0.6931472) * -2.0;
        auVar18._12_4_ =
             (fVar357 * fVar357 *
              (((((((((fVar357 * 0.070376836 + -0.1151461) * fVar357 + 0.116769984) * fVar357 +
                    -0.12420141) * fVar357 + 0.14249323) * fVar357 + -0.16668057) * fVar357 +
                 0.20000714) * fVar357 + -0.24999994) * fVar357 + 0.3333333) * fVar357 + -0.5) +
             fVar357 + auVar367._12_4_ * 0.6931472) * -2.0;
        auVar18._16_4_ =
             (fVar344 * fVar344 *
              (((((((((fVar344 * 0.070376836 + -0.1151461) * fVar344 + 0.116769984) * fVar344 +
                    -0.12420141) * fVar344 + 0.14249323) * fVar344 + -0.16668057) * fVar344 +
                 0.20000714) * fVar344 + -0.24999994) * fVar344 + 0.3333333) * fVar344 + -0.5) +
             fVar344 + auVar367._16_4_ * 0.6931472) * -2.0;
        auVar18._20_4_ =
             (fVar358 * fVar358 *
              (((((((((fVar358 * 0.070376836 + -0.1151461) * fVar358 + 0.116769984) * fVar358 +
                    -0.12420141) * fVar358 + 0.14249323) * fVar358 + -0.16668057) * fVar358 +
                 0.20000714) * fVar358 + -0.24999994) * fVar358 + 0.3333333) * fVar358 + -0.5) +
             fVar358 + auVar367._20_4_ * 0.6931472) * -2.0;
        auVar18._24_4_ =
             (fVar345 * fVar345 *
              (((((((((fVar345 * 0.070376836 + -0.1151461) * fVar345 + 0.116769984) * fVar345 +
                    -0.12420141) * fVar345 + 0.14249323) * fVar345 + -0.16668057) * fVar345 +
                 0.20000714) * fVar345 + -0.24999994) * fVar345 + 0.3333333) * fVar345 + -0.5) +
             fVar345 + auVar367._24_4_ * 0.6931472) * -2.0;
        auVar18._28_4_ = auVar182._28_4_ + -1.0 + auVar208._28_4_ + auVar367._28_4_ + 0.0;
        auVar55._8_4_ = 0x7fffffff;
        auVar55._0_8_ = 0x7fffffff7fffffff;
        auVar55._12_4_ = 0x7fffffff;
        auVar55._16_4_ = 0x7fffffff;
        auVar55._20_4_ = 0x7fffffff;
        auVar55._24_4_ = 0x7fffffff;
        auVar55._28_4_ = 0x7fffffff;
        auVar208 = vblendvps_avx(auVar18,auVar55,auVar69);
        auVar208 = vminps_avx(auVar208,auVar68);
        auVar56._8_4_ = 0xc2b0c0a5;
        auVar56._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar56._12_4_ = 0xc2b0c0a5;
        auVar56._16_4_ = 0xc2b0c0a5;
        auVar56._20_4_ = 0xc2b0c0a5;
        auVar56._24_4_ = 0xc2b0c0a5;
        auVar56._28_4_ = 0xc2b0c0a5;
        auVar69 = vmaxps_avx(auVar208,auVar56);
        auVar261._0_4_ = auVar69._0_4_ * 1.442695 + 0.5;
        auVar261._4_4_ = auVar69._4_4_ * 1.442695 + 0.5;
        auVar261._8_4_ = auVar69._8_4_ * 1.442695 + 0.5;
        auVar261._12_4_ = auVar69._12_4_ * 1.442695 + 0.5;
        auVar261._16_4_ = auVar69._16_4_ * 1.442695 + 0.5;
        auVar261._20_4_ = auVar69._20_4_ * 1.442695 + 0.5;
        auVar261._24_4_ = auVar69._24_4_ * 1.442695 + 0.5;
        auVar261._28_4_ = 0x3f000000;
        auVar367 = vroundps_avx(auVar261,1);
        auVar208 = vcmpps_avx(auVar261,auVar367,1);
        auVar208 = vandps_avx(auVar208,auVar183);
        auVar208 = vsubps_avx(auVar367,auVar208);
        auVar19._4_4_ = auVar208._4_4_ * 0.6931472;
        auVar19._0_4_ = auVar208._0_4_ * 0.6931472;
        auVar19._8_4_ = auVar208._8_4_ * 0.6931472;
        auVar19._12_4_ = auVar208._12_4_ * 0.6931472;
        auVar19._16_4_ = auVar208._16_4_ * 0.6931472;
        auVar19._20_4_ = auVar208._20_4_ * 0.6931472;
        auVar19._24_4_ = auVar208._24_4_ * 0.6931472;
        auVar19._28_4_ = auVar367._28_4_;
        auVar131 = ZEXT1664(auVar131._0_16_);
        auVar69 = vsubps_avx(auVar69,auVar19);
        fVar326 = auVar69._0_4_;
        fVar356 = auVar69._4_4_;
        fVar343 = auVar69._8_4_;
        fVar357 = auVar69._12_4_;
        fVar344 = auVar69._16_4_;
        fVar358 = auVar69._20_4_;
        fVar345 = auVar69._24_4_;
        auVar240._0_4_ = (int)auVar208._0_4_;
        auVar240._4_4_ = (int)auVar208._4_4_;
        auVar240._8_4_ = (int)auVar208._8_4_;
        auVar240._12_4_ = (int)auVar208._12_4_;
        auVar262._16_4_ = (int)auVar208._16_4_;
        auVar262._0_16_ = auVar240;
        auVar262._20_4_ = (int)auVar208._20_4_;
        auVar262._24_4_ = (int)auVar208._24_4_;
        auVar262._28_4_ = (int)auVar208._28_4_;
        auVar346 = vpslld_avx(auVar240,0x17);
        auVar328 = vpslld_avx(auVar262._16_16_,0x17);
        auVar328 = vpaddd_avx(auVar328,auVar104);
        auVar346 = vpaddd_avx(auVar346,auVar104);
        auVar204._0_4_ =
             fVar212 + auVar346._0_4_ *
                       (fVar326 * fVar326 *
                        (((((fVar326 * 0.00019875691 + 0.0013981999) * fVar326 + 0.008333452) *
                           fVar326 + 0.041665796) * fVar326 + 0.16666666) * fVar326 + 0.5) +
                       fVar212 + fVar326);
        auVar204._4_4_ =
             fVar230 + auVar346._4_4_ *
                       (fVar356 * fVar356 *
                        (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) *
                           fVar356 + 0.041665796) * fVar356 + 0.16666666) * fVar356 + 0.5) +
                       fVar230 + fVar356);
        auVar204._8_4_ =
             fVar231 + auVar346._8_4_ *
                       (fVar343 * fVar343 *
                        (((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 + 0.008333452) *
                           fVar343 + 0.041665796) * fVar343 + 0.16666666) * fVar343 + 0.5) +
                       fVar231 + fVar343);
        auVar204._12_4_ =
             fVar232 + auVar346._12_4_ *
                       (fVar357 * fVar357 *
                        (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) *
                           fVar357 + 0.041665796) * fVar357 + 0.16666666) * fVar357 + 0.5) +
                       fVar232 + fVar357);
        auVar204._16_4_ =
             fVar233 + auVar328._0_4_ *
                       (fVar344 * fVar344 *
                        (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) *
                           fVar344 + 0.041665796) * fVar344 + 0.16666666) * fVar344 + 0.5) +
                       fVar233 + fVar344);
        auVar204._20_4_ =
             fVar234 + auVar328._4_4_ *
                       (fVar358 * fVar358 *
                        (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) *
                           fVar358 + 0.041665796) * fVar358 + 0.16666666) * fVar358 + 0.5) +
                       fVar234 + fVar358);
        auVar204._24_4_ =
             fVar235 + auVar328._8_4_ *
                       (fVar345 * fVar345 *
                        (((((fVar345 * 0.00019875691 + 0.0013981999) * fVar345 + 0.008333452) *
                           fVar345 + 0.041665796) * fVar345 + 0.16666666) * fVar345 + 0.5) +
                       fVar235 + fVar345);
        auVar204._28_4_ = fVar213 + auVar367._28_4_ + fVar213 + auVar69._28_4_;
        auVar57._8_4_ = 0x40000000;
        auVar57._0_8_ = 0x4000000040000000;
        auVar57._12_4_ = 0x40000000;
        auVar57._16_4_ = 0x40000000;
        auVar57._20_4_ = 0x40000000;
        auVar57._24_4_ = 0x40000000;
        auVar57._28_4_ = 0x40000000;
        auVar208 = vdivps_avx(auVar57,auVar204);
        auVar205._0_4_ = auVar208._0_4_ + -1.0;
        auVar205._4_4_ = auVar208._4_4_ + -1.0;
        auVar205._8_4_ = auVar208._8_4_ + -1.0;
        auVar205._12_4_ = auVar208._12_4_ + -1.0;
        auVar205._16_4_ = auVar208._16_4_ + -1.0;
        auVar205._20_4_ = auVar208._20_4_ + -1.0;
        auVar205._24_4_ = auVar208._24_4_ + -1.0;
        auVar205._28_4_ = auVar208._28_4_ + -1.0;
        auVar229 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
        goto LAB_0041e9e7;
      case 5:
        fVar326 = *pfVar4;
        fVar356 = pfVar4[1];
        auVar206._0_4_ = fVar356 + auVar286._0_4_ * fVar326;
        auVar206._4_4_ = fVar356 + auVar286._4_4_ * fVar326;
        auVar206._8_4_ = fVar356 + auVar286._8_4_ * fVar326;
        auVar206._12_4_ = fVar356 + auVar286._12_4_ * fVar326;
        auVar206._16_4_ = fVar356 + auVar286._16_4_ * fVar326;
        auVar206._20_4_ = fVar356 + auVar286._20_4_ * fVar326;
        auVar206._24_4_ = fVar356 + auVar286._24_4_ * fVar326;
        auVar206._28_4_ = fVar356 + fVar326;
        auVar208 = vmaxps_avx(auVar69,auVar206);
        auVar205 = vminps_avx(auVar183,auVar208);
LAB_0041e9e7:
        auVar175 = ZEXT436(auVar205._28_4_);
        auVar312._0_4_ = auVar286._0_4_ * auVar205._0_4_;
        auVar312._4_4_ = auVar286._4_4_ * auVar205._4_4_;
        auVar312._8_4_ = auVar286._8_4_ * auVar205._8_4_;
        auVar312._12_4_ = auVar286._12_4_ * auVar205._12_4_;
        auVar312._16_4_ = auVar286._16_4_ * auVar205._16_4_;
        auVar312._20_4_ = auVar286._20_4_ * auVar205._20_4_;
        auVar312._24_4_ = auVar286._24_4_ * auVar205._24_4_;
      }
switchD_0041e539_caseD_0:
      auVar369._0_4_ = auVar312._0_4_ * (float)local_b8._0_4_;
      auVar369._4_4_ = auVar312._4_4_ * (float)local_b8._4_4_;
      auVar369._8_4_ = auVar312._8_4_ * fStack_b0;
      auVar369._12_4_ = auVar312._12_4_ * fStack_ac;
      auVar369._16_4_ = auVar312._16_4_ * fStack_a8;
      auVar369._20_4_ = auVar312._20_4_ * fStack_a4;
      auVar369._24_4_ = auVar312._24_4_ * fStack_a0;
      auVar369._28_36_ = auVar175;
      auVar208 = vandps_avx(auVar364._0_32_,auVar369._0_32_);
      auVar208 = vorps_avx(auVar208,auVar150);
      auVar195._0_4_ = (int)(auVar208._0_4_ + auVar369._0_4_);
      auVar195._4_4_ = (int)(auVar208._4_4_ + auVar369._4_4_);
      auVar195._8_4_ = (int)(auVar208._8_4_ + auVar369._8_4_);
      auVar195._12_4_ = (int)(auVar208._12_4_ + auVar369._12_4_);
      auVar207._16_4_ = (int)(auVar208._16_4_ + auVar369._16_4_);
      auVar207._0_16_ = auVar195;
      auVar207._20_4_ = (int)(auVar208._20_4_ + auVar369._20_4_);
      auVar207._24_4_ = (int)(auVar208._24_4_ + auVar369._24_4_);
      auVar207._28_4_ = (int)(auVar208._28_4_ + auVar175._0_4_);
      auVar328 = vpackssdw_avx(auVar195,auVar207._16_16_);
      auVar328 = vpminsw_avx(auVar328,auVar131._0_16_);
      auVar328 = vpmaxsw_avx(auVar229._0_16_,auVar328);
      auVar328 = vpacksswb_avx(auVar328,auVar328);
      in_ZMM7 = ZEXT1664(auVar328);
      *(long *)(ptr + uVar37) = auVar328._0_8_;
      intptr = (int *)((long)intptr + 0x20);
      uVar37 = uVar37 + 8;
    }
    auVar364 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
    auVar42._8_4_ = 0x3f000000;
    auVar42._0_8_ = 0x3f0000003f000000;
    auVar42._12_4_ = 0x3f000000;
    auVar191 = ZEXT864(0) << 0x20;
    for (; (int)uVar37 + 3 < iVar35; uVar37 = uVar37 + 4) {
      auVar328 = vcvtdq2ps_avx(*(undefined1 (*) [16])*(undefined1 (*) [32])intptr);
      auVar359._0_4_ = auVar328._0_4_ * fVar1 + fVar70;
      auVar359._4_4_ = auVar328._4_4_ * fVar1 + fVar70;
      auVar359._8_4_ = auVar328._8_4_ * fVar1 + fVar70;
      auVar359._12_4_ = auVar328._12_4_ * fVar1 + fVar70;
      auVar140 = auVar359;
      if (5 < uVar33) goto switchD_0041eaa5_caseD_0;
      auVar328 = auVar191._0_16_;
      auVar140 = vmaxps_avx(auVar359,auVar328);
      switch(uVar33) {
      case 1:
        auVar328 = vminps_avx(auVar359,auVar328);
        fVar152 = *activation_params->data;
        auVar132._0_4_ = fVar152 * auVar328._0_4_ + auVar140._0_4_;
        auVar132._4_4_ = fVar152 * auVar328._4_4_ + auVar140._4_4_;
        auVar132._8_4_ = fVar152 * auVar328._8_4_ + auVar140._8_4_;
        auVar132._12_4_ = fVar152 * auVar328._12_4_ + auVar140._12_4_;
        auVar140 = auVar132;
        break;
      case 2:
        uVar3 = *activation_params->data;
        auVar137._4_4_ = uVar3;
        auVar137._0_4_ = uVar3;
        auVar137._8_4_ = uVar3;
        auVar137._12_4_ = uVar3;
        uVar3 = *(undefined4 *)((long)activation_params->data + 4);
        auVar349._4_4_ = uVar3;
        auVar349._0_4_ = uVar3;
        auVar349._8_4_ = uVar3;
        auVar349._12_4_ = uVar3;
        auVar328 = vmaxps_avx(auVar359,auVar137);
        auVar140 = vminps_avx(auVar349,auVar328);
        break;
      case 3:
        auVar138._0_4_ = (uint)auVar359._0_4_ ^ auVar364._0_4_;
        auVar138._4_4_ = (uint)auVar359._4_4_ ^ auVar364._4_4_;
        auVar138._8_4_ = (uint)auVar359._8_4_ ^ auVar364._8_4_;
        auVar138._12_4_ = (uint)auVar359._12_4_ ^ auVar364._12_4_;
        auVar75._8_4_ = 0x42b0c0a5;
        auVar75._0_8_ = 0x42b0c0a542b0c0a5;
        auVar75._12_4_ = 0x42b0c0a5;
        auVar328 = vminps_avx(auVar138,auVar75);
        auVar76._8_4_ = 0xc2b0c0a5;
        auVar76._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar76._12_4_ = 0xc2b0c0a5;
        auVar238 = vmaxps_avx(auVar328,auVar76);
        auVar350._0_4_ = auVar238._0_4_ * 1.442695 + 0.5;
        auVar350._4_4_ = auVar238._4_4_ * 1.442695 + 0.5;
        auVar350._8_4_ = auVar238._8_4_ * 1.442695 + 0.5;
        auVar350._12_4_ = auVar238._12_4_ * 1.442695 + 0.5;
        auVar360._0_4_ = (int)auVar350._0_4_;
        auVar360._4_4_ = (int)auVar350._4_4_;
        auVar360._8_4_ = (int)auVar350._8_4_;
        auVar360._12_4_ = (int)auVar350._12_4_;
        auVar346 = vcvtdq2ps_avx(auVar360);
        auVar328 = vcmpps_avx(auVar350,auVar346,1);
        auVar77._8_4_ = 0x3f800000;
        auVar77._0_8_ = 0x3f8000003f800000;
        auVar77._12_4_ = 0x3f800000;
        auVar328 = vandps_avx(auVar328,auVar77);
        auVar328 = vsubps_avx(auVar346,auVar328);
        fVar152 = auVar328._0_4_ * -0.6931472 + auVar238._0_4_;
        fVar169 = auVar328._4_4_ * -0.6931472 + auVar238._4_4_;
        fVar170 = auVar328._8_4_ * -0.6931472 + auVar238._8_4_;
        fVar171 = auVar328._12_4_ * -0.6931472 + auVar238._12_4_;
        auVar331._0_4_ = (int)auVar328._0_4_;
        auVar331._4_4_ = (int)auVar328._4_4_;
        auVar331._8_4_ = (int)auVar328._8_4_;
        auVar331._12_4_ = (int)auVar328._12_4_;
        auVar328 = vpslld_avx(auVar331,0x17);
        auVar328 = vpaddd_avx(auVar328,auVar77);
        auVar139._0_4_ =
             auVar328._0_4_ *
             (fVar152 * fVar152 *
              (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
                0.041665796) * fVar152 + 0.16666666) * fVar152 + 0.5) + fVar152 + 1.0) + 1.0;
        auVar139._4_4_ =
             auVar328._4_4_ *
             (fVar169 * fVar169 *
              (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) * fVar169 +
                0.041665796) * fVar169 + 0.16666666) * fVar169 + 0.5) + fVar169 + 1.0) + 1.0;
        auVar139._8_4_ =
             auVar328._8_4_ *
             (fVar170 * fVar170 *
              (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170 +
                0.041665796) * fVar170 + 0.16666666) * fVar170 + 0.5) + fVar170 + 1.0) + 1.0;
        auVar139._12_4_ =
             auVar328._12_4_ *
             (fVar171 * fVar171 *
              (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171 +
                0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5) + fVar171 + 1.0) + 1.0;
        auVar140 = vdivps_avx(auVar77,auVar139);
        break;
      case 4:
        auVar196._8_4_ = 0x42b0c0a5;
        auVar196._0_8_ = 0x42b0c0a542b0c0a5;
        auVar196._12_4_ = 0x42b0c0a5;
        auVar328 = vminps_avx(auVar359,auVar196);
        auVar214._8_4_ = 0xc2b0c0a5;
        auVar214._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar214._12_4_ = 0xc2b0c0a5;
        auVar238 = vmaxps_avx(auVar214,auVar328);
        auVar330._0_4_ = auVar238._0_4_ * 1.442695 + 0.5;
        auVar330._4_4_ = auVar238._4_4_ * 1.442695 + 0.5;
        auVar330._8_4_ = auVar238._8_4_ * 1.442695 + 0.5;
        auVar330._12_4_ = auVar238._12_4_ * 1.442695 + 0.5;
        auVar347._0_4_ = (int)auVar330._0_4_;
        auVar347._4_4_ = (int)auVar330._4_4_;
        auVar347._8_4_ = (int)auVar330._8_4_;
        auVar347._12_4_ = (int)auVar330._12_4_;
        auVar346 = vcvtdq2ps_avx(auVar347);
        auVar328 = vcmpps_avx(auVar330,auVar346,1);
        auVar176._8_4_ = 0x3f800000;
        auVar176._0_8_ = 0x3f8000003f800000;
        auVar176._12_4_ = 0x3f800000;
        auVar328 = vandps_avx(auVar328,auVar176);
        auVar328 = vsubps_avx(auVar346,auVar328);
        auVar348._0_4_ = auVar328._0_4_ * 0.6931472;
        auVar348._4_4_ = auVar328._4_4_ * 0.6931472;
        auVar348._8_4_ = auVar328._8_4_ * 0.6931472;
        auVar348._12_4_ = auVar328._12_4_ * 0.6931472;
        auVar346 = vsubps_avx(auVar238,auVar348);
        fVar152 = auVar346._0_4_;
        fVar169 = auVar346._4_4_;
        fVar170 = auVar346._8_4_;
        fVar171 = auVar346._12_4_;
        auVar133._0_4_ = (int)auVar328._0_4_;
        auVar133._4_4_ = (int)auVar328._4_4_;
        auVar133._8_4_ = (int)auVar328._8_4_;
        auVar133._12_4_ = (int)auVar328._12_4_;
        auVar328 = vpslld_avx(auVar133,0x17);
        auVar328 = vpaddd_avx(auVar328,auVar176);
        auVar134._0_4_ =
             (fVar152 + 1.0 +
             fVar152 * fVar152 *
             (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
               0.041665796) * fVar152 + 0.16666666) * fVar152 + 0.5)) * auVar328._0_4_ + 1.0;
        auVar134._4_4_ =
             (fVar169 + 1.0 +
             fVar169 * fVar169 *
             (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) * fVar169 +
               0.041665796) * fVar169 + 0.16666666) * fVar169 + 0.5)) * auVar328._4_4_ + 1.0;
        auVar134._8_4_ =
             (fVar170 + 1.0 +
             fVar170 * fVar170 *
             (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170 +
               0.041665796) * fVar170 + 0.16666666) * fVar170 + 0.5)) * auVar328._8_4_ + 1.0;
        auVar134._12_4_ =
             (fVar171 + 1.0 +
             fVar171 * fVar171 *
             (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171 +
               0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5)) * auVar328._12_4_ + 1.0;
        auVar71._8_4_ = 0x800000;
        auVar71._0_8_ = 0x80000000800000;
        auVar71._12_4_ = 0x800000;
        auVar328 = vmaxps_avx(auVar134,auVar71);
        auVar346 = vpsrld_avx(auVar328,0x17);
        auVar106._8_4_ = 0xffffff82;
        auVar106._0_8_ = 0xffffff82ffffff82;
        auVar106._12_4_ = 0xffffff82;
        auVar346 = vpaddd_avx(auVar346,auVar106);
        auVar107._8_4_ = 0x807fffff;
        auVar107._0_8_ = 0x807fffff807fffff;
        auVar107._12_4_ = 0x807fffff;
        auVar328 = vandps_avx(auVar328,auVar107);
        auVar329 = vorps_avx(auVar328,auVar42);
        auVar238 = vcvtdq2ps_avx(auVar346);
        auVar108._8_4_ = 0x3f3504f3;
        auVar108._0_8_ = 0x3f3504f33f3504f3;
        auVar108._12_4_ = 0x3f3504f3;
        auVar346 = vcmpps_avx(auVar329,auVar108,1);
        auVar328 = vandps_avx(auVar346,auVar329);
        fVar152 = auVar329._0_4_ + -1.0 + auVar328._0_4_;
        fVar169 = auVar329._4_4_ + -1.0 + auVar328._4_4_;
        fVar170 = auVar329._8_4_ + -1.0 + auVar328._8_4_;
        fVar171 = auVar329._12_4_ + -1.0 + auVar328._12_4_;
        auVar328 = vandps_avx(auVar346,auVar176);
        auVar346 = vsubps_avx(auVar238,auVar328);
        auVar328 = vcmpps_avx(auVar134,_DAT_005370d0,2);
        auVar72._0_4_ =
             (fVar152 * fVar152 *
              (((((((((fVar152 * 0.070376836 + -0.1151461) * fVar152 + 0.116769984) * fVar152 +
                    -0.12420141) * fVar152 + 0.14249323) * fVar152 + -0.16668057) * fVar152 +
                 0.20000714) * fVar152 + -0.24999994) * fVar152 + 0.3333333) * fVar152 + -0.5) +
             auVar346._0_4_ * 0.6931472 + fVar152) * -2.0;
        auVar72._4_4_ =
             (fVar169 * fVar169 *
              (((((((((fVar169 * 0.070376836 + -0.1151461) * fVar169 + 0.116769984) * fVar169 +
                    -0.12420141) * fVar169 + 0.14249323) * fVar169 + -0.16668057) * fVar169 +
                 0.20000714) * fVar169 + -0.24999994) * fVar169 + 0.3333333) * fVar169 + -0.5) +
             auVar346._4_4_ * 0.6931472 + fVar169) * -2.0;
        auVar72._8_4_ =
             (fVar170 * fVar170 *
              (((((((((fVar170 * 0.070376836 + -0.1151461) * fVar170 + 0.116769984) * fVar170 +
                    -0.12420141) * fVar170 + 0.14249323) * fVar170 + -0.16668057) * fVar170 +
                 0.20000714) * fVar170 + -0.24999994) * fVar170 + 0.3333333) * fVar170 + -0.5) +
             auVar346._8_4_ * 0.6931472 + fVar170) * -2.0;
        auVar72._12_4_ =
             (fVar171 * fVar171 *
              (((((((((fVar171 * 0.070376836 + -0.1151461) * fVar171 + 0.116769984) * fVar171 +
                    -0.12420141) * fVar171 + 0.14249323) * fVar171 + -0.16668057) * fVar171 +
                 0.20000714) * fVar171 + -0.24999994) * fVar171 + 0.3333333) * fVar171 + -0.5) +
             auVar346._12_4_ * 0.6931472 + fVar171) * -2.0;
        auVar109._8_4_ = 0x7fffffff;
        auVar109._0_8_ = 0x7fffffff7fffffff;
        auVar109._12_4_ = 0x7fffffff;
        auVar328 = vblendvps_avx(auVar72,auVar109,auVar328);
        auVar110._8_4_ = 0x42b0c0a5;
        auVar110._0_8_ = 0x42b0c0a542b0c0a5;
        auVar110._12_4_ = 0x42b0c0a5;
        auVar328 = vminps_avx(auVar328,auVar110);
        auVar111._8_4_ = 0xc2b0c0a5;
        auVar111._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar111._12_4_ = 0xc2b0c0a5;
        auVar238 = vmaxps_avx(auVar328,auVar111);
        auVar112._0_4_ = auVar238._0_4_ * 1.442695 + 0.5;
        auVar112._4_4_ = auVar238._4_4_ * 1.442695 + 0.5;
        auVar112._8_4_ = auVar238._8_4_ * 1.442695 + 0.5;
        auVar112._12_4_ = auVar238._12_4_ * 1.442695 + 0.5;
        auVar135._0_4_ = (int)auVar112._0_4_;
        auVar135._4_4_ = (int)auVar112._4_4_;
        auVar135._8_4_ = (int)auVar112._8_4_;
        auVar135._12_4_ = (int)auVar112._12_4_;
        auVar346 = vcvtdq2ps_avx(auVar135);
        auVar328 = vcmpps_avx(auVar112,auVar346,1);
        auVar328 = vandps_avx(auVar328,auVar176);
        auVar328 = vsubps_avx(auVar346,auVar328);
        auVar136._0_4_ = auVar328._0_4_ * 0.6931472;
        auVar136._4_4_ = auVar328._4_4_ * 0.6931472;
        auVar136._8_4_ = auVar328._8_4_ * 0.6931472;
        auVar136._12_4_ = auVar328._12_4_ * 0.6931472;
        auVar191 = ZEXT864(0);
        auVar346 = vsubps_avx(auVar238,auVar136);
        fVar152 = auVar346._0_4_;
        fVar169 = auVar346._4_4_;
        fVar170 = auVar346._8_4_;
        fVar171 = auVar346._12_4_;
        auVar113._0_4_ = (int)auVar328._0_4_;
        auVar113._4_4_ = (int)auVar328._4_4_;
        auVar113._8_4_ = (int)auVar328._8_4_;
        auVar113._12_4_ = (int)auVar328._12_4_;
        auVar328 = vpslld_avx(auVar113,0x17);
        auVar328 = vpaddd_avx(auVar328,auVar176);
        auVar73._0_4_ =
             (fVar152 + 1.0 +
             (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
               0.041665796) * fVar152 + 0.16666666) * fVar152 + 0.5) * fVar152 * fVar152) *
             auVar328._0_4_ + 1.0;
        auVar73._4_4_ =
             (fVar169 + 1.0 +
             (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) * fVar169 +
               0.041665796) * fVar169 + 0.16666666) * fVar169 + 0.5) * fVar169 * fVar169) *
             auVar328._4_4_ + 1.0;
        auVar73._8_4_ =
             (fVar170 + 1.0 +
             (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170 +
               0.041665796) * fVar170 + 0.16666666) * fVar170 + 0.5) * fVar170 * fVar170) *
             auVar328._8_4_ + 1.0;
        auVar73._12_4_ =
             (fVar171 + 1.0 +
             (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171 +
               0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5) * fVar171 * fVar171) *
             auVar328._12_4_ + 1.0;
        auVar364 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
        auVar114._8_4_ = 0x40000000;
        auVar114._0_8_ = 0x4000000040000000;
        auVar114._12_4_ = 0x40000000;
        auVar328 = vdivps_avx(auVar114,auVar73);
        auVar74._0_4_ = auVar328._0_4_ + -1.0;
        auVar74._4_4_ = auVar328._4_4_ + -1.0;
        auVar74._8_4_ = auVar328._8_4_ + -1.0;
        auVar74._12_4_ = auVar328._12_4_ + -1.0;
        goto LAB_0041eeba;
      case 5:
        fVar152 = *activation_params->data;
        fVar169 = *(float *)((long)activation_params->data + 4);
        auVar78._0_4_ = auVar359._0_4_ * fVar152 + fVar169;
        auVar78._4_4_ = auVar359._4_4_ * fVar152 + fVar169;
        auVar78._8_4_ = auVar359._8_4_ * fVar152 + fVar169;
        auVar78._12_4_ = auVar359._12_4_ * fVar152 + fVar169;
        auVar328 = vmaxps_avx(auVar78,auVar328);
        auVar115._8_4_ = 0x3f800000;
        auVar115._0_8_ = 0x3f8000003f800000;
        auVar115._12_4_ = 0x3f800000;
        auVar74 = vminps_avx(auVar328,auVar115);
LAB_0041eeba:
        auVar140._0_4_ = auVar359._0_4_ * auVar74._0_4_;
        auVar140._4_4_ = auVar359._4_4_ * auVar74._4_4_;
        auVar140._8_4_ = auVar359._8_4_ * auVar74._8_4_;
        auVar140._12_4_ = auVar359._12_4_ * auVar74._12_4_;
      }
switchD_0041eaa5_caseD_0:
      auVar79._0_4_ = auVar140._0_4_ * fVar2;
      auVar79._4_4_ = auVar140._4_4_ * fVar2;
      auVar79._8_4_ = auVar140._8_4_ * fVar2;
      auVar79._12_4_ = auVar140._12_4_ * fVar2;
      auVar328 = vandps_avx(auVar79,auVar364._0_16_);
      auVar328 = vorps_avx(auVar328,auVar42);
      auVar80._0_4_ = (int)(auVar79._0_4_ + auVar328._0_4_);
      auVar80._4_4_ = (int)(auVar79._4_4_ + auVar328._4_4_);
      auVar80._8_4_ = (int)(auVar79._8_4_ + auVar328._8_4_);
      auVar80._12_4_ = (int)(auVar79._12_4_ + auVar328._12_4_);
      auVar328 = vpackssdw_avx(auVar80,auVar80);
      auVar328 = vpminsw_avx(auVar328,auVar131._0_16_);
      auVar328 = vpmaxsw_avx(auVar229._0_16_,auVar328);
      auVar328 = vpacksswb_avx(auVar328,auVar328);
      *(int *)(ptr + uVar37) = auVar328._0_4_;
      intptr = (int *)(*(undefined1 (*) [32])intptr + 0x10);
    }
    lVar36 = 0;
    auVar131 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
    for (uVar34 = uVar37 & 0xffffffff; (int)uVar34 < iVar35; uVar34 = (ulong)((int)uVar34 + 1)) {
      fVar152 = (float)*(int *)(*(undefined1 (*) [32])intptr + lVar36 * 4) * fVar1 + fVar70;
      auVar328 = ZEXT416((uint)fVar152);
      fVar169 = fVar152;
      switch(uVar33) {
      case 0:
        auVar328 = vmaxss_avx(auVar328,ZEXT416(0));
        fVar169 = auVar328._0_4_;
        break;
      case 1:
        auVar43._0_12_ = ZEXT812(0);
        auVar43._12_4_ = 0;
        auVar328 = vcmpss_avx(auVar43,auVar328,1);
        auVar82._8_4_ = 0x3f800000;
        auVar82._0_8_ = 0x3f8000003f800000;
        auVar82._12_4_ = 0x3f800000;
        auVar328 = vblendvps_avx(ZEXT416(*activation_params->data),auVar82,auVar328);
        fVar171 = auVar328._0_4_;
LAB_0041f069:
        fVar169 = fVar171 * fVar152;
        break;
      case 2:
        fVar152 = *(float *)((long)activation_params->data + 4);
        auVar328 = vmaxss_avx(auVar328,ZEXT416(*activation_params->data));
        fVar169 = auVar328._0_4_;
        if (fVar152 < auVar328._0_4_) {
          fVar169 = fVar152;
        }
        break;
      case 3:
        auVar328 = vminss_avx(auVar328,ZEXT416(0x42b0c0a5));
        auVar63._0_4_ = auVar328._0_4_ ^ auVar364._0_4_;
        auVar63._4_4_ = auVar328._4_4_ ^ auVar364._4_4_;
        auVar63._8_4_ = auVar328._8_4_ ^ auVar364._8_4_;
        auVar63._12_4_ = auVar328._12_4_ ^ auVar364._12_4_;
        auVar328 = vcmpss_avx(auVar328,ZEXT416(0xc2b0c0a5),1);
        auVar81._8_4_ = 0x42b0c0a5;
        auVar81._0_8_ = 0x42b0c0a542b0c0a5;
        auVar81._12_4_ = 0x42b0c0a5;
        auVar328 = vblendvps_avx(auVar63,auVar81,auVar328);
        fVar152 = expf(auVar328._0_4_);
        auVar131 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
        auVar364 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
        fVar169 = 1.0 / (fVar152 + 1.0);
        break;
      case 4:
        fVar169 = expf(fVar152);
        fVar169 = logf(fVar169 + 1.0);
        fVar169 = tanhf(fVar169);
        auVar131 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
        auVar364 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
        fVar169 = fVar169 * fVar152;
        break;
      case 5:
        fVar170 = *activation_params->data;
        fVar171 = *(float *)((long)activation_params->data + 4);
        fVar172 = (float)((uint)fVar171 ^ auVar364._0_4_) / fVar170;
        fVar169 = 0.0;
        if ((fVar172 <= fVar152) && (fVar169 = fVar152, fVar152 <= fVar172 + 1.0 / fVar170)) {
          fVar171 = fVar170 * fVar152 + fVar171;
          goto LAB_0041f069;
        }
      }
      auVar328 = vandps_avx(ZEXT416((uint)(fVar169 * fVar2)),auVar364._0_16_);
      auVar328 = vorps_avx(auVar328,auVar131._0_16_);
      auVar328 = ZEXT416((uint)(fVar169 * fVar2 + auVar328._0_4_));
      auVar328 = vroundss_avx(auVar328,auVar328,0xb);
      iVar32 = (int)auVar328._0_4_;
      if (iVar32 < -0x7e) {
        iVar32 = -0x7f;
      }
      cVar31 = (char)iVar32;
      if (0x7e < iVar32) {
        cVar31 = '\x7f';
      }
      ptr[uVar37 + lVar36] = cVar31;
      lVar36 = lVar36 + 1;
    }
  }
  return;
}

Assistant:

static void requantize(const int* intptr, signed char* ptr, const Mat& scale_in_data, const Mat& bias_data, const Mat& scale_out_data, int activation_type, const Mat& activation_params, int elemcount, int elempack)
{
    const int scale_in_data_size = scale_in_data.w;
    const int bias_data_size = bias_data.w;
    const int scale_out_data_size = scale_out_data.w;
    const int size = elemcount * elempack;

    // NCNN_LOGE("requantize %d %d %d   %d %d", scale_in_data_size, bias_data_size, scale_out_data_size, elemcount, elempack);

    float scale_in = scale_in_data[0];
#if __SSE2__
    __m128 _scale_in0 = _mm_set1_ps(scale_in);
#if __AVX__
    __m256 _scale_in_avx = _mm256_set1_ps(scale_in);
#if __AVX512F__
    __m512 _scale_in_avx512 = _mm512_set1_ps(scale_in);
#endif // __AVX512F__
#else  // __AVX__
    __m128 _scale_in1 = _scale_in0;
#endif // __AVX__
    if (scale_in_data_size > 1)
    {
#if __AVX512F__
        if (elempack == 16)
        {
            _scale_in_avx512 = _mm512_loadu_ps((const float*)scale_in_data);
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX__
            _scale_in_avx = _mm256_loadu_ps((const float*)scale_in_data);
#if __AVX512F__
            _scale_in_avx512 = combine8x2_ps(_scale_in_avx, _scale_in_avx);
#endif // __AVX512F__
#else  // __AVX__
            _scale_in0 = _mm_loadu_ps((const float*)scale_in_data);
            _scale_in1 = _mm_loadu_ps((const float*)scale_in_data + 4);
#endif // __AVX__
        }
    }
#endif // __SSE2__

    float scale_out = scale_out_data[0];
#if __SSE2__
    __m128 _scale_out0 = _mm_set1_ps(scale_out);
#if __AVX__
    __m256 _scale_out_avx = _mm256_set1_ps(scale_out);
#if __AVX512F__
    __m512 _scale_out_avx512 = _mm512_set1_ps(scale_out);
#endif // __AVX512F__
#else  // __AVX__
    __m128 _scale_out1 = _scale_out0;
#endif // __AVX__
    if (scale_out_data_size > 1)
    {
#if __AVX512F__
        if (elempack == 16)
        {
            _scale_out_avx512 = _mm512_loadu_ps((const float*)scale_out_data);
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX__
            _scale_out_avx = _mm256_loadu_ps((const float*)scale_out_data);
#if __AVX512F__
            _scale_out_avx512 = combine8x2_ps(_scale_out_avx, _scale_out_avx);
#endif // __AVX512F__
#else  // __AVX__
            _scale_out0 = _mm_loadu_ps((const float*)scale_out_data);
            _scale_out1 = _mm_loadu_ps((const float*)scale_out_data + 4);
#endif // __AVX__
        }
    }
#endif // __SSE2__

    if (bias_data_size == 0)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 15 < size; i += 16)
        {
#if __AVX512F__
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_mul_ps(_v, _scale_in_avx512);
            _v = activation_avx512(_v, activation_type, activation_params);
            _v = _mm512_mul_ps(_v, _scale_out_avx512);
            _mm_storeu_si128((__m128i*)ptr, float2int8_avx512(_v));
#else  // __AVX512F__
            __m256 _v0 = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            __m256 _v1 = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)(intptr + 8)));
            _v0 = _mm256_mul_ps(_v0, _scale_in_avx);
            _v1 = _mm256_mul_ps(_v1, _scale_in_avx);
            _v0 = activation_avx(_v0, activation_type, activation_params);
            _v1 = activation_avx(_v1, activation_type, activation_params);
            _v0 = _mm256_mul_ps(_v0, _scale_out_avx);
            _v1 = _mm256_mul_ps(_v1, _scale_out_avx);
            _mm_storeu_si128((__m128i*)ptr, float2int8_avx(_v0, _v1));
#endif // __AVX512F__
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX__
        for (; i + 7 < size; i += 8)
        {
#if __AVX__
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_mul_ps(_v, _scale_in_avx);
            _v = activation_avx(_v, activation_type, activation_params);
            _v = _mm256_mul_ps(_v, _scale_out_avx);
            *(int64_t*)ptr = float2int8_avx(_v);
#else  // __AVX__
            __m128 _v0 = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            __m128 _v1 = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)(intptr + 4)));
            _v0 = _mm_mul_ps(_v0, _scale_in0);
            _v1 = _mm_mul_ps(_v1, _scale_in1);
            _v0 = activation_sse(_v0, activation_type, activation_params);
            _v1 = activation_sse(_v1, activation_type, activation_params);
            _v0 = _mm_mul_ps(_v0, _scale_out0);
            _v1 = _mm_mul_ps(_v1, _scale_out1);
            *(int64_t*)ptr = float2int8_sse(_v0, _v1);
#endif // __AVX__
            intptr += 8;
            ptr += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_mul_ps(_v, _scale_in0);
            _v = activation_sse(_v, activation_type, activation_params);
            _v = _mm_mul_ps(_v, _scale_out0);
            int32_t v = float2int8_sse(_v);
            ptr[0] = (v >> 0) & 0xff;
            ptr[1] = (v >> 8) & 0xff;
            ptr[2] = (v >> 16) & 0xff;
            ptr[3] = (v >> 24) & 0xff;
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            float v = *intptr * scale_in;
            v = activation_ss(v, activation_type, activation_params);
            *ptr = float2int8(v * scale_out);
            intptr++;
            ptr++;
        }
    }
    else
    {
        float bias = bias_data[0];
#if __SSE2__
        __m128 _bias0 = _mm_set1_ps(bias);
#if __AVX__
        __m256 _bias_avx = _mm256_set1_ps(bias);
#if __AVX512F__
        __m512 _bias_avx512 = _mm512_set1_ps(bias);
#endif // __AVX512F__
#else  // __AVX__
        __m128 _bias1 = _bias0;
#endif // __AVX__
        if (bias_data_size > 1)
        {
#if __AVX512F__
            if (elempack == 16)
            {
                _bias_avx512 = _mm512_loadu_ps((const float*)bias_data);
            }
#endif // __AVX512F__
            if (elempack == 8)
            {
#if __AVX__
                _bias_avx = _mm256_loadu_ps((const float*)bias_data);
#if __AVX512F__
                _bias_avx512 = combine8x2_ps(_bias_avx, _bias_avx);
#endif // __AVX512F__
#else  // __AVX__
                _bias0 = _mm_loadu_ps((const float*)bias_data);
                _bias1 = _mm_loadu_ps((const float*)bias_data + 4);
#endif // __AVX__
            }
        }
#endif // __SSE2__

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 15 < size; i += 16)
        {
#if __AVX512F__
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_fmadd_ps(_v, _scale_in_avx512, _bias_avx512);
            _v = activation_avx512(_v, activation_type, activation_params);
            _v = _mm512_mul_ps(_v, _scale_out_avx512);
            _mm_storeu_si128((__m128i*)ptr, float2int8_avx512(_v));
#else  // __AVX512F__
            __m256 _v0 = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            __m256 _v1 = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)(intptr + 8)));
            _v0 = _mm256_comp_fmadd_ps(_v0, _scale_in_avx, _bias_avx);
            _v1 = _mm256_comp_fmadd_ps(_v1, _scale_in_avx, _bias_avx);
            _v0 = activation_avx(_v0, activation_type, activation_params);
            _v1 = activation_avx(_v1, activation_type, activation_params);
            _v0 = _mm256_mul_ps(_v0, _scale_out_avx);
            _v1 = _mm256_mul_ps(_v1, _scale_out_avx);
            _mm_storeu_si128((__m128i*)ptr, float2int8_avx(_v0, _v1));
#endif // __AVX512F__
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX__
        for (; i + 7 < size; i += 8)
        {
#if __AVX__
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_comp_fmadd_ps(_v, _scale_in_avx, _bias_avx);
            _v = activation_avx(_v, activation_type, activation_params);
            _v = _mm256_mul_ps(_v, _scale_out_avx);
            *(int64_t*)ptr = float2int8_avx(_v);
#else  // __AVX__
            __m128 _v0 = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            __m128 _v1 = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)(intptr + 4)));
            _v0 = _mm_comp_fmadd_ps(_v0, _scale_in0, _bias0);
            _v1 = _mm_comp_fmadd_ps(_v1, _scale_in1, _bias1);
            _v0 = activation_sse(_v0, activation_type, activation_params);
            _v1 = activation_sse(_v1, activation_type, activation_params);
            _v0 = _mm_mul_ps(_v0, _scale_out0);
            _v1 = _mm_mul_ps(_v1, _scale_out1);
            *(int64_t*)ptr = float2int8_sse(_v0, _v1);
#endif // __AVX__
            intptr += 8;
            ptr += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_comp_fmadd_ps(_v, _scale_in0, _bias0);
            _v = activation_sse(_v, activation_type, activation_params);
            _v = _mm_mul_ps(_v, _scale_out0);
            int32_t v = float2int8_sse(_v);
            ptr[0] = (v >> 0) & 0xff;
            ptr[1] = (v >> 8) & 0xff;
            ptr[2] = (v >> 16) & 0xff;
            ptr[3] = (v >> 24) & 0xff;
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            float v = *intptr * scale_in + bias;
            v = activation_ss(v, activation_type, activation_params);
            *ptr = float2int8(v * scale_out);
            intptr++;
            ptr++;
        }
    }
}